

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_tagliatelle_2021.h
# Opt level: O2

void __thiscall Tagliatelle<UF>::FirstScan(Tagliatelle<UF> *this)

{
  long lVar1;
  uint *puVar2;
  char cVar3;
  Mat1b *pMVar4;
  Mat1i *pMVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  char *pcVar10;
  long lVar11;
  uint *puVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  char cVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  undefined4 uVar23;
  long lVar24;
  long lVar25;
  ulong uVar26;
  char *pcVar27;
  long lVar28;
  long lVar29;
  int iVar30;
  uint uVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  undefined4 *puVar37;
  int iVar38;
  long lVar39;
  uint *puVar40;
  long lVar41;
  uint *puVar42;
  uint *puVar43;
  long lVar44;
  long lVar45;
  long lVar46;
  int iVar47;
  long lVar48;
  long lVar49;
  long lVar50;
  long lVar51;
  bool bVar52;
  ulong local_c0;
  long local_98;
  long local_90;
  ulong local_70;
  
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  uVar9 = *(uint *)&pMVar4->field_0x8;
  uVar31 = *(uint *)&pMVar4->field_0xc;
  *(uint *)&(this->super_Labeling2D<(Connectivity2D)8,_false>).field_0x74 = uVar9 & 0xfffffffe;
  this->o_rows = (uVar9 & 0x80000001) == 1;
  this->e_cols = uVar31 & 0xfffffffe;
  this->o_cols = (uVar31 & 0x80000001) == 1;
  puVar2 = UF::P_;
  *UF::P_ = 0;
  UF::length_ = 1;
  lVar45 = *(long *)&pMVar4->field_0x10;
  if (uVar9 != 1) {
    uVar21 = 0xfffffffffffffffe;
    lVar24 = **(long **)&pMVar4->field_0x48;
    lVar32 = lVar45 + lVar24;
    lVar25 = *(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x10;
    lVar33 = (long)(int)uVar31 + -2;
    lVar48 = lVar45 + 1 + lVar24;
    while( true ) {
      lVar39 = (long)(int)uVar21;
      uVar26 = lVar39 + 2;
      iVar38 = (int)lVar33;
      if (iVar38 <= (int)uVar26) break;
      if ((*(char *)(lVar45 + uVar26) != '\0') || (*(char *)(lVar32 + uVar26) != '\0')) {
        cVar16 = *(char *)(lVar45 + 3 + lVar39);
        puVar2[UF::length_] = UF::length_;
        uVar8 = UF::length_ + 1;
        *(uint *)(lVar25 + 8 + lVar39 * 4) = UF::length_;
        UF::length_ = uVar8;
        if (cVar16 != '\0') goto LAB_0023b7a7;
        goto LAB_0023b846;
      }
      if ((*(char *)(lVar39 + 3 + lVar45) != '\0') || (*(char *)(lVar32 + 3 + lVar39) != '\0')) {
        puVar2[UF::length_] = UF::length_;
        uVar21 = uVar26 & 0xffffffff;
        uVar8 = UF::length_;
        UF::length_ = UF::length_ + 1;
LAB_0023b7a1:
        *(uint *)(lVar25 + uVar26 * 4) = uVar8;
        uVar26 = uVar21 & 0xffffffff;
LAB_0023b7a7:
        iVar30 = (int)uVar26;
        lVar41 = (long)iVar30;
        lVar39 = lVar25 + lVar41 * 4;
        lVar28 = lVar41 << 0x20;
        lVar1 = lVar45 + 3 + lVar41;
        lVar11 = lVar45 + 3 + lVar24 + lVar41;
        lVar50 = 0;
        do {
          iVar47 = (int)lVar50;
          if (lVar33 <= lVar50 + lVar41 + 2) {
            uVar26 = lVar28 + 0x200000000 >> 0x20;
            if (iVar38 < iVar30 + iVar47 + 2) {
              if ((*(char *)(lVar45 + uVar26) == '\0') && (*(char *)(lVar32 + uVar26) == '\0'))
              goto LAB_0023bb6d;
            }
            else if ((*(char *)(lVar45 + uVar26) == '\0') && (*(char *)(lVar32 + uVar26) == '\0'))
            goto LAB_0023bb3c;
            uVar8 = *(uint *)(lVar25 + (lVar28 >> 0x1e));
            goto LAB_0023bb74;
          }
          if ((*(char *)(lVar1 + -1 + lVar50) == '\0') && (*(char *)(lVar11 + -1 + lVar50) == '\0'))
          {
            if ((*(char *)(lVar1 + lVar50) == '\0') && (*(char *)(lVar11 + lVar50) == '\0')) {
              uVar21 = (ulong)(iVar30 + iVar47 + 2);
              uVar26 = lVar41 + lVar50 + 2;
              goto LAB_0023b9bd;
            }
            puVar2[UF::length_] = UF::length_;
            uVar8 = UF::length_;
            UF::length_ = UF::length_ + 1;
          }
          else {
            if (*(char *)(lVar1 + lVar50) == '\0') goto LAB_0023b837;
            uVar8 = *(uint *)(lVar39 + lVar50 * 4);
          }
          *(uint *)(lVar39 + 8 + lVar50 * 4) = uVar8;
          lVar50 = lVar50 + 2;
          lVar28 = lVar28 + 0x200000000;
        } while( true );
      }
      uVar21 = uVar26 & 0xffffffff;
LAB_0023b9bd:
      *(undefined4 *)(lVar25 + uVar26 * 4) = 0;
    }
    uVar8 = UF::length_;
    if (iVar38 < (int)uVar26) {
      if ((*(char *)(lVar45 + uVar26) == '\0') && (*(char *)(lVar32 + uVar26) == '\0')) {
        uVar8 = 0;
      }
      else {
        puVar2[UF::length_] = UF::length_;
        UF::length_ = UF::length_ + 1;
      }
    }
    else if ((((*(char *)(lVar45 + uVar26) == '\0') && (*(char *)(lVar32 + uVar26) == '\0')) &&
             (*(char *)(lVar39 + 3 + lVar45) == '\0')) && (*(char *)(lVar32 + 3 + lVar39) == '\0'))
    {
      uVar8 = 0;
    }
    else {
      puVar2[UF::length_] = UF::length_;
      UF::length_ = UF::length_ + 1;
    }
LAB_0023bb74:
    *(uint *)(lVar25 + uVar26 * 4) = uVar8;
    local_98 = 1;
    local_90 = 3;
    lVar32 = 0;
    for (lVar45 = 2; lVar45 < *(int *)&(this->super_Labeling2D<(Connectivity2D)8,_false>).field_0x74
        ; lVar45 = lVar45 + 2) {
      pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
      pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
      lVar24 = *(long *)&pMVar4->field_0x10;
      lVar25 = **(long **)&pMVar4->field_0x48;
      lVar28 = lVar25 * lVar45;
      lVar48 = lVar24 + lVar28;
      pcVar27 = (char *)(lVar48 - lVar25);
      pcVar10 = (char *)(lVar48 + lVar25);
      lVar39 = *(long *)&pMVar5->field_0x10;
      lVar1 = **(long **)&pMVar5->field_0x48;
      lVar11 = lVar1 * lVar45;
      puVar2 = (uint *)(lVar39 + lVar11);
      puVar12 = (uint *)((long)puVar2 + lVar1 * -2);
      cVar16 = *(char *)(lVar24 + lVar28);
      if (2 < (int)uVar31) {
        if (cVar16 == '\0') {
          if (*pcVar10 == '\0') {
            if (*(char *)(lVar48 + 1) == '\0') {
              if (pcVar10[1] != '\0') {
                UF::P_[UF::length_] = UF::length_;
                uVar8 = UF::length_ + 1;
                *puVar2 = UF::length_;
                UF::length_ = uVar8;
                local_70 = 0;
                goto LAB_0023c718;
              }
              local_70 = 0;
              puVar42 = puVar2;
              goto LAB_0023bedf;
            }
          }
          else if (*(char *)(lVar48 + 1) == '\0') {
            UF::P_[UF::length_] = UF::length_;
            uVar8 = UF::length_ + 1;
            *puVar2 = UF::length_;
            UF::length_ = uVar8;
            local_70 = 0;
            goto LAB_0023f32b;
          }
          if (pcVar27[1] != '\0') {
            *puVar2 = *puVar12;
            local_70 = 0;
            goto LAB_0023e1f9;
          }
        }
        else {
          if (pcVar27[1] != '\0') {
            *puVar2 = *puVar12;
            local_70 = 0;
            goto LAB_0024235e;
          }
          if (*(char *)(lVar48 + 1) == '\0') {
            if (*pcVar27 == '\0') {
              UF::P_[UF::length_] = UF::length_;
              uVar8 = UF::length_ + 1;
              *puVar2 = UF::length_;
              UF::length_ = uVar8;
              local_70 = 0;
              goto LAB_002404c9;
            }
            *puVar2 = *puVar12;
            local_70 = 0;
            goto LAB_00240a24;
          }
        }
        if (pcVar27[2] == '\0') {
          if (*pcVar27 != '\0') {
            *puVar2 = *puVar12;
            local_70 = 0;
            goto LAB_0023dd24;
          }
          UF::P_[UF::length_] = UF::length_;
          uVar8 = UF::length_ + 1;
          *puVar2 = UF::length_;
          UF::length_ = uVar8;
          uVar8 = 0;
          goto LAB_0023d2a6;
        }
        if (*pcVar27 == '\0') {
          uVar8 = puVar12[2];
        }
        else {
          if (pcVar27[1 - lVar25] != '\0') {
            *puVar2 = *puVar12;
            goto LAB_0023be6d;
          }
          uVar8 = UF::Merge(*puVar12,puVar12[2]);
        }
        *puVar2 = uVar8;
LAB_0023be6d:
        local_70 = 0;
LAB_0023d927:
        iVar30 = (int)local_70;
        lVar35 = (long)iVar30;
        lVar19 = lVar35 << 0x20;
        lVar41 = lVar24 + lVar25 * local_98 + lVar35;
        lVar50 = lVar39 + lVar1 * lVar32 + lVar35 * 4;
        lVar29 = lVar50 + 8;
        lVar13 = lVar24 + lVar28 + lVar35;
        lVar34 = lVar13 + 3;
        lVar17 = lVar25 * lVar32 + lVar35 + lVar24 + 3;
        lVar18 = lVar25 * local_90 + lVar35;
        lVar15 = lVar11 + lVar35 * 4;
        lVar20 = lVar39 + lVar15 + 8;
        lVar14 = 0;
        lVar44 = 0;
        while( true ) {
          uVar21 = lVar44 + lVar35 + 2;
          lVar46 = lVar19 >> 0x1e;
          iVar47 = (int)lVar44;
          if (lVar33 <= (long)uVar21) break;
          if (*(char *)(lVar13 + 2 + lVar44) == '\0') {
            cVar16 = *(char *)(lVar34 + lVar44);
            if (*(char *)(lVar24 + lVar18 + 2 + lVar44) != '\0') {
              if (cVar16 == '\0') {
                local_70 = (ulong)(iVar30 + iVar47 + 2);
                uVar8 = *(uint *)((long)puVar2 + lVar46);
LAB_002410a6:
                *(uint *)(lVar15 + lVar39 + 8 + lVar44 * 4) = uVar8;
                goto LAB_0023f32b;
              }
              if (*(char *)(lVar41 + 3 + lVar44) != '\0') goto LAB_0023dbac;
              goto LAB_0023da3d;
            }
            if (cVar16 == '\0') {
              local_70 = (ulong)(iVar30 + 2) + lVar44;
              if (*(char *)(lVar44 + 3 + lVar18 + lVar24) == '\0') {
                lVar14 = lVar14 + lVar15 + lVar39;
                goto LAB_0023fa50;
              }
              UF::P_[UF::length_] = UF::length_;
              uVar8 = UF::length_;
LAB_00241422:
              UF::length_ = uVar8 + 1;
              *(uint *)(lVar15 + lVar39 + 8 + lVar44 * 4) = uVar8;
              goto LAB_0024142a;
            }
            if (*(char *)(lVar41 + 3 + lVar44) != '\0') {
LAB_0023dbac:
              *(undefined4 *)(lVar20 + lVar44 * 4) = *(undefined4 *)(lVar29 + lVar44 * 4);
              local_70 = (ulong)(iVar30 + iVar47 + 2);
              goto LAB_0023e1f9;
            }
            if (*(char *)(lVar41 + 4 + lVar44) == '\0') {
              local_70 = (ulong)(iVar30 + iVar47 + 2);
              *(undefined4 *)(lVar20 + lVar44 * 4) = *(undefined4 *)(lVar29 + lVar44 * 4);
              goto LAB_0023dd24;
            }
            uVar8 = *(uint *)(lVar29 + lVar44 * 4);
            if (*(char *)(lVar17 + lVar44) == '\0') {
              uVar7 = *(uint *)(lVar50 + 0x10 + lVar44 * 4);
              goto LAB_0023da6c;
            }
          }
          else {
            if (*(char *)(lVar41 + 3 + lVar44) != '\0') {
              local_70 = (ulong)(iVar30 + iVar47 + 2);
              *(undefined4 *)(lVar20 + lVar44 * 4) = *(undefined4 *)(lVar29 + lVar44 * 4);
              goto LAB_0024235e;
            }
            if (*(char *)(lVar34 + lVar44) == '\0') {
              local_70 = (ulong)(iVar30 + iVar47 + 2);
              uVar8 = *(uint *)((long)puVar2 + lVar46);
              uVar21 = lVar44 + lVar35 + 2;
              goto LAB_002428c8;
            }
LAB_0023da3d:
            if (*(char *)(lVar41 + 4 + lVar44) == '\0') {
              local_70 = (ulong)(iVar30 + iVar47 + 2);
              uVar8 = *(uint *)((long)puVar2 + lVar46);
LAB_0023e707:
              puVar2[uVar21] = uVar8;
              iVar30 = (int)local_70;
              lVar17 = (long)iVar30;
              lVar15 = lVar17 << 0x20;
              lVar41 = lVar11 + lVar17 * 4;
              lVar20 = lVar39 + lVar41 + 8;
              lVar50 = lVar24 + lVar25 * local_98 + lVar17;
              lVar13 = lVar24 + lVar28 + lVar17;
              lVar19 = lVar13 + 3;
              lVar14 = 0;
              lVar18 = 0;
LAB_0023e780:
              uVar21 = lVar17 + lVar18 + 2;
              lVar29 = lVar15 >> 0x20;
              lVar34 = lVar15 >> 0x1e;
              iVar47 = (int)lVar18;
              if (lVar33 <= (long)uVar21) {
                uVar26 = (ulong)(iVar30 + 2) + lVar18;
                if (iVar38 < (int)uVar26) {
                  uVar21 = uVar26 & 0xffffffff;
                  goto LAB_0023e3e1;
                }
                uVar21 = uVar21 & 0xffffffff;
                if (*(char *)(lVar48 + uVar21) != '\0') {
                  if (pcVar27[lVar29 + 3] == '\0') {
                    puVar2[uVar21] = puVar2[lVar29];
                    goto LAB_00243d1f;
                  }
                  if (pcVar27[uVar21 - lVar25] == '\0') {
                    uVar8 = puVar12[uVar21];
                    uVar7 = puVar2[lVar29];
                    goto LAB_00243d4f;
                  }
                  if (pcVar27[lVar29] == '\0') {
                    uVar8 = puVar12[uVar21];
                    uVar7 = puVar2[lVar29];
                  }
                  else {
                    uVar8 = puVar12[lVar29];
                    if (pcVar27[lVar29 + (1 - lVar25)] != '\0') {
                      puVar2[uVar21] = uVar8;
                      goto LAB_00243d1f;
                    }
                    uVar7 = puVar12[uVar21];
                  }
                  uVar8 = UF::Merge(uVar8,uVar7);
                  puVar2[uVar21] = uVar8;
                  goto LAB_00243d1f;
                }
                uVar26 = (ulong)(uint)(iVar30 + 3 + iVar47);
                if (pcVar10[uVar21] == '\0') {
                  if (*(char *)(lVar48 + uVar26) == '\0') {
                    cVar16 = pcVar10[uVar26];
joined_r0x0023f2bf:
                    if (cVar16 == '\0') {
LAB_0023c70e:
                      puVar2[uVar21] = 0;
                      goto LAB_00243d1f;
                    }
LAB_0023c6ea:
                    UF::P_[UF::length_] = UF::length_;
                    uVar8 = UF::length_ + 1;
                    puVar2[uVar21] = UF::length_;
                    UF::length_ = uVar8;
                  }
                  else {
                    if (pcVar27[uVar26] == '\0') goto LAB_0023c6ea;
LAB_0023bfae:
                    uVar8 = puVar12[uVar21];
LAB_00242a92:
                    puVar2[uVar21] = uVar8;
                  }
                }
                else {
                  if (*(char *)(lVar48 + uVar26) == '\0') {
                    puVar2[uVar21] = *(uint *)((long)puVar2 + lVar34);
                    goto LAB_00243d1f;
                  }
                  if (pcVar27[uVar26] == '\0') goto LAB_0023d910;
                  if (pcVar27[uVar21 - lVar25] == '\0') goto LAB_0023d813;
                  if (pcVar27[lVar29] == '\0') {
                    uVar8 = puVar12[uVar21];
                    uVar7 = puVar2[lVar29];
                  }
                  else {
                    uVar8 = puVar12[lVar29];
                    if (pcVar27[lVar29 + (1 - lVar25)] != '\0') {
                      puVar2[uVar21] = uVar8;
                      goto LAB_00243d1f;
                    }
                    uVar7 = puVar12[uVar21];
                  }
                  uVar8 = UF::Merge(uVar8,uVar7);
                  puVar2[uVar21] = uVar8;
                }
                goto LAB_00243d1f;
              }
              if (*(char *)(lVar13 + 2 + lVar18) == '\0') {
                if (*(char *)(lVar24 + lVar25 * local_90 + lVar17 + 2 + lVar18) == '\0') {
                  local_70 = (ulong)(iVar30 + 2) + lVar18;
                  uVar8 = (uint)local_70;
                  lVar50 = lVar15 + 0x300000000 >> 0x20;
                  if (*(char *)(lVar48 + lVar50) == '\0') {
                    if (pcVar10[lVar50] != '\0') {
                      UF::P_[UF::length_] = UF::length_;
                      uVar8 = UF::length_ + 1;
                      *(uint *)(lVar41 + lVar39 + 8 + lVar18 * 4) = UF::length_;
                      UF::length_ = uVar8;
                      goto LAB_0023c718;
                    }
                    lVar14 = lVar14 + lVar41 + lVar39;
                    goto LAB_00241b37;
                  }
                  if (pcVar27[lVar50] != '\0') {
                    *(undefined4 *)(lVar20 + lVar18 * 4) =
                         *(undefined4 *)(lVar1 * lVar32 + lVar17 * 4 + lVar39 + 8 + lVar18 * 4);
                    goto LAB_0023e1f9;
                  }
                  lVar50 = lVar15 + 0x400000000 >> 0x20;
                  if (pcVar27[lVar50] == '\0') {
                    UF::P_[UF::length_] = UF::length_;
                    uVar7 = UF::length_ + 1;
                    *(uint *)(lVar41 + lVar39 + 8 + lVar18 * 4) = UF::length_;
                    UF::length_ = uVar7;
                    goto LAB_0023d2a6;
                  }
                  *(uint *)(lVar41 + lVar39 + 8 + lVar18 * 4) = puVar12[lVar50];
                  goto LAB_0023d927;
                }
                if (*(char *)(lVar19 + lVar18) == '\0') {
                  *(undefined4 *)(lVar41 + lVar39 + 8 + lVar18 * 4) =
                       *(undefined4 *)((long)puVar2 + lVar34);
                  local_70 = (ulong)(iVar30 + iVar47 + 2);
                  goto LAB_0023f32b;
                }
                if (*(char *)(lVar50 + 3 + lVar18) != '\0') {
                  local_70 = (ulong)(iVar30 + 2) + lVar18;
                  if (*(char *)(lVar18 + 2 + lVar25 * lVar32 + lVar17 + lVar24) == '\0') {
                    uVar8 = UF::Merge(*(uint *)(lVar1 * lVar32 + lVar17 * 4 + lVar39 + 8 +
                                               lVar18 * 4),*(uint *)((long)puVar2 + lVar34));
                    *(uint *)(lVar20 + lVar18 * 4) = uVar8;
                    local_70 = local_70 & 0xffffffff;
                    goto LAB_0023e1f9;
                  }
                  if (pcVar27[lVar29] == '\0') {
                    uVar8 = UF::Merge(*(uint *)(lVar1 * lVar32 + lVar17 * 4 + lVar39 + 8 +
                                               lVar18 * 4),puVar2[lVar29]);
                  }
                  else {
                    if (pcVar27[lVar29 + (1 - lVar25)] != '\0') {
                      *(uint *)(lVar41 + lVar39 + 8 + lVar18 * 4) = puVar12[lVar29];
                      goto LAB_0023e1f9;
                    }
                    uVar8 = UF::Merge(puVar12[lVar29],
                                      *(uint *)(lVar1 * lVar32 + lVar17 * 4 + lVar39 + 8 +
                                               lVar18 * 4));
                  }
                  *(uint *)(lVar20 + lVar18 * 4) = uVar8;
                  goto LAB_0023e1f9;
                }
              }
              else {
                if (*(char *)(lVar50 + 3 + lVar18) != '\0') {
                  local_70 = (ulong)(iVar30 + 2) + lVar18;
                  if (*(char *)(lVar18 + 2 + lVar25 * lVar32 + lVar17 + lVar24) == '\0') {
                    uVar8 = UF::Merge(*(uint *)(lVar1 * lVar32 + lVar17 * 4 + lVar39 + 8 +
                                               lVar18 * 4),*(uint *)((long)puVar2 + lVar34));
                    *(uint *)(lVar20 + lVar18 * 4) = uVar8;
                    local_70 = local_70 & 0xffffffff;
                    goto LAB_0024235e;
                  }
                  if (pcVar27[lVar29] == '\0') {
                    uVar8 = UF::Merge(*(uint *)(lVar1 * lVar32 + lVar17 * 4 + lVar39 + 8 +
                                               lVar18 * 4),puVar2[lVar29]);
                  }
                  else {
                    if (pcVar27[lVar29 + (1 - lVar25)] != '\0') {
                      *(uint *)(lVar41 + lVar39 + 8 + lVar18 * 4) = puVar12[lVar29];
                      goto LAB_0023d457;
                    }
                    uVar8 = UF::Merge(puVar12[lVar29],
                                      *(uint *)(lVar1 * lVar32 + lVar17 * 4 + lVar39 + 8 +
                                               lVar18 * 4));
                  }
                  *(uint *)(lVar20 + lVar18 * 4) = uVar8;
                  goto LAB_0023d457;
                }
                if (*(char *)(lVar19 + lVar18) == '\0') goto LAB_0023e90e;
              }
              if (*(char *)(lVar50 + 4 + lVar18) == '\0') goto code_r0x0023e7d5;
              local_70 = (ulong)(iVar30 + 2) + lVar18;
              lVar50 = lVar25 * lVar32 + lVar17 + lVar24;
              if (*(char *)(lVar18 + 3 + lVar50) == '\0') {
                uVar8 = UF::Merge(*(uint *)(lVar1 * lVar32 + lVar17 * 4 + lVar39 + 0x10 + lVar18 * 4
                                           ),*(uint *)((long)puVar2 + lVar34));
                *(uint *)(lVar20 + lVar18 * 4) = uVar8;
                local_70 = local_70 & 0xffffffff;
              }
              else if (*(char *)(lVar18 + 2 + lVar50) == '\0') {
                uVar8 = UF::Merge(*(uint *)(lVar1 * lVar32 + lVar17 * 4 + lVar39 + 8 + lVar18 * 4),
                                  *(uint *)((long)puVar2 + lVar34));
                *(uint *)(lVar20 + lVar18 * 4) = uVar8;
                local_70 = local_70 & 0xffffffff;
              }
              else {
                if (pcVar27[lVar29] == '\0') {
                  uVar8 = *(uint *)(lVar1 * lVar32 + lVar17 * 4 + lVar39 + 8 + lVar18 * 4);
                  uVar7 = puVar2[lVar29];
LAB_0023f050:
                  uVar8 = UF::Merge(uVar8,uVar7);
                  *(uint *)(lVar20 + lVar18 * 4) = uVar8;
                }
                else {
                  uVar8 = puVar12[lVar29];
                  if (pcVar27[lVar29 + (1 - lVar25)] == '\0') {
                    uVar7 = *(uint *)(lVar1 * lVar32 + lVar17 * 4 + lVar39 + 8 + lVar18 * 4);
                    goto LAB_0023f050;
                  }
                  *(uint *)(lVar41 + lVar39 + 8 + lVar18 * 4) = uVar8;
                }
                local_70 = local_70 & 0xffffffff;
              }
              goto LAB_0023d927;
            }
            if (*(char *)(lVar17 + lVar44) == '\0') {
              uVar8 = *(uint *)(lVar50 + 0x10 + lVar44 * 4);
              uVar7 = *(uint *)(lVar39 + lVar15 + lVar44 * 4);
LAB_0023da6c:
              uVar8 = UF::Merge(uVar8,uVar7);
            }
            else {
              uVar8 = *(uint *)(lVar29 + lVar44 * 4);
            }
          }
          *(uint *)(lVar20 + lVar44 * 4) = uVar8;
          lVar19 = lVar19 + 0x200000000;
          lVar44 = lVar44 + 2;
          lVar14 = lVar14 + 8;
        }
        uVar8 = iVar30 + 2 + iVar47;
        if (iVar38 < (int)uVar8) {
LAB_0023e3c7:
          uVar21 = (ulong)uVar8;
LAB_0023e3e1:
          uVar26 = uVar21 & 0xffffffff;
          if ((*(char *)(lVar48 + uVar26) == '\0') && (pcVar10[uVar26] == '\0')) {
            puVar2[uVar26] = 0;
          }
          else {
            puVar2[uVar26] = puVar2[(long)(int)uVar21 + -2];
          }
        }
        else {
          uVar21 = uVar21 & 0xffffffff;
          if (*(char *)(lVar48 + uVar21) == '\0') {
            uVar26 = (ulong)(uint)(iVar30 + 3 + iVar47);
            if (pcVar10[uVar21] == '\0') {
              if (*(char *)(lVar48 + uVar26) == '\0') {
                if (pcVar10[uVar26] == '\0') {
                  puVar2[uVar21] = 0;
                }
                else {
                  UF::P_[UF::length_] = UF::length_;
                  uVar8 = UF::length_ + 1;
                  puVar2[uVar21] = UF::length_;
                  UF::length_ = uVar8;
                }
                goto LAB_00243d1f;
              }
LAB_0023dcba:
              uVar8 = puVar12[uVar21];
            }
            else {
              if ((*(char *)(lVar48 + uVar26) != '\0') && (pcVar27[uVar26] != '\0'))
              goto LAB_0023dcba;
              uVar8 = *(uint *)((long)puVar2 + lVar46);
            }
            puVar2[uVar21] = uVar8;
          }
          else {
            if (pcVar27[(lVar19 >> 0x20) + 3] == '\0') {
              uVar8 = puVar2[lVar19 >> 0x20];
            }
            else {
              uVar8 = puVar12[uVar21];
            }
            puVar2[uVar21] = uVar8;
          }
        }
        goto LAB_00243d1f;
      }
      if (uVar31 == 2) {
        if (cVar16 == '\0') {
          if (*pcVar10 == '\0') {
            if (*(char *)(lVar48 + 1) != '\0') goto LAB_0023bc29;
            if (pcVar10[1] == '\0') goto LAB_0023bdf9;
          }
          else if (*(char *)(lVar48 + 1) != '\0') goto LAB_0023bc29;
LAB_0023bd48:
          UF::P_[UF::length_] = UF::length_;
          uVar8 = UF::length_ + 1;
          *puVar2 = UF::length_;
          UF::length_ = uVar8;
        }
        else {
LAB_0023bc29:
          if (pcVar27[1] == '\0') goto LAB_0023bc85;
LAB_0023bc8e:
          *puVar2 = *puVar12;
        }
      }
      else {
        if (cVar16 != '\0') {
LAB_0023bc85:
          if (*pcVar27 == '\0') goto LAB_0023bd48;
          goto LAB_0023bc8e;
        }
        if (*pcVar10 != '\0') goto LAB_0023bd48;
LAB_0023bdf9:
        *puVar2 = 0;
      }
LAB_00243d1f:
      lVar32 = lVar32 + 2;
      local_98 = local_98 + 2;
      local_90 = local_90 + 2;
    }
    if (this->o_rows == false) {
      return;
    }
    pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
    pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
    lVar28 = *(long *)&pMVar4->field_0x10;
    lVar11 = **(long **)&pMVar4->field_0x48;
    lVar41 = (long)(int)(uVar9 - 1);
    lVar32 = lVar28 + lVar11 * lVar41;
    lVar17 = lVar32 - lVar11;
    lVar13 = lVar17 - lVar11;
    lVar39 = *(long *)&pMVar5->field_0x10;
    lVar1 = **(long **)&pMVar5->field_0x48;
    lVar48 = lVar39 + lVar1 * lVar41;
    lVar15 = lVar48 + lVar1 * -2;
    lVar45 = lVar17 + 1;
    lVar50 = (lVar41 + -1) * lVar11;
    lVar14 = lVar13 + 1;
    lVar24 = lVar11 * (lVar41 + -2) + 3 + lVar28;
    lVar25 = lVar39 + 8 + lVar1 * lVar41;
    lVar39 = lVar1 * (lVar41 + -2) + 8 + lVar39;
    lVar1 = lVar50 + 2 + lVar28;
    lVar11 = lVar28 + 3 + lVar11 * lVar41;
    lVar28 = lVar50 + 4 + lVar28;
    local_c0 = 0xfffffffffffffffe;
    while( true ) {
      lVar41 = (long)(int)local_c0;
      local_c0 = lVar41 + 2;
      if (iVar38 <= (int)local_c0) break;
      uVar21 = local_c0;
      if (*(char *)(lVar32 + 2 + lVar41) == '\0') {
        if (*(char *)(lVar32 + 3 + lVar41) == '\0') {
LAB_002440a9:
          iVar30 = (int)uVar21;
          goto LAB_002440ab;
        }
        if (*(char *)(lVar17 + 3 + lVar41) != '\0') {
LAB_00244846:
          local_c0 = uVar21 & 0xffffffff;
          goto LAB_00244944;
        }
LAB_0024402f:
        cVar16 = *(char *)(lVar41 + 2 + lVar17);
        if (*(char *)(lVar41 + 4 + lVar17) == '\0') {
          if (cVar16 == '\0') goto LAB_002448dd;
          local_c0 = local_c0 & 0xffffffff;
          goto LAB_002447c4;
        }
        if (cVar16 == '\0') goto LAB_002448c0;
        uVar9 = *(uint *)(lVar15 + 8 + lVar41 * 4);
        if (*(char *)(lVar13 + 3 + lVar41) != '\0') {
          *(uint *)(lVar48 + 8 + lVar41 * 4) = uVar9;
          goto LAB_002445fa;
        }
        uVar31 = *(uint *)(lVar15 + 0x10 + lVar41 * 4);
LAB_00244908:
        uVar9 = UF::Merge(uVar9,uVar31);
LAB_0024491b:
        *(uint *)(lVar48 + 8 + lVar41 * 4) = uVar9;
LAB_002445fa:
        iVar30 = (int)local_c0;
        lVar34 = (long)iVar30;
        lVar29 = lVar34 << 0x20;
        lVar41 = lVar28 + lVar34;
        lVar50 = lVar39 + lVar34 * 4;
        lVar18 = lVar11 + lVar34;
        lVar19 = lVar25 + lVar34 * 4;
        lVar20 = 0;
        do {
          uVar21 = lVar34 + lVar20 + 2;
          if (lVar33 <= (long)uVar21) {
            local_c0 = (ulong)(iVar30 + 2) + lVar20;
            if (iVar38 < (int)local_c0) goto LAB_00245429;
            lVar45 = lVar29 + 0x200000000 >> 0x20;
            lVar29 = lVar29 >> 0x20;
            if (*(char *)(lVar32 + lVar45) == '\0') {
              if (*(char *)(lVar32 + 3 + lVar29) == '\0') {
LAB_002457e4:
                *(undefined4 *)(lVar48 + lVar45 * 4) = 0;
                return;
              }
LAB_00245850:
              uVar23 = *(undefined4 *)(lVar15 + lVar45 * 4);
            }
            else {
              if (*(char *)(lVar17 + 3 + lVar29) != '\0') goto LAB_00245850;
              uVar23 = *(undefined4 *)(lVar48 + lVar29 * 4);
            }
LAB_00245854:
            *(undefined4 *)(lVar48 + lVar45 * 4) = uVar23;
            return;
          }
          iVar47 = (int)lVar20;
          if (*(char *)(lVar18 + -1 + lVar20) == '\0') {
            if (*(char *)(lVar18 + lVar20) == '\0') {
              iVar30 = iVar47 + iVar30 + 2;
              uVar21 = lVar34 + lVar20 + 2;
              goto LAB_002440ab;
            }
            if (*(char *)(lVar41 + -1 + lVar20) != '\0') {
              local_c0 = (ulong)(iVar47 + iVar30 + 2);
              uVar21 = lVar34 + 2 + lVar20;
              goto LAB_00244944;
            }
            if (*(char *)(lVar41 + lVar20) == '\0') goto LAB_00244799;
            uVar9 = *(uint *)(lVar50 + lVar20 * 4);
            if (*(char *)(lVar24 + lVar34 + lVar20) == '\0') {
              uVar31 = *(uint *)(lVar50 + 8 + lVar20 * 4);
LAB_002446c1:
              uVar9 = UF::Merge(uVar9,uVar31);
            }
          }
          else {
            if (*(char *)(lVar41 + -1 + lVar20) != '\0') {
              local_c0 = (ulong)(iVar47 + iVar30 + 2);
              uVar9 = *(uint *)(lVar50 + lVar20 * 4);
              goto LAB_00244e7d;
            }
            if (*(char *)(lVar18 + lVar20) == '\0') {
              local_c0 = (ulong)(iVar47 + iVar30 + 2);
              uVar9 = *(uint *)(lVar48 + (lVar29 >> 0x1e));
              uVar21 = lVar34 + lVar20 + 2;
              goto LAB_00245166;
            }
            if (*(char *)(lVar41 + lVar20) == '\0') {
              iVar30 = iVar47 + iVar30 + 2;
              puVar37 = (undefined4 *)((lVar29 >> 0x1e) + lVar48);
              uVar21 = lVar34 + lVar20 + 2;
              goto LAB_00244c1e;
            }
            if (*(char *)(lVar24 + lVar34 + lVar20) == '\0') {
              uVar9 = *(uint *)(lVar50 + 8 + lVar20 * 4);
              uVar31 = *(uint *)(lVar19 + -8 + lVar20 * 4);
              goto LAB_002446c1;
            }
            uVar9 = *(uint *)(lVar50 + lVar20 * 4);
          }
          *(uint *)(lVar19 + lVar20 * 4) = uVar9;
          lVar29 = lVar29 + 0x200000000;
          lVar20 = lVar20 + 2;
        } while( true );
      }
      if (*(char *)(lVar17 + 3 + lVar41) != '\0') {
        uVar9 = *(uint *)(lVar15 + 8 + lVar41 * 4);
        local_c0 = local_c0 & 0xffffffff;
        goto LAB_00244e7d;
      }
      if (*(char *)(lVar32 + 3 + lVar41) != '\0') goto LAB_0024402f;
      if (*(char *)(lVar17 + local_c0) == '\0') {
        UF::P_[UF::length_] = UF::length_;
        uVar9 = UF::length_;
        UF::length_ = UF::length_ + 1;
      }
      else {
        uVar9 = *(uint *)(lVar15 + 8 + lVar41 * 4);
      }
LAB_002448cb:
      local_c0 = uVar21 & 0xffffffff;
LAB_00245166:
      *(uint *)(lVar48 + uVar21 * 4) = uVar9;
    }
    if (iVar38 < (int)local_c0) {
      if (*(char *)(lVar32 + local_c0) == '\0') {
LAB_00245a52:
        *(undefined4 *)(lVar48 + 8 + lVar41 * 4) = 0;
        return;
      }
    }
    else {
      if ((*(char *)(lVar32 + local_c0) == '\0') && (*(char *)(lVar41 + 3 + lVar32) == '\0'))
      goto LAB_00245a52;
      if (*(char *)(lVar17 + 3 + lVar41) != '\0') goto LAB_00245818;
    }
    cVar16 = *(char *)(lVar17 + local_c0);
    uVar9 = UF::length_;
joined_r0x00245812:
    UF::length_ = uVar9;
    if (cVar16 == '\0') {
      *(uint *)((long)UF::P_ + (ulong)uVar9 * 4) = uVar9;
      UF::length_ = uVar9 + 1;
      *(uint *)(lVar48 + 8 + lVar41 * 4) = uVar9;
      return;
    }
LAB_00245818:
    uVar9 = *(uint *)(lVar15 + 8 + lVar41 * 4);
LAB_0024581d:
    *(uint *)(lVar48 + 8 + lVar41 * 4) = uVar9;
    return;
  }
  lVar32 = *(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x10;
  lVar48 = (long)(int)uVar31 + -2;
  lVar33 = -2;
LAB_0023b5fd:
  lVar24 = (long)(int)lVar33;
  lVar33 = lVar24 + 2;
  iVar38 = (int)lVar48;
  if ((int)lVar33 < iVar38) {
    cVar16 = *(char *)(lVar45 + 3 + lVar24);
    if (*(char *)(lVar45 + 2 + lVar24) != '\0') goto code_r0x0023b619;
    if (cVar16 != '\0') {
      puVar2[UF::length_] = UF::length_;
      uVar9 = UF::length_ + 1;
      *(uint *)(lVar32 + 8 + lVar24 * 4) = UF::length_;
      UF::length_ = uVar9;
      goto LAB_0023b657;
    }
LAB_0023b6ba:
    uVar23 = 0;
    goto LAB_0023b6c2;
  }
  cVar16 = *(char *)(lVar45 + lVar33);
  if ((int)lVar33 <= iVar38) {
    if (cVar16 != '\0') goto LAB_00245504;
    cVar16 = *(char *)(lVar45 + 3 + lVar24);
  }
  if (cVar16 == '\0') {
    *(undefined4 *)(lVar32 + 8 + lVar24 * 4) = 0;
    return;
  }
LAB_00245504:
  puVar2[UF::length_] = UF::length_;
  uVar9 = UF::length_ + 1;
  *(uint *)(lVar32 + 8 + lVar24 * 4) = UF::length_;
  UF::length_ = uVar9;
  return;
LAB_0023b837:
  uVar26 = (ulong)(iVar30 + iVar47 + 2);
  *(undefined4 *)(lVar39 + 8 + lVar50 * 4) = *(undefined4 *)(lVar39 + lVar50 * 4);
LAB_0023b846:
  iVar30 = (int)uVar26;
  lVar41 = (long)iVar30;
  lVar28 = lVar41 << 0x20;
  lVar39 = lVar25 + lVar41 * 4;
  lVar1 = lVar48 + lVar41;
  lVar11 = lVar45 + 2 + lVar41;
  lVar50 = 0;
  do {
    if (lVar33 <= lVar41 + 2 + lVar50) {
      uVar26 = lVar28 + 0x200000000 >> 0x20;
      lVar48 = lVar28 >> 0x20;
      if (iVar38 < iVar30 + (int)lVar50 + 2) {
        if ((*(char *)(lVar45 + uVar26) == '\0') && (*(char *)(lVar32 + uVar26) == '\0'))
        goto LAB_0023bb6d;
        cVar16 = *(char *)(lVar32 + 1 + lVar48);
      }
      else if (*(char *)(lVar45 + uVar26) == '\0') {
        if (*(char *)(lVar32 + uVar26) == '\0') break;
        cVar16 = *(char *)(lVar32 + 1 + lVar48);
      }
      else {
        cVar16 = *(char *)(lVar32 + 1 + lVar48);
      }
      if (cVar16 == '\0') goto LAB_0023bb5a;
      uVar8 = *(uint *)(lVar25 + lVar48 * 4);
      goto LAB_0023bb74;
    }
    uVar8 = UF::length_;
    if (*(char *)(lVar11 + lVar50) == '\0') {
      if (*(char *)(lVar1 + 1 + lVar50) == '\0') {
        uVar21 = (ulong)(iVar30 + 2) + lVar50;
        lVar39 = lVar28 + 0x300000000 >> 0x20;
        uVar26 = lVar41 + 2 + lVar50;
        if ((*(char *)(lVar45 + lVar39) == '\0') && (*(char *)(lVar32 + lVar39) == '\0'))
        goto LAB_0023b9bd;
      }
      else {
        if (*(char *)(lVar11 + 1 + lVar50) == '\0') {
          if (*(char *)(lVar1 + lVar50) == '\0') goto LAB_0023b8c1;
          goto LAB_0023b8b1;
        }
        uVar21 = (ulong)(iVar30 + 2) + lVar50;
        uVar26 = lVar41 + 2 + lVar50;
        if (*(char *)(lVar48 + lVar41 + lVar50) != '\0') {
          uVar8 = *(uint *)(lVar39 + lVar50 * 4);
          goto LAB_0023b7a1;
        }
      }
      puVar2[UF::length_] = UF::length_;
      UF::length_ = UF::length_ + 1;
      goto LAB_0023b7a1;
    }
    cVar16 = *(char *)(lVar11 + 1 + lVar50);
    if (*(char *)(lVar1 + lVar50) == '\0') {
      if (cVar16 != '\0') {
        puVar2[UF::length_] = UF::length_;
        UF::length_ = UF::length_ + 1;
        goto LAB_0023b996;
      }
LAB_0023b8c1:
      puVar2[UF::length_] = UF::length_;
      UF::length_ = UF::length_ + 1;
    }
    else {
      if (cVar16 != '\0') goto LAB_0023b8f4;
LAB_0023b8b1:
      uVar8 = *(uint *)(lVar39 + lVar50 * 4);
    }
    *(uint *)(lVar39 + 8 + lVar50 * 4) = uVar8;
    lVar28 = lVar28 + 0x200000000;
    lVar50 = lVar50 + 2;
  } while( true );
LAB_0023bb3c:
  lVar48 = lVar28 + 0x300000000 >> 0x20;
  if ((*(char *)(lVar45 + lVar48) == '\0') && (*(char *)(lVar32 + lVar48) == '\0')) {
LAB_0023bb6d:
    uVar8 = 0;
  }
  else {
LAB_0023bb5a:
    puVar2[UF::length_] = UF::length_;
    uVar8 = UF::length_;
    UF::length_ = UF::length_ + 1;
  }
  goto LAB_0023bb74;
LAB_0023e90e:
  local_70 = (ulong)(iVar30 + iVar47 + 2);
  uVar8 = *(uint *)((long)puVar2 + lVar34);
LAB_002428c8:
  puVar2[uVar21] = uVar8;
  iVar30 = (int)local_70;
  lVar41 = (long)iVar30;
  local_70 = lVar41 + 2;
  uVar8 = (uint)local_70;
  if ((int)uVar8 < iVar38) {
    if (*(char *)(lVar48 + local_70) == '\0') {
      cVar16 = *(char *)(lVar41 + 3 + lVar48);
      if (pcVar10[lVar41 + 2] == '\0') {
        if (cVar16 == '\0') {
          if (pcVar10[lVar41 + 3] == '\0') {
LAB_00243246:
            puVar42 = puVar2 + local_70;
            goto LAB_0023bedf;
          }
          UF::P_[UF::length_] = UF::length_;
          uVar8 = UF::length_ + 1;
          puVar2[lVar41 + 2] = UF::length_;
          UF::length_ = uVar8;
LAB_0024323e:
          local_70 = local_70 & 0xffffffff;
          goto LAB_0023c718;
        }
        cVar16 = pcVar27[lVar41 + 3];
      }
      else {
        if (cVar16 == '\0') {
          if (pcVar10[lVar41 + 1] == '\0') {
            UF::P_[UF::length_] = UF::length_;
            uVar8 = UF::length_ + 1;
            puVar2[lVar41 + 2] = UF::length_;
            UF::length_ = uVar8;
            goto LAB_0023f32b;
          }
          puVar2[lVar41 + 2] = puVar2[lVar41];
          goto LAB_0023f32b;
        }
        cVar16 = pcVar27[lVar41 + 3];
        if (pcVar10[lVar41 + 1] != '\0') {
          if (cVar16 != '\0') {
            if (pcVar27[lVar41] == '\0') {
              uVar8 = puVar12[lVar41 + 2];
              uVar7 = puVar2[lVar41];
            }
            else {
              if (pcVar27[lVar41 + (1 - lVar25)] != '\0') {
                if (pcVar27[local_70] != '\0') {
                  puVar2[lVar41 + 2] = puVar12[lVar41];
                  goto LAB_0023e1f9;
                }
                if (pcVar27[local_70 - lVar25] == '\0') {
                  uVar8 = UF::Merge(puVar12[lVar41],puVar12[lVar41 + 2]);
                  puVar2[lVar41 + 2] = uVar8;
                  goto LAB_0023e1f9;
                }
                puVar2[lVar41 + 2] = puVar12[lVar41];
                goto LAB_0023e1f9;
              }
              uVar8 = puVar12[lVar41];
              uVar7 = puVar12[lVar41 + 2];
            }
            uVar8 = UF::Merge(uVar8,uVar7);
            puVar2[lVar41 + 2] = uVar8;
            goto LAB_0023e1f9;
          }
          if (pcVar27[lVar41 + 4] == '\0') {
            if (pcVar27[lVar41 + 2] == '\0') goto LAB_00243a01;
            if (pcVar27[lVar41] != '\0') {
              cVar16 = pcVar27[lVar41 + (1 - lVar25)];
              goto LAB_002439ea;
            }
LAB_00243e5a:
            uVar8 = puVar12[lVar41 + 2];
            uVar7 = puVar2[lVar41];
            goto LAB_00243e63;
          }
          if (pcVar27[lVar41 + (3 - lVar25)] == '\0') {
            if (pcVar27[local_70] == '\0') goto LAB_00243e95;
            cVar16 = pcVar27[lVar41];
            goto joined_r0x00243be9;
          }
          if (pcVar27[lVar41] == '\0') {
            uVar8 = puVar12[lVar41 + 2];
            goto LAB_00243e9a;
          }
          if (pcVar27[lVar41 + (1 - lVar25)] == '\0') {
            uVar8 = puVar12[lVar41];
          }
          else {
            if (pcVar27[local_70] != '\0') {
              puVar2[lVar41 + 2] = puVar12[lVar41];
              goto LAB_0023d927;
            }
            uVar8 = puVar12[lVar41];
            if (pcVar27[local_70 - lVar25] != '\0') goto LAB_00243ee7;
          }
LAB_00243e19:
          uVar7 = puVar12[lVar41 + 2];
          goto LAB_00243ea4;
        }
      }
      if (cVar16 != '\0') {
        puVar2[lVar41 + 2] = puVar12[lVar41 + 2];
        goto LAB_0023e1f9;
      }
      if (pcVar27[lVar41 + 4] == '\0') {
        if (pcVar27[lVar41 + 2] != '\0') {
          puVar2[lVar41 + 2] = puVar12[lVar41 + 2];
          goto LAB_002437b2;
        }
        UF::P_[UF::length_] = UF::length_;
        uVar7 = UF::length_ + 1;
        puVar2[lVar41 + 2] = UF::length_;
        UF::length_ = uVar7;
        goto LAB_0023d2a6;
      }
      if (pcVar27[lVar41 + 2] == '\0') {
        puVar2[lVar41 + 2] = puVar12[lVar41 + 4];
        goto LAB_0023d927;
      }
      uVar8 = puVar12[lVar41 + 2];
      if (pcVar27[lVar41 + (3 - lVar25)] != '\0') goto LAB_00243ee7;
LAB_002431bf:
      uVar7 = puVar12[lVar41 + 4];
    }
    else {
      if (pcVar10[lVar41 + 1] == '\0') {
        if (pcVar27[lVar41 + 3] != '\0') {
          puVar2[lVar41 + 2] = puVar12[lVar41 + 2];
          goto LAB_0024235e;
        }
        if (*(char *)(lVar48 + 3 + lVar41) == '\0') {
          if (pcVar27[local_70] == '\0') {
            UF::P_[UF::length_] = UF::length_;
            uVar8 = UF::length_ + 1;
            puVar2[lVar41 + 2] = UF::length_;
            UF::length_ = uVar8;
            goto LAB_002404c9;
          }
          puVar2[lVar41 + 2] = puVar12[lVar41 + 2];
          goto LAB_00240a24;
        }
        if (pcVar27[lVar41 + 4] == '\0') {
          if (pcVar27[lVar41 + 2] == '\0') {
            UF::P_[UF::length_] = UF::length_;
            uVar8 = UF::length_ + 1;
            puVar2[lVar41 + 2] = UF::length_;
            UF::length_ = uVar8;
            goto LAB_00241c44;
          }
          puVar2[lVar41 + 2] = puVar12[lVar41 + 2];
          goto LAB_0023ec28;
        }
        if (pcVar27[lVar41 + 2] == '\0') {
          puVar2[lVar41 + 2] = puVar12[lVar41 + 4];
        }
        else {
          uVar8 = puVar12[lVar41 + 2];
          if (pcVar27[lVar41 + (3 - lVar25)] == '\0') goto LAB_002431bf;
LAB_00243ee7:
          puVar2[lVar41 + 2] = uVar8;
        }
        goto LAB_0023d927;
      }
      if (pcVar27[lVar41 + 3] != '\0') {
        if (pcVar27[lVar41] == '\0') {
          uVar8 = UF::Merge(puVar12[lVar41 + 2],puVar2[lVar41]);
          puVar2[lVar41 + 2] = uVar8;
          goto LAB_0024235e;
        }
        if (pcVar27[lVar41 + (1 - lVar25)] == '\0') {
          uVar8 = UF::Merge(puVar12[lVar41],puVar12[lVar41 + 2]);
          puVar2[lVar41 + 2] = uVar8;
          goto LAB_0024235e;
        }
        if (pcVar27[local_70] != '\0') {
          puVar2[lVar41 + 2] = puVar12[lVar41];
          goto LAB_0024235e;
        }
        if (pcVar27[local_70 - lVar25] == '\0') {
          uVar8 = UF::Merge(puVar12[lVar41],puVar12[lVar41 + 2]);
          puVar2[lVar41 + 2] = uVar8;
          goto LAB_0024235e;
        }
        puVar2[lVar41 + 2] = puVar12[lVar41];
        goto LAB_0024235e;
      }
      if (*(char *)(lVar48 + 3 + lVar41) == '\0') {
        if (pcVar27[lVar41 + 2] == '\0') {
          puVar2[lVar41 + 2] = puVar2[lVar41];
          goto LAB_002404c9;
        }
        if (pcVar27[lVar41] == '\0') {
          uVar8 = puVar12[lVar41 + 2];
          uVar7 = puVar2[lVar41];
        }
        else {
          uVar8 = puVar12[lVar41];
          if (pcVar27[lVar41 + (1 - lVar25)] != '\0') {
            puVar2[lVar41 + 2] = uVar8;
            goto LAB_00240a24;
          }
          uVar7 = puVar12[lVar41 + 2];
        }
        uVar8 = UF::Merge(uVar8,uVar7);
        puVar2[lVar41 + 2] = uVar8;
        goto LAB_00240a24;
      }
      if (pcVar27[lVar41 + 4] == '\0') {
        if (pcVar27[lVar41 + 2] == '\0') {
LAB_00243a01:
          puVar2[lVar41 + 2] = puVar2[lVar41];
          goto LAB_0023d2a6;
        }
        if (pcVar27[lVar41] == '\0') goto LAB_00243e5a;
        cVar16 = pcVar27[lVar41 + (1 - lVar25)];
LAB_002439ea:
        uVar8 = puVar12[lVar41];
        if (cVar16 != '\0') {
          puVar2[lVar41 + 2] = uVar8;
          local_70 = local_70 & 0xffffffff;
          goto LAB_0023dd24;
        }
        uVar7 = puVar12[lVar41 + 2];
LAB_00243e63:
        uVar8 = UF::Merge(uVar8,uVar7);
        puVar2[lVar41 + 2] = uVar8;
LAB_0023dd24:
        do {
          lVar41 = (long)(int)local_70;
          uVar21 = lVar41 + 2;
          uVar8 = (uint)uVar21;
          if (iVar38 <= (int)uVar8) {
            if (iVar38 < (int)uVar8) goto LAB_0023e3e1;
            uVar21 = uVar21 & 0xffffffff;
            if (*(char *)(lVar48 + uVar21) == '\0') {
              uVar26 = (ulong)((int)local_70 + 3);
              if (pcVar10[uVar21] == '\0') {
                if (*(char *)(lVar48 + uVar26) == '\0') {
                  cVar16 = pcVar10[uVar26];
joined_r0x0023e0d3:
                  if (cVar16 == '\0') {
                    puVar2[uVar21] = 0;
                    goto LAB_00243d1f;
                  }
                }
                else {
                  cVar16 = pcVar27[uVar26];
joined_r0x0023c567:
                  if (cVar16 != '\0') {
LAB_0023e1c3:
                    uVar8 = puVar12[uVar21];
                    goto LAB_0023e1cc;
                  }
                }
LAB_0023e1d5:
                UF::P_[UF::length_] = UF::length_;
                uVar8 = UF::length_ + 1;
                puVar2[uVar21] = UF::length_;
                UF::length_ = uVar8;
                goto LAB_00243d1f;
              }
              if ((*(char *)(lVar48 + uVar26) != '\0') && (pcVar27[uVar26] != '\0')) {
                if (pcVar27[uVar21 - lVar25] == '\0') {
                  uVar8 = puVar12[uVar21];
                  uVar7 = puVar2[lVar41];
                }
                else {
                  uVar8 = puVar12[lVar41];
                  if (pcVar27[lVar41 + (1 - lVar25)] != '\0') {
                    puVar2[uVar21] = uVar8;
                    goto LAB_00243d1f;
                  }
                  uVar7 = puVar12[uVar21];
                }
                uVar8 = UF::Merge(uVar8,uVar7);
                puVar2[uVar21] = uVar8;
                goto LAB_00243d1f;
              }
            }
            else if (pcVar27[lVar41 + 3] != '\0') {
              if (pcVar27[uVar21 - lVar25] == '\0') {
                uVar8 = puVar12[uVar21];
                uVar7 = puVar2[lVar41];
              }
              else {
                uVar8 = puVar12[lVar41];
                if (pcVar27[lVar41 + (1 - lVar25)] != '\0') {
                  puVar2[uVar21] = uVar8;
                  goto LAB_00243d1f;
                }
                uVar7 = puVar12[uVar21];
              }
              uVar8 = UF::Merge(uVar8,uVar7);
              puVar2[uVar21] = uVar8;
              goto LAB_00243d1f;
            }
            uVar8 = puVar2[lVar41];
LAB_0023dec0:
            puVar2[uVar21] = uVar8;
            goto LAB_00243d1f;
          }
          local_70 = uVar21;
          if (*(char *)(lVar48 + uVar21) != '\0') {
            if (pcVar27[lVar41 + 3] != '\0') {
              if (pcVar27[uVar21 - lVar25] == '\0') {
                uVar8 = UF::Merge(puVar12[lVar41 + 2],puVar2[lVar41]);
                puVar2[lVar41 + 2] = uVar8;
                goto LAB_0024235e;
              }
              if (pcVar27[lVar41 + (1 - lVar25)] == '\0') {
                uVar8 = UF::Merge(puVar12[lVar41],puVar12[lVar41 + 2]);
                puVar2[lVar41 + 2] = uVar8;
                goto LAB_0024235e;
              }
              puVar2[lVar41 + 2] = puVar12[lVar41];
              goto LAB_0024235e;
            }
            if (*(char *)(lVar48 + 3 + lVar41) == '\0') {
              uVar8 = puVar2[lVar41];
              local_70 = uVar21 & 0xffffffff;
              goto LAB_002428c8;
            }
            if (pcVar27[lVar41 + 4] == '\0') {
LAB_0023dfeb:
              uVar8 = puVar2[lVar41];
              local_70 = uVar21 & 0xffffffff;
              goto LAB_0023e707;
            }
            if (pcVar27[lVar41 + (3 - lVar25)] == '\0') {
              uVar8 = UF::Merge(puVar12[lVar41 + 4],puVar2[lVar41]);
              puVar2[lVar41 + 2] = uVar8;
              goto LAB_0023d927;
            }
            cVar16 = pcVar27[uVar21 - lVar25];
LAB_0023dfc8:
            if (cVar16 == '\0') {
              uVar8 = puVar12[lVar41 + 2];
              uVar7 = puVar2[lVar41];
            }
            else {
              uVar8 = puVar12[lVar41];
              if (pcVar27[lVar41 + (1 - lVar25)] != '\0') {
                puVar2[lVar41 + 2] = uVar8;
                goto LAB_0023d927;
              }
              uVar7 = puVar12[lVar41 + 2];
            }
            uVar8 = UF::Merge(uVar8,uVar7);
            puVar2[lVar41 + 2] = uVar8;
            goto LAB_0023d927;
          }
          cVar16 = *(char *)(lVar41 + 3 + lVar48);
          if (pcVar10[lVar41 + 2] == '\0') {
            if (cVar16 == '\0') {
              if (pcVar10[lVar41 + 3] == '\0') goto LAB_00243246;
              UF::P_[UF::length_] = UF::length_;
              uVar8 = UF::length_ + 1;
              puVar2[lVar41 + 2] = UF::length_;
              UF::length_ = uVar8;
              goto LAB_0024323e;
            }
            if (pcVar27[lVar41 + 3] == '\0') {
              if (pcVar27[lVar41 + 4] == '\0') {
                UF::P_[UF::length_] = UF::length_;
                uVar7 = UF::length_ + 1;
                puVar2[lVar41 + 2] = UF::length_;
                UF::length_ = uVar7;
                goto LAB_0023d2a6;
              }
              puVar2[lVar41 + 2] = puVar12[lVar41 + 4];
              goto LAB_0023d927;
            }
            puVar2[lVar41 + 2] = puVar12[lVar41 + 2];
          }
          else {
            if (cVar16 == '\0') {
              puVar2[lVar41 + 2] = puVar2[lVar41];
              goto LAB_0023f32b;
            }
            if (pcVar27[lVar41 + 3] == '\0') {
              if (pcVar27[lVar41 + 4] == '\0') goto LAB_0023dfeb;
              if (pcVar27[lVar41 + (3 - lVar25)] != '\0') {
                cVar16 = pcVar27[uVar21 - lVar25];
                goto LAB_0023dfc8;
              }
              uVar8 = UF::Merge(puVar12[lVar41 + 4],puVar2[lVar41]);
              puVar2[lVar41 + 2] = uVar8;
              goto LAB_0023d927;
            }
            if (pcVar27[uVar21 - lVar25] == '\0') {
              uVar8 = puVar12[lVar41 + 2];
              uVar7 = puVar2[lVar41];
            }
            else {
              uVar8 = puVar12[lVar41];
              if (pcVar27[lVar41 + (1 - lVar25)] != '\0') {
                puVar2[lVar41 + 2] = uVar8;
                goto LAB_0023e1f9;
              }
              uVar7 = puVar12[lVar41 + 2];
            }
            uVar8 = UF::Merge(uVar8,uVar7);
            puVar2[lVar41 + 2] = uVar8;
          }
LAB_0023e1f9:
          iVar30 = (int)local_70;
          lVar46 = (long)iVar30;
          lVar34 = lVar46 << 0x20;
          lVar35 = lVar25 * local_90 + lVar46;
          lVar15 = lVar25 * lVar32 + lVar46;
          lVar44 = lVar25 * local_98 + lVar46;
          lVar41 = lVar24 + lVar44;
          lVar13 = lVar24 + 3 + lVar28 + lVar46;
          lVar50 = lVar11 + lVar46 * 4;
          lVar17 = lVar39 + lVar50 + 8;
          lVar18 = lVar46 * 4 + lVar1 * lVar32;
          lVar19 = lVar18 + lVar39;
          lVar20 = lVar19 + 8;
          lVar14 = 0;
          lVar29 = 0;
LAB_0023e2b4:
          uVar21 = lVar46 + lVar29 + 2;
          lVar49 = lVar34 >> 0x1e;
          iVar47 = (int)lVar29;
          if (lVar33 <= (long)uVar21) {
            uVar8 = iVar30 + 2 + iVar47;
            if (iVar38 < (int)uVar8) goto LAB_0023e3c7;
            uVar21 = uVar21 & 0xffffffff;
            if (*(char *)(lVar48 + uVar21) == '\0') {
              uVar26 = (ulong)(uint)(iVar30 + 3 + iVar47);
              if (pcVar10[uVar21] == '\0') {
                if (*(char *)(lVar48 + uVar26) == '\0') {
                  if (pcVar10[uVar26] == '\0') {
                    puVar2[uVar21] = 0;
                    goto LAB_00243d1f;
                  }
                }
                else if ((pcVar27[uVar26] != '\0') || (pcVar27[uVar21] != '\0')) goto LAB_0023e546;
                UF::P_[UF::length_] = UF::length_;
                uVar8 = UF::length_ + 1;
                puVar2[uVar21] = UF::length_;
                UF::length_ = uVar8;
                goto LAB_00243d1f;
              }
              if ((*(char *)(lVar48 + uVar26) == '\0') || (pcVar27[uVar26] == '\0')) {
                uVar8 = *(uint *)((long)puVar2 + lVar49);
              }
              else if (pcVar27[uVar21] == '\0') {
                if (pcVar27[uVar21 - lVar25] == '\0') {
                  uVar8 = puVar12[uVar21];
                  uVar7 = *(uint *)((long)puVar2 + lVar49);
                  goto LAB_0023f134;
                }
                uVar8 = *(uint *)((long)puVar12 + lVar49);
              }
              else {
LAB_0023e546:
                uVar8 = puVar12[uVar21];
              }
            }
            else {
              lVar34 = lVar34 >> 0x20;
              if (pcVar27[lVar34 + 3] == '\0') {
                puVar2[uVar21] = puVar2[lVar34];
                goto LAB_00243d1f;
              }
              if (pcVar27[uVar21] != '\0') goto LAB_0023e546;
              if (pcVar27[uVar21 - lVar25] == '\0') {
                uVar8 = puVar12[uVar21];
                uVar7 = puVar2[lVar34];
LAB_0023f134:
                uVar8 = UF::Merge(uVar8,uVar7);
                puVar2[uVar21] = uVar8;
                goto LAB_00243d1f;
              }
              uVar8 = puVar12[lVar34];
            }
            puVar2[uVar21] = uVar8;
            goto LAB_00243d1f;
          }
          if (*(char *)(lVar13 + -1 + lVar29) != '\0') goto LAB_0023e40f;
          cVar16 = *(char *)(lVar13 + lVar29);
          if (*(char *)(lVar24 + lVar35 + 2 + lVar29) != '\0') {
            if (cVar16 == '\0') {
              local_70 = (ulong)(iVar30 + iVar47 + 2);
              *(undefined4 *)(lVar50 + lVar39 + 8 + lVar29 * 4) =
                   *(undefined4 *)((long)puVar2 + lVar49);
              goto LAB_0023f32b;
            }
            if (*(char *)(lVar41 + 3 + lVar29) == '\0') {
              local_70 = (ulong)(iVar30 + 2) + lVar29;
              lVar41 = lVar34 + 0x400000000 >> 0x20;
              if (pcVar27[lVar41] == '\0') {
                uVar8 = *(uint *)((long)puVar2 + lVar49);
                local_70 = local_70 & 0xffffffff;
                goto LAB_0023e707;
              }
              if (*(char *)(lVar29 + 3 + lVar15 + lVar24) != '\0') {
                if (*(char *)(lVar29 + 2 + lVar44 + lVar24) != '\0') {
                  uVar8 = *(uint *)(lVar20 + lVar29 * 4);
                  goto LAB_0023f27f;
                }
                if (*(char *)(lVar29 + 2 + lVar15 + lVar24) != '\0') {
                  uVar8 = *(uint *)((long)puVar12 + lVar49);
                  goto LAB_0023ef82;
                }
                uVar8 = *(uint *)(lVar20 + lVar29 * 4);
                uVar7 = *(uint *)((long)puVar2 + lVar49);
                goto LAB_0023f25c;
              }
              uVar8 = UF::Merge(puVar12[lVar41],*(uint *)((long)puVar2 + lVar49));
              goto LAB_0023ef82;
            }
            if (*(char *)(lVar41 + 2 + lVar29) != '\0') goto LAB_0023e331;
            if (*(char *)(lVar15 + lVar24 + 2 + lVar29) == '\0') {
              uVar8 = UF::Merge(*(uint *)(lVar20 + lVar29 * 4),
                                *(uint *)(lVar39 + lVar50 + lVar29 * 4));
            }
            else {
              uVar8 = *(uint *)(lVar19 + lVar29 * 4);
            }
LAB_0023e33c:
            *(uint *)(lVar17 + lVar29 * 4) = uVar8;
            lVar34 = lVar34 + 0x200000000;
            lVar29 = lVar29 + 2;
            lVar14 = lVar14 + 8;
            goto LAB_0023e2b4;
          }
          if (cVar16 == '\0') {
            local_70 = (ulong)(iVar30 + 2) + lVar29;
            if (*(char *)(lVar29 + 3 + lVar35 + lVar24) == '\0') {
              lVar14 = lVar50 + lVar39 + lVar14;
              goto LAB_0023fa50;
            }
            UF::P_[UF::length_] = UF::length_;
            uVar8 = UF::length_ + 1;
            *(uint *)(lVar50 + lVar39 + 8 + lVar29 * 4) = UF::length_;
            UF::length_ = uVar8;
            local_70 = local_70 & 0xffffffff;
            goto LAB_0023c718;
          }
          if (*(char *)(lVar41 + 3 + lVar29) != '\0') {
LAB_0023e331:
            uVar8 = *(uint *)(lVar20 + lVar29 * 4);
            goto LAB_0023e33c;
          }
          local_70 = (ulong)(iVar30 + 2) + lVar29;
          lVar41 = lVar34 + 0x400000000 >> 0x20;
          cVar16 = *(char *)(lVar29 + 2 + lVar44 + lVar24);
          if (pcVar27[lVar41] != '\0') {
            if (cVar16 == '\0') {
              *(uint *)(lVar50 + lVar39 + 8 + lVar29 * 4) = puVar12[lVar41];
              goto LAB_0023d927;
            }
            uVar8 = *(uint *)(lVar18 + lVar39 + 8 + lVar29 * 4);
            if (*(char *)(lVar29 + 3 + lVar15 + lVar24) != '\0') {
              *(uint *)(lVar50 + lVar39 + 8 + lVar29 * 4) = uVar8;
              goto LAB_0023d927;
            }
            uVar8 = UF::Merge(uVar8,puVar12[lVar41]);
LAB_0023ef82:
            *(uint *)(lVar50 + lVar39 + 8 + lVar29 * 4) = uVar8;
            goto LAB_0023d927;
          }
          if (cVar16 == '\0') {
            UF::P_[UF::length_] = UF::length_;
            uVar8 = UF::length_ + 1;
            *(uint *)(lVar50 + lVar39 + 8 + lVar29 * 4) = UF::length_;
            UF::length_ = uVar8;
            goto LAB_00241c44;
          }
          *(undefined4 *)(lVar17 + lVar29 * 4) = *(undefined4 *)(lVar20 + lVar29 * 4);
LAB_0023ec28:
          local_70 = local_70 & 0xffffffff;
        } while( true );
      }
      if (pcVar27[lVar41 + (3 - lVar25)] != '\0') {
        if (pcVar27[lVar41] == '\0') {
          uVar8 = puVar12[lVar41 + 2];
          uVar7 = puVar2[lVar41];
        }
        else {
          if (pcVar27[lVar41 + (1 - lVar25)] != '\0') {
            if (pcVar27[local_70] == '\0') {
              uVar8 = puVar12[lVar41];
              if (pcVar27[local_70 - lVar25] == '\0') goto LAB_00243e19;
              goto LAB_00243ee7;
            }
            puVar2[lVar41 + 2] = puVar12[lVar41];
            goto LAB_0023d927;
          }
          uVar8 = puVar12[lVar41];
          uVar7 = puVar12[lVar41 + 2];
        }
        uVar8 = UF::Merge(uVar8,uVar7);
        puVar2[lVar41 + 2] = uVar8;
        goto LAB_0023d927;
      }
      if (pcVar27[local_70] == '\0') {
LAB_00243e95:
        uVar8 = puVar12[lVar41 + 4];
LAB_00243e9a:
        uVar7 = puVar2[lVar41];
      }
      else {
        cVar16 = pcVar27[lVar41];
joined_r0x00243be9:
        if (cVar16 != '\0') {
          if (pcVar27[lVar41 + (1 - lVar25)] == '\0') {
            uVar8 = UF::Merge(puVar12[lVar41],puVar12[lVar41 + 2]);
            uVar8 = UF::Merge(uVar8,puVar12[lVar41 + 4]);
            puVar2[lVar41 + 2] = uVar8;
          }
          else {
            uVar8 = UF::Merge(puVar12[lVar41],puVar12[lVar41 + 4]);
            puVar2[lVar41 + 2] = uVar8;
          }
          goto LAB_0023d927;
        }
        uVar8 = UF::Merge(puVar12[lVar41 + 2],puVar12[lVar41 + 4]);
        uVar7 = puVar2[lVar41];
      }
    }
LAB_00243ea4:
    uVar8 = UF::Merge(uVar8,uVar7);
    puVar2[lVar41 + 2] = uVar8;
    goto LAB_0023d927;
  }
  local_70 = local_70 & 0xffffffff;
  if (iVar38 < (int)uVar8) {
    if (*(char *)(lVar48 + local_70) == '\0') {
      if (pcVar10[local_70] == '\0') {
LAB_00242c85:
        puVar2[local_70] = 0;
        goto LAB_00243d1f;
      }
LAB_00243390:
      if (pcVar10[lVar41 + 1] != '\0') {
LAB_0024339c:
        uVar8 = puVar2[lVar41];
        goto LAB_00243d16;
      }
    }
    else {
      cVar16 = pcVar27[local_70];
      if (pcVar10[iVar30 + 1] != '\0') {
        if (cVar16 != '\0') {
          if (pcVar27[lVar41] != '\0') {
            bVar52 = pcVar27[(ulong)(iVar30 + 1) - lVar25] == '\0';
            goto LAB_002430a9;
          }
LAB_002438e5:
          uVar8 = puVar12[local_70];
          uVar7 = puVar2[lVar41];
          goto LAB_002438f1;
        }
        goto LAB_0024339c;
      }
joined_r0x00241e9a:
      if (cVar16 != '\0') goto LAB_0024232d;
    }
LAB_0024233a:
    UF::P_[UF::length_] = UF::length_;
    uVar8 = UF::length_ + 1;
    puVar2[local_70] = UF::length_;
    UF::length_ = uVar8;
    goto LAB_00243d1f;
  }
  if (*(char *)(lVar48 + local_70) == '\0') {
    uVar21 = (ulong)(iVar30 + 3);
    cVar16 = *(char *)(lVar48 + uVar21);
    if (pcVar10[local_70] != '\0') {
      if (cVar16 == '\0') goto LAB_00243390;
      uVar26 = (ulong)(iVar30 + 1);
      cVar16 = pcVar27[uVar21];
      if (pcVar10[uVar26] == '\0') goto joined_r0x00241599;
      if (cVar16 == '\0') {
        if (pcVar27[local_70] != '\0') {
          if (pcVar27[lVar41] == '\0') goto LAB_002438e5;
          bVar52 = pcVar27[uVar26 - lVar25] == '\0';
          goto LAB_002430a9;
        }
        goto LAB_0024339c;
      }
      if (pcVar27[lVar41] == '\0') {
        uVar8 = puVar12[local_70];
        uVar7 = puVar2[lVar41];
      }
      else {
        if (pcVar27[uVar26 - lVar25] == '\0') {
          uVar8 = puVar12[lVar41];
        }
        else {
          if (pcVar27[local_70] != '\0') {
            uVar8 = puVar12[lVar41];
            goto LAB_00243d16;
          }
          uVar8 = puVar12[lVar41];
          if (pcVar27[local_70 - lVar25] != '\0') goto LAB_0024388d;
        }
LAB_00243cfb:
        uVar7 = puVar12[local_70];
      }
LAB_00243cfe:
      uVar8 = UF::Merge(uVar8,uVar7);
      goto LAB_00243d16;
    }
joined_r0x002430c3:
    if (cVar16 == '\0') {
      cVar16 = pcVar10[uVar21];
joined_r0x00241eae:
      if (cVar16 != '\0') goto LAB_0024233a;
      goto LAB_00242c85;
    }
    cVar16 = pcVar27[uVar21];
joined_r0x002418b9:
    if (cVar16 != '\0') goto LAB_0024232d;
LAB_00242327:
    cVar16 = pcVar27[local_70];
joined_r0x00241587:
    if (cVar16 == '\0') goto LAB_0024233a;
  }
  else {
    uVar21 = (ulong)(iVar30 + 1);
    cVar16 = pcVar27[lVar41 + 3];
    if (pcVar10[uVar21] != '\0') {
      if (cVar16 != '\0') {
        if (pcVar27[lVar41] == '\0') {
          uVar8 = puVar12[local_70];
          uVar7 = puVar2[lVar41];
LAB_00243683:
          uVar8 = UF::Merge(uVar8,uVar7);
        }
        else {
          if (pcVar27[uVar21 - lVar25] == '\0') {
            uVar8 = puVar12[lVar41];
            uVar7 = puVar12[local_70];
            goto LAB_00243683;
          }
          if (pcVar27[local_70] == '\0') {
            uVar8 = puVar12[lVar41];
            if (pcVar27[local_70 - lVar25] == '\0') goto LAB_00243cfb;
LAB_0024388d:
            puVar2[local_70] = uVar8;
            goto LAB_00243d1f;
          }
          uVar8 = puVar12[lVar41];
        }
LAB_00243696:
        puVar2[local_70] = uVar8;
        goto LAB_00243d1f;
      }
      if (pcVar27[local_70] == '\0') goto LAB_0024339c;
      if (pcVar27[lVar41] == '\0') goto LAB_002438e5;
      bVar52 = pcVar27[uVar21 - lVar25] == '\0';
LAB_002430a9:
      uVar8 = puVar12[lVar41];
      if (bVar52) {
        uVar7 = puVar12[local_70];
LAB_002438f1:
        uVar8 = UF::Merge(uVar8,uVar7);
        puVar2[local_70] = uVar8;
      }
      else {
        puVar2[local_70] = uVar8;
      }
      goto LAB_00243d1f;
    }
joined_r0x00241599:
    if (cVar16 == '\0') goto LAB_00242327;
  }
LAB_0024232d:
  uVar8 = puVar12[local_70];
LAB_00243d16:
  puVar2[local_70] = uVar8;
  goto LAB_00243d1f;
LAB_0023e40f:
  local_70 = (ulong)(iVar30 + 2) + lVar29;
  lVar41 = lVar34 + 0x300000000 >> 0x20;
  if (pcVar27[lVar41] == '\0') {
    if (*(char *)(lVar48 + lVar41) == '\0') {
      uVar8 = *(uint *)((long)puVar2 + lVar49);
      local_70 = local_70 & 0xffffffff;
      goto LAB_002428c8;
    }
    lVar13 = lVar34 + 0x400000000 >> 0x20;
    if (pcVar27[lVar13] == '\0') {
      uVar8 = *(uint *)((long)puVar2 + lVar49);
LAB_002432d1:
      local_70 = local_70 & 0xffffffff;
      goto LAB_0023e707;
    }
    if (pcVar27[lVar41 - lVar25] == '\0') {
      uVar8 = UF::Merge(puVar12[lVar13],*(uint *)((long)puVar2 + lVar49));
      *(uint *)(lVar50 + lVar39 + 8 + lVar29 * 4) = uVar8;
    }
    else if (*(char *)(lVar29 + 2 + lVar44 + lVar24) == '\0') {
      if (*(char *)(lVar29 + 2 + lVar15 + lVar24) == '\0') {
        uVar8 = *(uint *)(lVar20 + lVar29 * 4);
        uVar7 = *(uint *)((long)puVar2 + lVar49);
LAB_0023f25c:
        uVar8 = UF::Merge(uVar8,uVar7);
LAB_0023f27f:
        *(uint *)(lVar17 + lVar29 * 4) = uVar8;
      }
      else {
        *(undefined4 *)(lVar50 + lVar39 + 8 + lVar29 * 4) = *(undefined4 *)((long)puVar12 + lVar49);
      }
    }
    else {
      *(undefined4 *)(lVar17 + lVar29 * 4) = *(undefined4 *)(lVar20 + lVar29 * 4);
    }
    goto LAB_0023d927;
  }
  if (*(char *)(lVar29 + 2 + lVar44 + lVar24) == '\0') {
    if (*(char *)(lVar29 + 2 + lVar15 + lVar24) != '\0') {
      *(undefined4 *)(lVar50 + lVar39 + 8 + lVar29 * 4) = *(undefined4 *)((long)puVar12 + lVar49);
      goto LAB_0024235e;
    }
    uVar8 = UF::Merge(*(uint *)(lVar20 + lVar29 * 4),*(uint *)((long)puVar2 + lVar49));
  }
  else {
    uVar8 = *(uint *)(lVar20 + lVar29 * 4);
  }
  *(uint *)(lVar17 + lVar29 * 4) = uVar8;
LAB_0024235e:
  iVar30 = (int)local_70;
  lVar49 = (long)iVar30;
  lVar35 = lVar49 << 0x20;
  lVar17 = lVar25 * lVar32 + lVar49;
  lVar18 = lVar17 + lVar24 + 2;
  lVar19 = lVar28 + lVar49;
  lVar20 = lVar25 * local_98 + lVar49;
  lVar41 = lVar24 + lVar20;
  lVar51 = lVar41 + 2;
  lVar46 = lVar25 * local_90 + lVar49;
  lVar50 = lVar1 * lVar32 + lVar49 * 4;
  lVar14 = lVar50 + lVar39;
  lVar15 = lVar14 + 8;
  lVar13 = lVar11 + lVar49 * 4;
  lVar34 = lVar39 + lVar13 + 8;
  lVar44 = 0;
  lVar29 = 0;
LAB_00242422:
  uVar21 = lVar49 + lVar29 + 2;
  lVar36 = lVar35 >> 0x1e;
  if (lVar33 <= (long)uVar21) {
    iVar47 = (int)lVar29;
    uVar8 = iVar30 + iVar47 + 2;
    uVar21 = (ulong)uVar8;
    if (iVar38 < (int)uVar8) {
      if (*(char *)(lVar48 + uVar21) == '\0') {
        if (pcVar10[uVar21] == '\0') goto LAB_0023c70e;
        uVar26 = (ulong)(iVar30 + iVar47 + 1);
        if ((pcVar10[uVar26] == '\0') && (*(char *)(lVar48 + uVar26) == '\0')) goto LAB_0023c6ea;
      }
      else {
        uVar26 = (ulong)(iVar30 + iVar47 + 1);
        if (*(char *)(lVar48 + uVar26) == '\0') {
          if ((pcVar10[uVar26] == '\0') && (pcVar27[uVar21] != '\0')) goto LAB_0023bfae;
          uVar8 = *(uint *)((long)puVar12 + lVar36);
          goto LAB_00242a92;
        }
      }
      uVar8 = *(uint *)((long)puVar2 + lVar36);
      goto LAB_00242a92;
    }
    if (*(char *)(lVar48 + uVar21) != '\0') {
      uVar26 = (ulong)(iVar30 + iVar47 + 1);
      lVar35 = lVar35 >> 0x20;
      if (*(char *)(lVar48 + uVar26) == '\0') {
        if (pcVar10[uVar26] == '\0') {
          if (pcVar27[lVar35 + 3] == '\0') {
            if (pcVar27[uVar21] == '\0') goto LAB_00242d29;
            goto LAB_0023e1c3;
          }
          if (pcVar27[uVar21] != '\0') goto LAB_0023e1c3;
        }
        else if ((pcVar27[lVar35 + 3] == '\0') || (pcVar27[uVar21] != '\0')) goto LAB_00242d29;
        uVar8 = puVar12[lVar35];
        if (pcVar27[uVar21 - lVar25] != '\0') goto LAB_0023c6cd;
LAB_00243132:
        uVar7 = puVar12[uVar21];
      }
      else {
        if (pcVar27[lVar35 + 3] == '\0') {
          uVar8 = puVar2[lVar35];
          goto LAB_0023e1cc;
        }
        if (pcVar27[uVar21] != '\0') goto LAB_0023e1c3;
        if (pcVar27[uVar21 - lVar25] != '\0') {
LAB_00242d29:
          uVar8 = puVar12[lVar35];
          goto LAB_0023e1cc;
        }
        uVar8 = puVar12[uVar21];
        uVar7 = puVar2[lVar35];
      }
      goto LAB_00243d4f;
    }
    uVar26 = (ulong)(uint)(iVar30 + 3 + iVar47);
    if (pcVar10[uVar21] == '\0') {
      if (*(char *)(lVar48 + uVar26) == '\0') goto LAB_0023c6d6;
      if (pcVar27[uVar26] != '\0') goto LAB_0023e1c3;
      cVar16 = pcVar27[uVar21];
      goto joined_r0x0023c567;
    }
    uVar22 = (ulong)(iVar30 + iVar47 + 1);
    if (*(char *)(lVar48 + uVar26) == '\0') {
      if ((pcVar10[uVar22] == '\0') && (*(char *)(lVar48 + uVar22) == '\0')) goto LAB_0023e1d5;
LAB_002430fc:
      uVar8 = *(uint *)((long)puVar2 + lVar36);
      goto LAB_0023e1cc;
    }
    if (*(char *)(lVar48 + uVar22) == '\0') {
      cVar16 = pcVar27[uVar26];
      if (pcVar10[uVar22] == '\0') goto joined_r0x0023c55c;
      if (cVar16 == '\0') {
        if (pcVar27[uVar21] == '\0') goto LAB_002430fc;
      }
      else if (pcVar27[uVar21] == '\0') {
        uVar8 = *(uint *)((long)puVar12 + lVar36);
        if (pcVar27[uVar21 - lVar25] == '\0') goto LAB_00243132;
LAB_0023c6cd:
        puVar2[uVar21] = uVar8;
        goto LAB_00243d1f;
      }
    }
    else {
      if (pcVar27[uVar26] == '\0') goto LAB_002430fc;
      if (pcVar27[uVar21] != '\0') goto LAB_0023e1c3;
      if (pcVar27[uVar21 - lVar25] == '\0') {
        uVar8 = puVar12[uVar21];
        uVar7 = *(uint *)((long)puVar2 + lVar36);
        goto LAB_00243d4f;
      }
    }
    uVar8 = *(uint *)((long)puVar12 + lVar36);
    goto LAB_0023e1cc;
  }
  if (*(char *)(lVar24 + lVar19 + 2 + lVar29) != '\0') {
    if (*(char *)(lVar24 + lVar19 + 1 + lVar29) == '\0') {
      cVar16 = *(char *)(lVar41 + 3 + lVar29);
      if (*(char *)(lVar24 + lVar46 + 1 + lVar29) == '\0') {
        if (cVar16 == '\0') goto LAB_00242bdd;
        if (*(char *)(lVar51 + lVar29) == '\0') {
LAB_002424b5:
          uVar8 = *(uint *)(lVar14 + lVar29 * 4);
          if (*(char *)(lVar18 + lVar29) == '\0') {
            uVar7 = *(uint *)(lVar15 + lVar29 * 4);
            goto LAB_002424f7;
          }
        }
        else {
LAB_00242458:
          uVar8 = *(uint *)(lVar15 + lVar29 * 4);
        }
      }
      else {
        if (cVar16 == '\0') {
          local_70 = (ulong)(iVar30 + 2) + lVar29;
          if (*(char *)(lVar29 + 3 + lVar19 + lVar24) != '\0') {
            lVar41 = lVar35 + 0x400000000 >> 0x20;
            if (pcVar27[lVar41] == '\0') {
              uVar8 = *(uint *)((long)puVar12 + lVar36);
              goto LAB_00243034;
            }
            if (*(char *)(lVar29 + 3 + lVar17 + lVar24) == '\0') {
              uVar8 = *(uint *)((long)puVar12 + lVar36);
              uVar7 = puVar12[lVar41];
              goto LAB_002432ef;
            }
            if (*(char *)(lVar29 + 2 + lVar20 + lVar24) != '\0') {
              uVar8 = *(uint *)((long)puVar12 + lVar36);
              goto LAB_00243312;
            }
            uVar8 = *(uint *)((long)puVar12 + lVar36);
            if (*(char *)(lVar29 + 2 + lVar17 + lVar24) == '\0') {
              uVar7 = *(uint *)(lVar15 + lVar29 * 4);
              goto LAB_00243ab6;
            }
            goto LAB_002435a0;
          }
          uVar8 = *(uint *)((long)puVar12 + lVar36);
          local_70 = local_70 & 0xffffffff;
          goto LAB_002428c8;
        }
        if (*(char *)(lVar51 + lVar29) == '\0') goto LAB_002424b5;
LAB_00242498:
        uVar8 = *(uint *)(lVar14 + lVar29 * 4);
      }
    }
    else {
      if (*(char *)(lVar41 + 3 + lVar29) == '\0') {
        local_70 = (ulong)(iVar30 + 2) + lVar29;
        if (*(char *)(lVar29 + 3 + lVar19 + lVar24) == '\0') {
          uVar8 = *(uint *)((long)puVar2 + lVar36);
          local_70 = local_70 & 0xffffffff;
          goto LAB_002428c8;
        }
        lVar41 = lVar35 + 0x400000000 >> 0x20;
        if (pcVar27[lVar41] == '\0') {
          uVar8 = *(uint *)((long)puVar2 + lVar36);
LAB_00243034:
          local_70 = local_70 & 0xffffffff;
          goto LAB_0023e707;
        }
        if (*(char *)(lVar29 + 3 + lVar17 + lVar24) == '\0') {
          uVar8 = puVar12[lVar41];
          uVar7 = *(uint *)((long)puVar2 + lVar36);
LAB_002432ef:
          uVar8 = UF::Merge(uVar8,uVar7);
LAB_00243312:
          *(uint *)(lVar13 + lVar39 + 8 + lVar29 * 4) = uVar8;
        }
        else {
          if (*(char *)(lVar29 + 2 + lVar20 + lVar24) != '\0') {
            *(undefined4 *)(lVar34 + lVar29 * 4) = *(undefined4 *)(lVar15 + lVar29 * 4);
            goto LAB_0023d927;
          }
          if (*(char *)(lVar29 + 2 + lVar17 + lVar24) != '\0') {
            uVar8 = *(uint *)((long)puVar12 + lVar36);
            goto LAB_002437f4;
          }
          uVar8 = *(uint *)(lVar15 + lVar29 * 4);
          uVar7 = *(uint *)((long)puVar2 + lVar36);
LAB_00243ab6:
          uVar8 = UF::Merge(uVar8,uVar7);
          *(uint *)(lVar34 + lVar29 * 4) = uVar8;
        }
        goto LAB_0023d927;
      }
      if (*(char *)(lVar51 + lVar29) != '\0') goto LAB_00242458;
      if (*(char *)(lVar18 + lVar29) != '\0') goto LAB_00242498;
      uVar8 = *(uint *)(lVar15 + lVar29 * 4);
      uVar7 = *(uint *)(lVar39 + lVar13 + lVar29 * 4);
LAB_002424f7:
      uVar8 = UF::Merge(uVar8,uVar7);
    }
    *(uint *)(lVar34 + lVar29 * 4) = uVar8;
    lVar35 = lVar35 + 0x200000000;
    lVar29 = lVar29 + 2;
    lVar44 = lVar44 + 8;
    goto LAB_00242422;
  }
  local_70 = (ulong)(iVar30 + 2) + lVar29;
  uVar8 = (uint)local_70;
  lVar41 = lVar35 + 0x300000000 >> 0x20;
  if (*(char *)(lVar29 + 2 + lVar46 + lVar24) != '\0') {
    lVar14 = lVar35 + 0x100000000 >> 0x20;
    if (*(char *)(lVar48 + lVar41) == '\0') {
      if ((pcVar10[lVar14] == '\0') && (*(char *)(lVar48 + lVar14) == '\0')) {
        UF::P_[UF::length_] = UF::length_;
        uVar8 = UF::length_ + 1;
        *(uint *)(lVar13 + lVar39 + 8 + lVar29 * 4) = UF::length_;
        UF::length_ = uVar8;
        goto LAB_0023f32b;
      }
      *(undefined4 *)(lVar13 + lVar39 + 8 + lVar29 * 4) = *(undefined4 *)((long)puVar2 + lVar36);
      goto LAB_0023f32b;
    }
    if (*(char *)(lVar48 + lVar14) == '\0') {
      if (pcVar10[lVar14] == '\0') {
        if (pcVar27[lVar41] != '\0') {
          *(undefined4 *)(lVar34 + lVar29 * 4) = *(undefined4 *)(lVar15 + lVar29 * 4);
          goto LAB_0023e1f9;
        }
        lVar14 = lVar35 + 0x400000000 >> 0x20;
        cVar16 = *(char *)(lVar29 + 2 + lVar20 + lVar24);
        if (pcVar27[lVar14] == '\0') goto LAB_0024361c;
        if (cVar16 != '\0') goto LAB_00242e6d;
        uVar8 = puVar12[lVar14];
        goto LAB_002437f4;
      }
      if (pcVar27[lVar41] != '\0') {
        if (*(char *)(lVar29 + 2 + lVar20 + lVar24) == '\0') {
          if (*(char *)(lVar29 + 2 + lVar17 + lVar24) == '\0') {
            uVar8 = UF::Merge(*(uint *)((long)puVar12 + lVar36),*(uint *)(lVar15 + lVar29 * 4));
            *(uint *)(lVar34 + lVar29 * 4) = uVar8;
          }
          else {
            *(uint *)(lVar13 + lVar39 + 8 + lVar29 * 4) = *(uint *)((long)puVar12 + lVar36);
          }
        }
        else {
          *(undefined4 *)(lVar13 + lVar39 + 8 + lVar29 * 4) =
               *(undefined4 *)((long)puVar12 + lVar36);
        }
        goto LAB_0023e1f9;
      }
      lVar50 = lVar35 + 0x400000000 >> 0x20;
      if (pcVar27[lVar50] == '\0') {
        if (*(char *)(lVar29 + 2 + lVar20 + lVar24) == '\0') {
          *(undefined4 *)(lVar34 + lVar29 * 4) = *(undefined4 *)((long)puVar2 + lVar36);
          goto LAB_0023d2a6;
        }
        *(undefined4 *)(lVar34 + lVar29 * 4) = *(undefined4 *)((long)puVar12 + lVar36);
        local_70 = local_70 & 0xffffffff;
        goto LAB_0023dd24;
      }
      cVar16 = *(char *)(lVar29 + 2 + lVar20 + lVar24);
      if (pcVar27[lVar41 - lVar25] == '\0') {
        if (cVar16 == '\0') {
          uVar8 = puVar12[lVar50];
          uVar7 = *(uint *)((long)puVar2 + lVar36);
        }
        else {
          uVar8 = *(uint *)((long)puVar12 + lVar36);
          uVar7 = puVar12[lVar50];
        }
        uVar8 = UF::Merge(uVar8,uVar7);
        *(uint *)(lVar34 + lVar29 * 4) = uVar8;
        goto LAB_0023d927;
      }
      if (cVar16 != '\0') {
LAB_002437df:
        uVar8 = *(uint *)((long)puVar12 + lVar36);
LAB_002437f4:
        *(uint *)(lVar13 + lVar39 + 8 + lVar29 * 4) = uVar8;
        goto LAB_0023d927;
      }
      uVar8 = *(uint *)((long)puVar12 + lVar36);
      if (*(char *)(lVar29 + 2 + lVar17 + lVar24) != '\0') goto LAB_002435a0;
      uVar7 = *(uint *)(lVar15 + lVar29 * 4);
    }
    else {
      if (pcVar27[lVar41] != '\0') {
        if (*(char *)(lVar29 + 2 + lVar20 + lVar24) != '\0') goto LAB_002427b7;
        if (*(char *)(lVar29 + 2 + lVar17 + lVar24) == '\0') {
          uVar8 = UF::Merge(*(uint *)(lVar15 + lVar29 * 4),*(uint *)((long)puVar2 + lVar36));
          *(uint *)(lVar34 + lVar29 * 4) = uVar8;
        }
        else {
          *(undefined4 *)(lVar13 + lVar39 + 8 + lVar29 * 4) =
               *(undefined4 *)((long)puVar12 + lVar36);
        }
        goto LAB_0023e1f9;
      }
      lVar50 = lVar35 + 0x400000000 >> 0x20;
      if (pcVar27[lVar50] == '\0') {
        uVar8 = *(uint *)((long)puVar2 + lVar36);
        goto LAB_002432d1;
      }
      if (pcVar27[lVar41 - lVar25] == '\0') {
        uVar8 = puVar12[lVar50];
        uVar7 = *(uint *)((long)puVar2 + lVar36);
LAB_00243843:
        uVar8 = UF::Merge(uVar8,uVar7);
        *(uint *)(lVar13 + lVar39 + 8 + lVar29 * 4) = uVar8;
        goto LAB_0023d927;
      }
      if (*(char *)(lVar29 + 2 + lVar20 + lVar24) != '\0') {
        *(undefined4 *)(lVar34 + lVar29 * 4) = *(undefined4 *)(lVar15 + lVar29 * 4);
        goto LAB_0023d927;
      }
      if (*(char *)(lVar29 + 2 + lVar17 + lVar24) != '\0') goto LAB_002437df;
      uVar8 = *(uint *)(lVar15 + lVar29 * 4);
      uVar7 = *(uint *)((long)puVar2 + lVar36);
    }
    uVar8 = UF::Merge(uVar8,uVar7);
    *(uint *)(lVar34 + lVar29 * 4) = uVar8;
    goto LAB_0023d927;
  }
  if (*(char *)(lVar48 + lVar41) == '\0') {
    if (pcVar10[lVar41] != '\0') {
      UF::P_[UF::length_] = UF::length_;
      uVar8 = UF::length_ + 1;
      *(uint *)(lVar13 + lVar39 + 8 + lVar29 * 4) = UF::length_;
      UF::length_ = uVar8;
      local_70 = local_70 & 0xffffffff;
      goto LAB_0023c718;
    }
    puVar42 = (uint *)(lVar44 + lVar13 + lVar39 + 8);
    goto LAB_0023bedf;
  }
  if (pcVar27[lVar41] != '\0') {
LAB_002427b7:
    *(undefined4 *)(lVar34 + lVar29 * 4) = *(undefined4 *)(lVar15 + lVar29 * 4);
    goto LAB_0023e1f9;
  }
  lVar14 = lVar35 + 0x400000000 >> 0x20;
  cVar16 = *(char *)(lVar29 + 2 + lVar20 + lVar24);
  if (pcVar27[lVar14] != '\0') {
    if (cVar16 == '\0') {
      uVar8 = puVar12[lVar14];
      goto LAB_002437f4;
    }
LAB_00242e6d:
    uVar8 = *(uint *)(lVar50 + lVar39 + 8 + lVar29 * 4);
    if (pcVar27[lVar41 - lVar25] == '\0') {
      uVar8 = UF::Merge(uVar8,puVar12[lVar14]);
      goto LAB_002437f4;
    }
LAB_002435a0:
    *(uint *)(lVar13 + lVar39 + 8 + lVar29 * 4) = uVar8;
    goto LAB_0023d927;
  }
LAB_0024361c:
  if (cVar16 == '\0') {
    UF::P_[UF::length_] = UF::length_;
    uVar7 = UF::length_;
    goto LAB_00243709;
  }
  *(undefined4 *)(lVar34 + lVar29 * 4) = *(undefined4 *)(lVar15 + lVar29 * 4);
LAB_002437b2:
  local_70 = local_70 & 0xffffffff;
  goto LAB_0023dd24;
LAB_00242bdd:
  local_70 = (ulong)(iVar30 + 2) + lVar29;
  if (*(char *)(lVar29 + 3 + lVar19 + lVar24) == '\0') {
    if (*(char *)(lVar29 + 2 + lVar20 + lVar24) != '\0') {
      *(undefined4 *)(lVar34 + lVar29 * 4) = *(undefined4 *)(lVar15 + lVar29 * 4);
      goto LAB_00240a24;
    }
    *(undefined4 *)(lVar13 + lVar39 + 8 + lVar29 * 4) = *(undefined4 *)((long)puVar12 + lVar36);
LAB_002404c9:
    uVar8 = (uint)local_70;
LAB_002404ce:
    puVar42 = UF::P_;
    lVar13 = (long)(int)uVar8;
    lVar50 = lVar13 << 0x20;
    lVar15 = lVar11 + lVar13 * 4;
    lVar29 = lVar39 + lVar15;
    lVar34 = lVar29 + 8;
    lVar41 = lVar24 + lVar28 + lVar13;
    lVar19 = lVar41 + 3;
    lVar17 = lVar25 * local_98 + lVar13;
    lVar20 = lVar24 + lVar17 + 2;
    lVar18 = lVar25 * local_90 + lVar13;
    lVar14 = 0;
    lVar44 = 0;
    do {
      lVar35 = lVar50 >> 0x20;
      iVar30 = (int)lVar44;
      if (lVar33 <= lVar13 + lVar44 + 2) {
        uVar7 = uVar8 + iVar30 + 2;
        local_70 = (ulong)uVar7;
        if (iVar38 < (int)uVar7) {
          if (*(char *)(lVar48 + local_70) == '\0') {
            if (pcVar10[local_70] == '\0') goto LAB_00242c85;
            if (pcVar10[lVar35 + 1] == '\0') goto LAB_0024233a;
          }
          else {
            cVar16 = pcVar27[local_70];
            if (pcVar10[lVar35 + 1] == '\0') goto joined_r0x00241587;
joined_r0x00240893:
            if (cVar16 != '\0') goto LAB_00240899;
          }
          uVar8 = puVar2[lVar35];
          goto LAB_00243d16;
        }
        if (*(char *)(lVar48 + local_70) != '\0') {
          cVar16 = pcVar27[lVar35 + 3];
          if (pcVar10[lVar35 + 1] == '\0') goto joined_r0x00241599;
          if (cVar16 == '\0') {
            cVar16 = pcVar27[local_70];
            goto joined_r0x00240893;
          }
LAB_00240899:
          uVar8 = puVar12[local_70];
          uVar7 = puVar2[lVar35];
          goto LAB_00243cfe;
        }
        uVar21 = (ulong)(uVar8 + 3 + iVar30);
        if (pcVar10[local_70] == '\0') {
          if (*(char *)(lVar48 + uVar21) == '\0') {
            cVar16 = pcVar10[uVar21];
            goto joined_r0x00241eae;
          }
          if (pcVar27[uVar21] != '\0') goto LAB_0024232d;
          cVar16 = pcVar27[local_70];
          goto joined_r0x00241e9a;
        }
        if (*(char *)(lVar48 + uVar21) == '\0') {
          if (pcVar10[lVar35 + 1] == '\0') {
            UF::P_[UF::length_] = UF::length_;
            uVar8 = UF::length_ + 1;
            puVar2[local_70] = UF::length_;
            UF::length_ = uVar8;
            goto LAB_00243d1f;
          }
        }
        else {
          if (pcVar10[lVar35 + 1] == '\0') {
            if (pcVar27[uVar21] == '\0') {
              cVar16 = pcVar27[local_70];
              goto joined_r0x00241587;
            }
            uVar8 = puVar12[local_70];
            goto LAB_00243696;
          }
          if ((pcVar27[uVar21] != '\0') || (pcVar27[local_70] != '\0')) {
            uVar8 = puVar12[local_70];
            uVar7 = puVar2[lVar35];
            goto LAB_00243683;
          }
        }
        uVar8 = puVar2[lVar35];
        goto LAB_00243696;
      }
      if (*(char *)(lVar41 + 2 + lVar44) == '\0') goto LAB_0024064e;
      cVar16 = *(char *)(lVar24 + lVar17 + 3 + lVar44);
      if (*(char *)(lVar24 + lVar18 + 1 + lVar44) == '\0') {
        if (cVar16 != '\0') {
          local_70 = (ulong)(uVar8 + iVar30 + 2);
          *(undefined4 *)(lVar34 + lVar44 * 4) =
               *(undefined4 *)(lVar1 * lVar32 + lVar13 * 4 + lVar39 + 8 + lVar44 * 4);
          goto LAB_0024235e;
        }
        if (*(char *)(lVar19 + lVar44) != '\0') {
          local_70 = (ulong)(uVar8 + 2) + lVar44;
          lVar41 = lVar50 + 0x400000000 >> 0x20;
          cVar16 = *(char *)(lVar44 + 2 + lVar17 + lVar24);
          if (pcVar27[lVar41] == '\0') {
            if (cVar16 == '\0') goto LAB_00241a9d;
            *(undefined4 *)(lVar34 + lVar44 * 4) =
                 *(undefined4 *)(lVar1 * lVar32 + lVar13 * 4 + lVar39 + 8 + lVar44 * 4);
            local_70 = local_70 & 0xffffffff;
            goto LAB_0023dd24;
          }
          if (cVar16 == '\0') {
            *(uint *)(lVar15 + lVar39 + 8 + lVar44 * 4) = puVar12[lVar41];
          }
          else {
            uVar8 = *(uint *)(lVar1 * lVar32 + lVar13 * 4 + lVar39 + 8 + lVar44 * 4);
            if (*(char *)(lVar44 + 3 + lVar25 * lVar32 + lVar13 + lVar24) == '\0') {
              uVar8 = UF::Merge(uVar8,puVar12[lVar41]);
              *(uint *)(lVar15 + lVar39 + 8 + lVar44 * 4) = uVar8;
            }
            else {
              *(uint *)(lVar15 + lVar39 + 8 + lVar44 * 4) = uVar8;
            }
          }
          goto LAB_0023d927;
        }
        if (*(char *)(lVar20 + lVar44) != '\0') {
          *(undefined4 *)(lVar34 + lVar44 * 4) =
               *(undefined4 *)(lVar1 * lVar32 + lVar13 * 4 + lVar39 + 8 + lVar44 * 4);
          goto LAB_00240a15;
        }
        puVar42[UF::length_] = UF::length_;
        uVar7 = UF::length_;
        UF::length_ = UF::length_ + 1;
      }
      else {
        if (cVar16 != '\0') {
          local_70 = (ulong)(uVar8 + iVar30 + 2);
          uVar8 = UF::Merge(*(uint *)(lVar1 * lVar32 + lVar13 * 4 + lVar39 + 8 + lVar44 * 4),
                            *(uint *)(lVar29 + lVar44 * 4));
          *(uint *)(lVar34 + lVar44 * 4) = uVar8;
          goto LAB_0024235e;
        }
        if (*(char *)(lVar19 + lVar44) != '\0') {
          local_70 = (ulong)(uVar8 + 2) + lVar44;
          uVar8 = (uint)local_70;
          lVar41 = lVar50 + 0x400000000 >> 0x20;
          if (pcVar27[lVar41] == '\0') {
            if (*(char *)(lVar44 + 2 + lVar17 + lVar24) == '\0') {
              *(undefined4 *)(lVar15 + lVar39 + 8 + lVar44 * 4) =
                   *(undefined4 *)(lVar15 + lVar39 + lVar44 * 4);
              goto LAB_0023d2a6;
            }
            uVar8 = UF::Merge(*(uint *)(lVar1 * lVar32 + lVar13 * 4 + lVar39 + 8 + lVar44 * 4),
                              *(uint *)(lVar29 + lVar44 * 4));
            *(uint *)(lVar34 + lVar44 * 4) = uVar8;
            goto LAB_002411e4;
          }
          if (*(char *)(lVar44 + 3 + lVar25 * lVar32 + lVar13 + lVar24) == '\0') {
            if (*(char *)(lVar44 + 2 + lVar17 + lVar24) == '\0') {
              uVar8 = UF::Merge(puVar12[lVar41],*(uint *)(lVar15 + lVar39 + lVar44 * 4));
              *(uint *)(lVar15 + lVar39 + 8 + lVar44 * 4) = uVar8;
            }
            else {
              uVar8 = UF::Merge(*(uint *)(lVar1 * lVar32 + lVar13 * 4 + lVar39 + 8 + lVar44 * 4),
                                puVar12[lVar41]);
              uVar8 = UF::Merge(uVar8,*(uint *)(lVar29 + lVar44 * 4));
              *(uint *)(lVar34 + lVar44 * 4) = uVar8;
            }
          }
          else {
            uVar8 = UF::Merge(*(uint *)(lVar1 * lVar32 + lVar13 * 4 + lVar39 + 8 + lVar44 * 4),
                              *(uint *)(lVar29 + lVar44 * 4));
            *(uint *)(lVar34 + lVar44 * 4) = uVar8;
          }
          goto LAB_0023d927;
        }
        if (*(char *)(lVar20 + lVar44) != '\0') {
          uVar7 = UF::Merge(*(uint *)(lVar1 * lVar32 + lVar13 * 4 + lVar39 + 8 + lVar44 * 4),
                            *(uint *)(lVar29 + lVar44 * 4));
          *(uint *)(lVar34 + lVar44 * 4) = uVar7;
LAB_00240a15:
          local_70 = (ulong)(uVar8 + iVar30 + 2);
          goto LAB_00240a24;
        }
        uVar7 = *(uint *)(lVar29 + lVar44 * 4);
      }
      *(uint *)(lVar34 + lVar44 * 4) = uVar7;
      lVar50 = lVar50 + 0x200000000;
      lVar44 = lVar44 + 2;
      lVar14 = lVar14 + 8;
    } while( true );
  }
  lVar41 = lVar35 + 0x400000000 >> 0x20;
  cVar16 = *(char *)(lVar29 + 2 + lVar20 + lVar24);
  if (pcVar27[lVar41] == '\0') goto LAB_0024335f;
  cVar3 = *(char *)(lVar29 + 3 + lVar17 + lVar24);
  if (cVar16 == '\0') {
    if (cVar3 == '\0') {
      uVar8 = UF::Merge(*(uint *)((long)puVar12 + lVar36),puVar12[lVar41]);
      *(uint *)(lVar13 + lVar39 + 8 + lVar29 * 4) = uVar8;
    }
    else if (*(char *)(lVar29 + 2 + lVar17 + lVar24) == '\0') {
      uVar8 = UF::Merge(*(uint *)((long)puVar12 + lVar36),*(uint *)(lVar15 + lVar29 * 4));
      *(uint *)(lVar34 + lVar29 * 4) = uVar8;
    }
    else {
      *(uint *)(lVar13 + lVar39 + 8 + lVar29 * 4) = *(uint *)((long)puVar12 + lVar36);
    }
  }
  else {
    uVar8 = *(uint *)(lVar50 + lVar39 + 8 + lVar29 * 4);
    if (cVar3 == '\0') {
      uVar7 = puVar12[lVar41];
      goto LAB_00243843;
    }
    *(uint *)(lVar13 + lVar39 + 8 + lVar29 * 4) = uVar8;
  }
  goto LAB_0023d927;
LAB_0024335f:
  if (cVar16 == '\0') {
    *(undefined4 *)(lVar13 + lVar39 + 8 + lVar29 * 4) = *(undefined4 *)((long)puVar12 + lVar36);
    uVar8 = (uint)local_70;
    goto LAB_0023d2a6;
  }
  *(undefined4 *)(lVar34 + lVar29 * 4) = *(undefined4 *)(lVar15 + lVar29 * 4);
LAB_002411e4:
  local_70 = local_70 & 0xffffffff;
  goto LAB_0023dd24;
LAB_0024064e:
  local_70 = (ulong)(uVar8 + 2) + lVar44;
  lVar41 = lVar50 + 0x300000000 >> 0x20;
  if (*(char *)(lVar44 + 2 + lVar18 + lVar24) == '\0') {
    if (*(char *)(lVar48 + lVar41) == '\0') {
      if (pcVar10[lVar41] == '\0') {
        lVar14 = lVar14 + lVar15 + lVar39;
LAB_00241b37:
        puVar42 = (uint *)(lVar14 + 8);
LAB_0023bedf:
        *puVar42 = 0;
        iVar30 = (int)local_70;
        lVar13 = (long)iVar30;
        lVar50 = lVar13 << 0x20;
        lVar14 = lVar28 + lVar13 + lVar24;
        lVar17 = lVar25 * local_90 + lVar13 + lVar24;
        lVar41 = lVar11 + lVar13 * 4;
        lVar18 = lVar39 + lVar41 + 8;
        lVar15 = 0;
        do {
          lVar19 = lVar50 >> 0x20;
          iVar47 = (int)lVar15;
          if (lVar33 <= lVar13 + lVar15 + 2) {
            uVar8 = iVar30 + iVar47 + 2;
            uVar21 = (ulong)uVar8;
            if (iVar38 < (int)uVar8) {
              if (*(char *)(lVar48 + uVar21) == '\0') {
                cVar16 = pcVar10[uVar21];
                goto joined_r0x0023f2bf;
              }
              if (pcVar27[uVar21] != '\0') goto LAB_0023bfae;
              if (pcVar27[lVar19 + 1] == '\0') goto LAB_0023c6ea;
              uVar8 = puVar12[lVar19];
              goto LAB_00242a92;
            }
            if (*(char *)(lVar48 + uVar21) == '\0') {
              uVar26 = (ulong)(uint)(iVar30 + 3 + iVar47);
              if (pcVar10[uVar21] == '\0') {
                if (*(char *)(lVar48 + uVar26) == '\0') goto LAB_0023c6d6;
              }
              else if (*(char *)(lVar48 + uVar26) == '\0') goto LAB_0023e1d5;
              cVar16 = pcVar27[uVar26];
              goto joined_r0x0023c55c;
            }
            if (pcVar27[lVar19 + 3] == '\0') {
              if (pcVar27[uVar21] != '\0') goto LAB_0023e1c3;
              if (pcVar27[lVar19 + 1] == '\0') goto LAB_0023e1d5;
              uVar8 = puVar12[lVar19];
              goto LAB_0023e1cc;
            }
            if ((pcVar27[uVar21] != '\0') || (pcVar27[lVar19 + 1] == '\0')) goto LAB_0023e1c3;
            uVar8 = puVar12[lVar19];
            if (pcVar27[uVar21 - lVar25] != '\0') goto LAB_0023c6cd;
            uVar7 = puVar12[uVar21];
            goto LAB_00243d4f;
          }
          if (*(char *)(lVar14 + 2 + lVar15) != '\0') {
            local_70 = (ulong)(iVar30 + 2) + lVar15;
            uVar8 = (uint)local_70;
            lVar14 = lVar50 + 0x300000000 >> 0x20;
            if (pcVar27[lVar14] != '\0') {
              if (*(char *)(lVar15 + 2 + lVar25 * local_98 + lVar13 + lVar24) == '\0') {
                if (pcVar27[lVar19 + 1] == '\0') {
                  *(undefined4 *)(lVar18 + lVar15 * 4) =
                       *(undefined4 *)(lVar1 * lVar32 + lVar13 * 4 + lVar39 + 8 + lVar15 * 4);
                  goto LAB_0024235e;
                }
                if (*(char *)(lVar15 + 2 + lVar25 * lVar32 + lVar13 + lVar24) != '\0') {
                  *(uint *)(lVar41 + lVar39 + 8 + lVar15 * 4) = puVar12[lVar19];
                  goto LAB_0024235e;
                }
                uVar8 = UF::Merge(puVar12[lVar19],
                                  *(uint *)(lVar1 * lVar32 + lVar13 * 4 + lVar39 + 8 + lVar15 * 4));
              }
              else {
                uVar8 = *(uint *)(lVar1 * lVar32 + lVar13 * 4 + lVar39 + 8 + lVar15 * 4);
              }
              *(uint *)(lVar18 + lVar15 * 4) = uVar8;
              goto LAB_0024235e;
            }
            if (*(char *)(lVar48 + lVar14) == '\0') {
              if (*(char *)(lVar15 + 2 + lVar25 * local_98 + lVar13 + lVar24) != '\0') {
                *(undefined4 *)(lVar18 + lVar15 * 4) =
                     *(undefined4 *)(lVar1 * lVar32 + lVar13 * 4 + lVar39 + 8 + lVar15 * 4);
                goto LAB_00240a24;
              }
              if (pcVar27[lVar19 + 1] == '\0') {
                UF::P_[UF::length_] = UF::length_;
                uVar8 = UF::length_ + 1;
                *(uint *)(lVar41 + lVar39 + 8 + lVar15 * 4) = UF::length_;
                UF::length_ = uVar8;
              }
              else {
                *(uint *)(lVar41 + lVar39 + 8 + lVar15 * 4) = puVar12[lVar19];
              }
              goto LAB_002404c9;
            }
            lVar50 = lVar50 + 0x400000000 >> 0x20;
            cVar16 = *(char *)(lVar15 + 2 + lVar25 * local_98 + lVar13 + lVar24);
            if (pcVar27[lVar50] == '\0') {
              if (cVar16 == '\0') {
                if (pcVar27[lVar19 + 1] != '\0') {
                  *(uint *)(lVar41 + lVar39 + 8 + lVar15 * 4) = puVar12[lVar19];
                  goto LAB_0023d2a6;
                }
                goto LAB_0023c4e0;
              }
LAB_0023c4b8:
              *(undefined4 *)(lVar18 + lVar15 * 4) =
                   *(undefined4 *)(lVar1 * lVar32 + lVar13 * 4 + lVar39 + 8 + lVar15 * 4);
              goto LAB_002411e4;
            }
            if (cVar16 != '\0') {
              uVar8 = *(uint *)(lVar1 * lVar32 + lVar13 * 4 + lVar39 + 8 + lVar15 * 4);
              if (pcVar27[lVar14 - lVar25] != '\0') goto LAB_0023c35a;
              uVar7 = puVar12[lVar50];
LAB_0023c518:
              uVar8 = UF::Merge(uVar8,uVar7);
              goto LAB_0023c651;
            }
            if (pcVar27[lVar19 + 1] == '\0') {
              uVar8 = puVar12[lVar50];
              goto LAB_0023c651;
            }
            if (pcVar27[lVar14 - lVar25] == '\0') {
              uVar8 = UF::Merge(puVar12[lVar19],puVar12[lVar50]);
              *(uint *)(lVar41 + lVar39 + 8 + lVar15 * 4) = uVar8;
            }
            else if (*(char *)(lVar15 + 2 + lVar25 * lVar32 + lVar13 + lVar24) == '\0') {
              uVar8 = UF::Merge(puVar12[lVar19],
                                *(uint *)(lVar1 * lVar32 + lVar13 * 4 + lVar39 + 8 + lVar15 * 4));
              *(uint *)(lVar18 + lVar15 * 4) = uVar8;
            }
            else {
              *(uint *)(lVar41 + lVar39 + 8 + lVar15 * 4) = puVar12[lVar19];
            }
            goto LAB_0023d927;
          }
          if (*(char *)(lVar17 + 2 + lVar15) != '\0') {
            local_70 = (ulong)(iVar30 + 2) + lVar15;
            uVar8 = (uint)local_70;
            lVar14 = lVar50 + 0x300000000 >> 0x20;
            if (*(char *)(lVar48 + lVar14) == '\0') {
              UF::P_[UF::length_] = UF::length_;
              uVar8 = UF::length_ + 1;
              *(uint *)(lVar41 + lVar39 + 8 + lVar15 * 4) = UF::length_;
              UF::length_ = uVar8;
              goto LAB_0023f32b;
            }
            if (pcVar27[lVar14] != '\0') {
              *(undefined4 *)(lVar18 + lVar15 * 4) =
                   *(undefined4 *)(lVar1 * lVar32 + lVar13 * 4 + lVar39 + 8 + lVar15 * 4);
              goto LAB_0023e1f9;
            }
            lVar50 = lVar50 + 0x400000000 >> 0x20;
            cVar16 = *(char *)(lVar15 + 2 + lVar25 * local_98 + lVar13 + lVar24);
            if (pcVar27[lVar50] == '\0') {
joined_r0x0023c4ac:
              if (cVar16 == '\0') {
LAB_0023c4e0:
                UF::P_[UF::length_] = UF::length_;
                uVar7 = UF::length_ + 1;
                *(uint *)(lVar41 + lVar39 + 8 + lVar15 * 4) = UF::length_;
                UF::length_ = uVar7;
                goto LAB_0023d2a6;
              }
              goto LAB_0023c4b8;
            }
            if (cVar16 != '\0') {
              lVar17 = lVar1 * lVar32 + lVar13 * 4;
              cVar16 = pcVar27[lVar14 - lVar25];
              goto LAB_0023c350;
            }
            uVar8 = puVar12[lVar50];
LAB_0023c651:
            *(uint *)(lVar41 + lVar39 + 8 + lVar15 * 4) = uVar8;
            goto LAB_0023d927;
          }
          if (*(char *)(lVar14 + 3 + lVar15) != '\0') {
            local_70 = (ulong)(iVar30 + 2) + lVar15;
            uVar8 = (uint)local_70;
            lVar14 = lVar25 * local_98 + lVar13 + lVar24;
            if (*(char *)(lVar15 + 3 + lVar14) != '\0') {
              *(undefined4 *)(lVar18 + lVar15 * 4) =
                   *(undefined4 *)(lVar1 * lVar32 + lVar13 * 4 + lVar39 + 8 + lVar15 * 4);
              goto LAB_0023e1f9;
            }
            lVar50 = lVar50 + 0x400000000 >> 0x20;
            cVar16 = *(char *)(lVar15 + 2 + lVar14);
            if (pcVar27[lVar50] == '\0') goto joined_r0x0023c4ac;
            if (cVar16 == '\0') {
              *(uint *)(lVar41 + lVar39 + 8 + lVar15 * 4) = puVar12[lVar50];
            }
            else {
              lVar17 = lVar1 * lVar32 + lVar13 * 4;
              cVar16 = *(char *)(lVar15 + 3 + lVar25 * lVar32 + lVar13 + lVar24);
LAB_0023c350:
              uVar8 = *(uint *)(lVar17 + lVar39 + 8 + lVar15 * 4);
              if (cVar16 == '\0') {
                uVar7 = puVar12[lVar50];
                goto LAB_0023c518;
              }
LAB_0023c35a:
              *(uint *)(lVar41 + lVar39 + 8 + lVar15 * 4) = uVar8;
            }
            goto LAB_0023d927;
          }
          if (*(char *)(lVar17 + 3 + lVar15) != '\0') goto LAB_0023c0ec;
          *(undefined4 *)(lVar18 + lVar15 * 4) = 0;
          lVar50 = lVar50 + 0x200000000;
          lVar15 = lVar15 + 2;
        } while( true );
      }
      UF::P_[UF::length_] = UF::length_;
      uVar8 = UF::length_;
      goto LAB_00241422;
    }
    if (pcVar27[lVar41] != '\0') {
      *(undefined4 *)(lVar34 + lVar44 * 4) =
           *(undefined4 *)(lVar1 * lVar32 + lVar13 * 4 + lVar39 + 8 + lVar44 * 4);
      goto LAB_0023e1f9;
    }
    lVar50 = lVar50 + 0x400000000 >> 0x20;
    cVar16 = pcVar27[lVar50];
LAB_002419a7:
    cVar3 = *(char *)(lVar44 + 2 + lVar17 + lVar24);
    if (cVar16 == '\0') {
      if (cVar3 == '\0') {
LAB_00241a9d:
        UF::P_[UF::length_] = UF::length_;
        uVar8 = UF::length_ + 1;
        *(uint *)(lVar15 + lVar39 + 8 + lVar44 * 4) = UF::length_;
        UF::length_ = uVar8;
        goto LAB_00241c44;
      }
      *(undefined4 *)(lVar34 + lVar44 * 4) =
           *(undefined4 *)(lVar1 * lVar32 + lVar13 * 4 + lVar39 + 8 + lVar44 * 4);
      local_70 = local_70 & 0xffffffff;
      goto LAB_0023dd24;
    }
    if (cVar3 == '\0') {
      uVar8 = puVar12[lVar50];
    }
    else {
      uVar8 = *(uint *)(lVar1 * lVar32 + lVar13 * 4 + lVar39 + 8 + lVar44 * 4);
      if (pcVar27[lVar41 - lVar25] != '\0') {
        *(uint *)(lVar15 + lVar39 + 8 + lVar44 * 4) = uVar8;
        goto LAB_0023d927;
      }
      uVar8 = UF::Merge(uVar8,puVar12[lVar50]);
    }
    *(uint *)(lVar15 + lVar39 + 8 + lVar44 * 4) = uVar8;
    goto LAB_0023d927;
  }
  if (*(char *)(lVar48 + lVar41) == '\0') {
    if (pcVar10[lVar35 + 1] == '\0') {
      UF::P_[UF::length_] = UF::length_;
      uVar8 = UF::length_ + 1;
      *(uint *)(lVar15 + lVar39 + 8 + lVar44 * 4) = UF::length_;
      UF::length_ = uVar8;
      goto LAB_0023f32b;
    }
    uVar8 = puVar2[lVar35];
    goto LAB_002410a6;
  }
  if (pcVar10[lVar35 + 1] == '\0') {
    if (pcVar27[lVar41] == '\0') {
      lVar50 = lVar50 + 0x400000000 >> 0x20;
      cVar16 = pcVar27[lVar50];
      goto LAB_002419a7;
    }
    uVar8 = *(uint *)(lVar1 * lVar32 + lVar13 * 4 + lVar39 + 8 + lVar44 * 4);
  }
  else {
    if (pcVar27[lVar41] == '\0') {
      lVar50 = lVar50 + 0x400000000 >> 0x20;
      if (pcVar27[lVar50] != '\0') {
        if (pcVar27[lVar41 - lVar25] == '\0') {
          if (*(char *)(lVar44 + 2 + lVar17 + lVar24) == '\0') {
            uVar8 = UF::Merge(puVar12[lVar50],puVar2[lVar35]);
            *(uint *)(lVar15 + lVar39 + 8 + lVar44 * 4) = uVar8;
          }
          else {
            uVar8 = UF::Merge(*(uint *)(lVar1 * lVar32 + lVar13 * 4 + lVar39 + 8 + lVar44 * 4),
                              puVar12[lVar50]);
            uVar8 = UF::Merge(uVar8,puVar2[lVar35]);
            *(uint *)(lVar34 + lVar44 * 4) = uVar8;
          }
        }
        else {
          uVar8 = UF::Merge(*(uint *)(lVar1 * lVar32 + lVar13 * 4 + lVar39 + 8 + lVar44 * 4),
                            puVar2[lVar35]);
          *(uint *)(lVar34 + lVar44 * 4) = uVar8;
        }
        goto LAB_0023d927;
      }
      if (*(char *)(lVar44 + 2 + lVar17 + lVar24) == '\0') {
        *(uint *)(lVar15 + lVar39 + 8 + lVar44 * 4) = puVar2[lVar35];
        uVar8 = (uint)local_70;
        goto LAB_0023d2a6;
      }
      uVar8 = UF::Merge(*(uint *)(lVar1 * lVar32 + lVar13 * 4 + lVar39 + 8 + lVar44 * 4),
                        puVar2[lVar35]);
      *(uint *)(lVar34 + lVar44 * 4) = uVar8;
      goto LAB_0023dd24;
    }
    uVar8 = UF::Merge(*(uint *)(lVar1 * lVar32 + lVar13 * 4 + lVar39 + 8 + lVar44 * 4),
                      puVar2[lVar35]);
  }
  *(uint *)(lVar34 + lVar44 * 4) = uVar8;
  goto LAB_0023e1f9;
LAB_0023c6d6:
  cVar16 = pcVar10[uVar26];
  goto joined_r0x0023e0d3;
joined_r0x0023c55c:
  if (cVar16 != '\0') goto LAB_0023e1c3;
  cVar16 = pcVar27[uVar21];
  goto joined_r0x0023c567;
LAB_0023c0ec:
  local_70 = (ulong)(iVar30 + iVar47 + 2);
  UF::P_[UF::length_] = UF::length_;
  uVar8 = UF::length_ + 1;
  *(uint *)(lVar41 + lVar39 + 8 + lVar15 * 4) = UF::length_;
  UF::length_ = uVar8;
LAB_0023c718:
  puVar43 = UF::P_;
  iVar30 = (int)local_70;
  lVar50 = (long)iVar30;
  lVar15 = lVar50 << 0x20;
  lVar13 = lVar28 + lVar50 + lVar24;
  lVar14 = lVar25 * local_90 + lVar50 + lVar24;
  lVar41 = lVar50 * 4;
  puVar40 = (uint *)(lVar11 + lVar50 * 4 + lVar39 + 8);
  lVar17 = 0;
  puVar42 = puVar40;
  do {
    uVar21 = lVar50 + lVar17 + 2;
    lVar18 = lVar15 >> 0x20;
    lVar19 = lVar15 >> 0x1e;
    iVar47 = (int)lVar17;
    if (lVar33 <= (long)uVar21) {
      uVar8 = iVar30 + iVar47 + 2;
      local_70 = (ulong)uVar8;
      if (iVar38 < (int)uVar8) {
        if (*(char *)(lVar48 + local_70) == '\0') {
          if (pcVar10[local_70] == '\0') goto LAB_00242c85;
LAB_0023cca8:
          uVar8 = *(uint *)((long)puVar2 + lVar19);
          goto LAB_00243d16;
        }
        if (pcVar27[lVar18 + 1] == '\0') {
          if (pcVar27[local_70] != '\0') goto LAB_0023ca36;
LAB_0023d0db:
          uVar8 = puVar2[lVar18];
          goto LAB_00243d16;
        }
LAB_0023cd6e:
        uVar8 = puVar12[lVar18];
      }
      else {
        if (*(char *)(lVar48 + local_70) == '\0') {
          uVar21 = (ulong)(uint)(iVar30 + 3 + iVar47);
          cVar16 = *(char *)(lVar48 + uVar21);
          if (pcVar10[local_70] == '\0') goto joined_r0x002430c3;
          if ((cVar16 == '\0') || ((pcVar27[uVar21] == '\0' && (pcVar27[local_70] == '\0'))))
          goto LAB_0023cca8;
          uVar8 = puVar12[local_70];
          uVar7 = *(uint *)((long)puVar2 + lVar19);
          goto LAB_00243cfe;
        }
        if (pcVar27[lVar18 + 3] == '\0') {
          if (pcVar27[lVar18 + 1] != '\0') goto LAB_0023cd6e;
          if (pcVar27[local_70] == '\0') goto LAB_0023d0db;
        }
        else if ((pcVar27[local_70] == '\0') && (pcVar27[lVar18 + 1] != '\0')) {
          uVar8 = puVar12[lVar18];
          if (pcVar27[local_70 - lVar25] == '\0') {
            uVar8 = UF::Merge(uVar8,puVar12[local_70]);
            uVar7 = puVar2[lVar18];
          }
          else {
            uVar7 = puVar2[lVar18];
          }
          goto LAB_002438f1;
        }
LAB_0023ca36:
        uVar8 = puVar12[local_70];
      }
      uVar7 = puVar2[lVar18];
      goto LAB_00243cfe;
    }
    if (*(char *)(lVar13 + 2 + lVar17) != '\0') {
      local_70 = (ulong)(iVar30 + 2) + lVar17;
      uVar8 = (uint)local_70;
      lVar13 = lVar15 + 0x300000000 >> 0x20;
      if (pcVar27[lVar13] != '\0') {
        if (*(char *)(lVar17 + 2 + lVar25 * local_98 + lVar50 + lVar24) == '\0') {
          if (pcVar27[lVar18 + 1] != '\0') {
            if (*(char *)(lVar17 + 2 + lVar25 * lVar32 + lVar50 + lVar24) == '\0') {
              uVar8 = UF::Merge(puVar12[lVar18],
                                *(uint *)(lVar1 * lVar32 + lVar41 + lVar39 + 8 + lVar17 * 4));
              uVar8 = UF::Merge(uVar8,puVar2[lVar18]);
              *(uint *)(lVar39 + lVar41 + lVar11 + 8 + lVar17 * 4) = uVar8;
            }
            else {
              uVar8 = UF::Merge(puVar12[lVar18],puVar2[lVar18]);
              *(uint *)(lVar41 + lVar11 + lVar39 + 8 + lVar17 * 4) = uVar8;
            }
            local_70 = local_70 & 0xffffffff;
            goto LAB_0024235e;
          }
          uVar8 = *(uint *)(lVar1 * lVar32 + lVar41 + lVar39 + 8 + lVar17 * 4);
          uVar7 = puVar2[lVar18];
        }
        else {
          uVar8 = *(uint *)(lVar1 * lVar32 + lVar41 + lVar39 + 8 + lVar17 * 4);
          uVar7 = *(uint *)((long)puVar2 + lVar19);
        }
        uVar8 = UF::Merge(uVar8,uVar7);
        *(uint *)(lVar39 + lVar41 + lVar11 + 8 + lVar17 * 4) = uVar8;
        local_70 = local_70 & 0xffffffff;
        goto LAB_0024235e;
      }
      if (*(char *)(lVar48 + lVar13) == '\0') {
        if (pcVar27[lVar18 + 1] != '\0') {
          uVar8 = UF::Merge(puVar12[lVar18],puVar2[lVar18]);
          goto LAB_002428c8;
        }
        if (*(char *)(lVar17 + 2 + lVar25 * local_98 + lVar50 + lVar24) != '\0') {
          uVar8 = UF::Merge(*(uint *)(lVar1 * lVar32 + lVar41 + lVar39 + 8 + lVar17 * 4),
                            puVar2[lVar18]);
          *(uint *)(lVar39 + lVar41 + lVar11 + 8 + lVar17 * 4) = uVar8;
          local_70 = local_70 & 0xffffffff;
          goto LAB_00240a24;
        }
        *(uint *)(lVar41 + lVar11 + lVar39 + 8 + lVar17 * 4) = puVar2[lVar18];
        goto LAB_002404ce;
      }
      lVar14 = lVar15 + 0x400000000 >> 0x20;
      if (pcVar27[lVar14] == '\0') {
        if (pcVar27[lVar18 + 1] != '\0') {
          uVar8 = UF::Merge(puVar12[lVar18],puVar2[lVar18]);
          goto LAB_0023e707;
        }
        if (*(char *)(lVar17 + 2 + lVar25 * local_98 + lVar50 + lVar24) == '\0') {
          *(uint *)(lVar41 + lVar11 + lVar39 + 8 + lVar17 * 4) = puVar2[lVar18];
          goto LAB_0023d2a6;
        }
        uVar8 = UF::Merge(*(uint *)(lVar1 * lVar32 + lVar41 + lVar39 + 8 + lVar17 * 4),
                          puVar2[lVar18]);
        *(uint *)(lVar39 + lVar41 + lVar11 + 8 + lVar17 * 4) = uVar8;
        goto LAB_0023dd24;
      }
      if (*(char *)(lVar17 + 2 + lVar25 * local_98 + lVar50 + lVar24) == '\0') {
        if (pcVar27[lVar18 + 1] == '\0') {
          uVar8 = puVar12[lVar14];
          uVar7 = puVar2[lVar18];
        }
        else {
          if (pcVar27[lVar13 - lVar25] != '\0') {
            uVar7 = puVar12[lVar18];
            if (*(char *)(lVar17 + 2 + lVar25 * lVar32 + lVar50 + lVar24) == '\0') {
              uVar6 = UF::Merge(uVar7,*(uint *)(lVar1 * lVar32 + lVar41 + lVar39 + 8 + lVar17 * 4));
              uVar7 = puVar2[lVar18];
              goto LAB_0023cfcd;
            }
            uVar6 = puVar2[lVar18];
            goto LAB_0023d1c0;
          }
          uVar8 = UF::Merge(puVar12[lVar18],puVar12[lVar14]);
          uVar7 = puVar2[lVar18];
        }
        uVar8 = UF::Merge(uVar8,uVar7);
        *(uint *)(lVar41 + lVar11 + lVar39 + 8 + lVar17 * 4) = uVar8;
LAB_0023d24f:
        local_70 = local_70 & 0xffffffff;
      }
      else {
        uVar8 = *(uint *)(lVar1 * lVar32 + lVar41 + lVar39 + 8 + lVar17 * 4);
        if (pcVar27[lVar13 - lVar25] == '\0') {
          uVar8 = UF::Merge(uVar8,puVar12[lVar14]);
          uVar7 = *(uint *)((long)puVar2 + lVar19);
        }
        else {
          uVar7 = *(uint *)((long)puVar2 + lVar19);
        }
        uVar8 = UF::Merge(uVar8,uVar7);
        *(uint *)(lVar41 + lVar11 + lVar39 + 8 + lVar17 * 4) = uVar8;
        local_70 = local_70 & 0xffffffff;
      }
      goto LAB_0023d927;
    }
    if (*(char *)(lVar14 + 2 + lVar17) != '\0') {
      local_70 = (ulong)(iVar30 + 2) + lVar17;
      uVar8 = (uint)local_70;
      lVar13 = lVar15 + 0x300000000 >> 0x20;
      if (*(char *)(lVar48 + lVar13) == '\0') {
        *(undefined4 *)(lVar41 + lVar11 + lVar39 + 8 + lVar17 * 4) =
             *(undefined4 *)((long)puVar2 + lVar19);
        local_70 = local_70 & 0xffffffff;
        goto LAB_0023f32b;
      }
      if (pcVar27[lVar13] != '\0') {
        uVar8 = UF::Merge(*(uint *)(lVar1 * lVar32 + lVar41 + lVar39 + 8 + lVar17 * 4),
                          *(uint *)((long)puVar2 + lVar19));
        *(uint *)(lVar39 + lVar41 + lVar11 + 8 + lVar17 * 4) = uVar8;
        goto LAB_0023e1f9;
      }
      lVar14 = lVar15 + 0x400000000 >> 0x20;
      if (pcVar27[lVar14] == '\0') {
        if (*(char *)(lVar17 + 2 + lVar25 * local_98 + lVar50 + lVar24) == '\0') {
          *(undefined4 *)(lVar41 + lVar11 + lVar39 + 8 + lVar17 * 4) =
               *(undefined4 *)((long)puVar2 + lVar19);
          goto LAB_0023d2a6;
        }
        uVar8 = UF::Merge(*(uint *)(lVar1 * lVar32 + lVar41 + lVar39 + 8 + lVar17 * 4),
                          *(uint *)((long)puVar2 + lVar19));
        *(uint *)(lVar39 + lVar41 + lVar11 + 8 + lVar17 * 4) = uVar8;
        goto LAB_0023dd24;
      }
      if (pcVar27[lVar13 - lVar25] != '\0') {
        uVar8 = UF::Merge(*(uint *)(lVar1 * lVar32 + lVar41 + lVar39 + 8 + lVar17 * 4),
                          *(uint *)((long)puVar2 + lVar19));
        *(uint *)(lVar39 + lVar41 + lVar11 + 8 + lVar17 * 4) = uVar8;
        goto LAB_0023d24f;
      }
      if (*(char *)(lVar17 + 2 + lVar25 * local_98 + lVar50 + lVar24) == '\0') {
        uVar7 = puVar12[lVar14];
        uVar6 = *(uint *)((long)puVar2 + lVar19);
LAB_0023d1c0:
        uVar7 = UF::Merge(uVar7,uVar6);
        *(uint *)(lVar41 + lVar11 + lVar39 + 8 + lVar17 * 4) = uVar7;
      }
      else {
        uVar6 = UF::Merge(*(uint *)(lVar1 * lVar32 + lVar41 + lVar39 + 8 + lVar17 * 4),
                          puVar12[lVar14]);
        uVar7 = *(uint *)((long)puVar2 + lVar19);
LAB_0023cfcd:
        uVar7 = UF::Merge(uVar6,uVar7);
        *(uint *)(lVar39 + lVar41 + lVar11 + 8 + lVar17 * 4) = uVar7;
      }
      local_70 = (ulong)uVar8;
      goto LAB_0023d927;
    }
    if (*(char *)(lVar13 + 3 + lVar17) != '\0') break;
    if (*(char *)(lVar14 + 3 + lVar17) == '\0') {
      local_70 = (ulong)(iVar30 + iVar47 + 2);
      goto LAB_0023bedf;
    }
    puVar43[UF::length_] = UF::length_;
    uVar8 = UF::length_ + 1;
    puVar40[lVar17] = UF::length_;
    UF::length_ = uVar8;
    lVar15 = lVar15 + 0x200000000;
    lVar17 = lVar17 + 2;
    puVar42 = puVar42 + 2;
  } while( true );
  local_70 = (ulong)(iVar30 + 2) + lVar17;
  uVar8 = (uint)local_70;
  lVar13 = lVar25 * local_98 + lVar50 + lVar24;
  if (*(char *)(lVar17 + 3 + lVar13) != '\0') {
    *(undefined4 *)(lVar39 + lVar41 + lVar11 + 8 + lVar17 * 4) =
         *(undefined4 *)(lVar1 * lVar32 + lVar41 + lVar39 + 8 + lVar17 * 4);
    local_70 = local_70 & 0xffffffff;
    goto LAB_0023e1f9;
  }
  lVar14 = lVar15 + 0x400000000 >> 0x20;
  cVar16 = *(char *)(lVar17 + 2 + lVar13);
  if (pcVar27[lVar14] != '\0') {
    if (cVar16 == '\0') {
      *(uint *)(lVar41 + lVar11 + lVar39 + 8 + lVar17 * 4) = puVar12[lVar14];
    }
    else {
      uVar8 = *(uint *)(lVar1 * lVar32 + lVar41 + lVar39 + 8 + lVar17 * 4);
      if (*(char *)(lVar17 + 3 + lVar25 * lVar32 + lVar50 + lVar24) == '\0') {
        uVar8 = UF::Merge(uVar8,puVar12[lVar14]);
        *(uint *)(lVar41 + lVar11 + lVar39 + 8 + lVar17 * 4) = uVar8;
      }
      else {
        *(uint *)(lVar41 + lVar11 + lVar39 + 8 + lVar17 * 4) = uVar8;
      }
    }
    local_70 = local_70 & 0xffffffff;
    goto LAB_0023d927;
  }
  if (cVar16 != '\0') {
    *(undefined4 *)(lVar39 + lVar41 + lVar11 + 8 + lVar17 * 4) =
         *(undefined4 *)(lVar1 * lVar32 + lVar41 + lVar39 + 8 + lVar17 * 4);
    goto LAB_0023dd24;
  }
  UF::P_[UF::length_] = UF::length_;
  uVar7 = UF::length_ + 1;
  *(uint *)(lVar41 + lVar11 + lVar39 + 8 + lVar17 * 4) = UF::length_;
  UF::length_ = uVar7;
LAB_0023d2a6:
  puVar43 = UF::P_;
  lVar17 = (long)(int)uVar8;
  lVar15 = lVar17 << 0x20;
  lVar41 = lVar24 + lVar25 * local_98 + lVar17;
  lVar19 = lVar25 * local_90 + lVar17;
  lVar14 = lVar24 + 3 + lVar28 + lVar17;
  lVar13 = lVar17 * 4;
  lVar50 = lVar11 + lVar17 * 4;
  puVar40 = (uint *)(lVar39 + lVar50 + 8);
  lVar18 = 0;
  puVar42 = puVar40;
  while( true ) {
    uVar21 = lVar17 + lVar18 + 2;
    iVar30 = (int)lVar18;
    if (lVar33 <= (long)uVar21) {
      uVar26 = (ulong)(uVar8 + 2) + lVar18;
      if (iVar38 < (int)uVar26) {
        uVar21 = uVar26 & 0xffffffff;
        goto LAB_0023e3e1;
      }
      uVar21 = uVar21 & 0xffffffff;
      if (*(char *)(lVar48 + uVar21) != '\0') {
        lVar15 = lVar15 >> 0x20;
        if (pcVar27[lVar15 + 3] == '\0') {
          uVar8 = puVar2[lVar15];
        }
        else {
          uVar8 = UF::Merge(puVar12[uVar21],puVar2[lVar15]);
        }
        goto LAB_0023dec0;
      }
      uVar26 = (ulong)(uVar8 + 3 + iVar30);
      if (pcVar10[uVar21] == '\0') {
        if (*(char *)(lVar48 + uVar26) != '\0') {
          cVar16 = pcVar27[uVar26];
          goto joined_r0x0023c567;
        }
        cVar16 = pcVar10[uVar26];
        goto joined_r0x0023e0d3;
      }
      if ((*(char *)(lVar48 + uVar26) == '\0') || (pcVar27[uVar26] == '\0')) goto LAB_0023d910;
      goto LAB_0023d813;
    }
    lVar20 = lVar15 >> 0x1e;
    if (*(char *)(lVar14 + -1 + lVar18) != '\0') break;
    if (*(char *)(lVar24 + lVar19 + 2 + lVar18) != '\0') goto LAB_0023d45f;
    if (*(char *)(lVar14 + lVar18) == '\0') {
      local_70 = (ulong)(uVar8 + 2) + lVar18;
      if (*(char *)(lVar18 + 3 + lVar19 + lVar24) == '\0') goto LAB_0023bedf;
      UF::P_[UF::length_] = UF::length_;
      uVar8 = UF::length_ + 1;
      *(uint *)(lVar50 + lVar39 + 8 + lVar18 * 4) = UF::length_;
      UF::length_ = uVar8;
      goto LAB_0023c718;
    }
    if (*(char *)(lVar41 + 3 + lVar18) != '\0') {
      local_70 = (ulong)(uVar8 + iVar30 + 2);
      *(undefined4 *)(lVar13 + lVar11 + lVar39 + 8 + lVar18 * 4) =
           *(undefined4 *)(lVar1 * lVar32 + lVar17 * 4 + lVar39 + 8 + lVar18 * 4);
      goto LAB_0023e1f9;
    }
    if (*(char *)(lVar41 + 4 + lVar18) != '\0') {
      local_70 = (ulong)(uVar8 + iVar30 + 2);
      *(undefined4 *)(lVar13 + lVar11 + lVar39 + 8 + lVar18 * 4) =
           *(undefined4 *)(lVar1 * lVar32 + lVar17 * 4 + lVar39 + 0x10 + lVar18 * 4);
      goto LAB_0023d927;
    }
    puVar43[UF::length_] = UF::length_;
    uVar7 = UF::length_ + 1;
    puVar40[lVar18] = UF::length_;
    UF::length_ = uVar7;
    lVar15 = lVar15 + 0x200000000;
    lVar18 = lVar18 + 2;
    puVar42 = puVar42 + 2;
  }
  local_70 = (ulong)(uVar8 + 2) + lVar18;
  lVar41 = lVar15 + 0x300000000 >> 0x20;
  if (pcVar27[lVar41] == '\0') {
    if (*(char *)(lVar48 + lVar41) == '\0') {
      uVar8 = *(uint *)((long)puVar2 + lVar20);
      goto LAB_002428c8;
    }
    lVar50 = lVar15 + 0x400000000 >> 0x20;
    if (pcVar27[lVar50] == '\0') {
      uVar8 = *(uint *)((long)puVar2 + lVar20);
      goto LAB_0023e707;
    }
    lVar13 = lVar39 + 8 + lVar13 + lVar11;
    if (pcVar27[lVar41 - lVar25] == '\0') {
      uVar8 = UF::Merge(puVar12[lVar50],*(uint *)((long)puVar2 + lVar20));
      *(uint *)(lVar13 + lVar18 * 4) = uVar8;
      local_70 = local_70 & 0xffffffff;
    }
    else {
      uVar8 = UF::Merge(*(uint *)(lVar1 * lVar32 + lVar17 * 4 + lVar39 + 8 + lVar18 * 4),
                        *(uint *)((long)puVar2 + lVar20));
      *(uint *)(lVar13 + lVar18 * 4) = uVar8;
      local_70 = local_70 & 0xffffffff;
    }
    goto LAB_0023d927;
  }
  uVar8 = UF::Merge(*(uint *)(lVar1 * lVar32 + lVar17 * 4 + lVar39 + 8 + lVar18 * 4),
                    *(uint *)((long)puVar2 + lVar20));
  *(uint *)(lVar13 + lVar11 + lVar39 + 8 + lVar18 * 4) = uVar8;
LAB_0023d457:
  local_70 = local_70 & 0xffffffff;
  goto LAB_0024235e;
LAB_0023d910:
  uVar8 = *(uint *)((long)puVar2 + (lVar15 >> 0x1e));
  goto LAB_0023e1cc;
LAB_0023d813:
  uVar8 = puVar12[uVar21];
  uVar7 = *(uint *)((long)puVar2 + (lVar15 >> 0x1e));
LAB_00243d4f:
  uVar8 = UF::Merge(uVar8,uVar7);
LAB_0023e1cc:
  puVar2[uVar21] = uVar8;
  goto LAB_00243d1f;
LAB_0023d45f:
  local_70 = (ulong)(uVar8 + 2) + lVar18;
  lVar41 = lVar15 + 0x300000000 >> 0x20;
  if (*(char *)(lVar48 + lVar41) != '\0') {
    if (pcVar27[lVar41] != '\0') {
      uVar8 = UF::Merge(*(uint *)(lVar1 * lVar32 + lVar17 * 4 + lVar39 + 8 + lVar18 * 4),
                        *(uint *)((long)puVar2 + lVar20));
      *(uint *)(lVar13 + lVar11 + lVar39 + 8 + lVar18 * 4) = uVar8;
      goto LAB_0023e1f9;
    }
    lVar50 = lVar15 + 0x400000000 >> 0x20;
    if (pcVar27[lVar50] == '\0') {
      uVar8 = *(uint *)((long)puVar2 + lVar20);
      goto LAB_0023e707;
    }
    lVar13 = lVar39 + 8 + lVar13 + lVar11;
    if (pcVar27[lVar41 - lVar25] == '\0') {
      uVar8 = UF::Merge(puVar12[lVar50],*(uint *)((long)puVar2 + lVar20));
      *(uint *)(lVar13 + lVar18 * 4) = uVar8;
    }
    else {
      uVar8 = UF::Merge(*(uint *)(lVar1 * lVar32 + lVar17 * 4 + lVar39 + 8 + lVar18 * 4),
                        *(uint *)((long)puVar2 + lVar20));
      *(uint *)(lVar13 + lVar18 * 4) = uVar8;
    }
    goto LAB_0023d927;
  }
  *(undefined4 *)(lVar13 + lVar11 + lVar39 + 8 + lVar18 * 4) =
       *(undefined4 *)((long)puVar2 + lVar20);
  local_70 = local_70 & 0xffffffff;
LAB_0023f32b:
  puVar42 = UF::P_;
  iVar30 = (int)local_70;
  lVar13 = (long)iVar30;
  lVar19 = lVar13 << 0x20;
  lVar41 = lVar11 + lVar13 * 4;
  lVar18 = lVar39 + lVar41 + 8;
  lVar50 = lVar24 + lVar25 * local_90 + lVar13;
  lVar17 = lVar24 + lVar28 + lVar13;
  lVar14 = 0;
  lVar15 = 0;
LAB_0023f382:
  uVar21 = lVar13 + lVar15 + 2;
  lVar29 = lVar19 >> 0x1e;
  lVar20 = lVar19 >> 0x20;
  if (lVar33 <= (long)uVar21) {
    iVar47 = (int)lVar15;
    uVar8 = iVar30 + iVar47 + 2;
    local_70 = (ulong)uVar8;
    if (iVar38 < (int)uVar8) {
      if (*(char *)(lVar48 + local_70) == '\0') {
        if (pcVar10[local_70] == '\0') {
          puVar2[local_70] = 0;
          goto LAB_00243d1f;
        }
        if (pcVar10[lVar20 + 1] != '\0') goto LAB_002400c2;
      }
      else {
        uVar8 = iVar30 + iVar47 + 1;
        if (pcVar10[uVar8] != '\0') {
          if (pcVar27[uVar8] == '\0') {
            if (pcVar27[local_70] == '\0') {
              uVar8 = *(uint *)((long)puVar2 + lVar29);
              goto LAB_002400c6;
            }
            uVar8 = puVar12[local_70];
          }
          else {
            uVar8 = *(uint *)((long)puVar12 + lVar29);
          }
          uVar7 = *(uint *)((long)puVar2 + lVar29);
          goto LAB_002400a8;
        }
        if (pcVar27[local_70] != '\0') goto LAB_00240082;
        if (pcVar27[uVar8] != '\0') {
          uVar8 = *(uint *)((long)puVar12 + lVar29);
          goto LAB_002400c6;
        }
      }
LAB_0023fe69:
      UF::P_[UF::length_] = UF::length_;
      uVar8 = UF::length_ + 1;
      puVar2[local_70] = UF::length_;
      UF::length_ = uVar8;
      goto LAB_00243d1f;
    }
    if (*(char *)(lVar48 + local_70) == '\0') {
      uVar21 = (ulong)(uint)(iVar30 + 3 + iVar47);
      if (pcVar10[local_70] == '\0') {
        if (*(char *)(lVar48 + uVar21) != '\0') {
          cVar16 = pcVar27[uVar21];
          goto joined_r0x00241599;
        }
        cVar16 = pcVar10[uVar21];
        goto joined_r0x002400e2;
      }
      if (*(char *)(lVar48 + uVar21) == '\0') {
        if (pcVar10[lVar20 + 1] == '\0') goto LAB_0023fe69;
      }
      else {
        if (pcVar10[lVar20 + 1] == '\0') {
          if (pcVar27[uVar21] != '\0') goto LAB_00240082;
          cVar16 = pcVar27[local_70];
          goto joined_r0x00241e9a;
        }
        if ((pcVar27[uVar21] != '\0') || (pcVar27[local_70] != '\0')) goto LAB_002400a1;
      }
LAB_002400c2:
      uVar8 = puVar2[lVar20];
      goto LAB_002400c6;
    }
    uVar8 = iVar30 + iVar47 + 1;
    if (pcVar10[uVar8] == '\0') {
      if (pcVar27[lVar20 + 3] == '\0') {
        if (pcVar27[local_70] == '\0') {
          if (pcVar27[uVar8] != '\0') {
            uVar8 = puVar12[lVar20];
            goto LAB_002400c6;
          }
          goto LAB_0023fe69;
        }
      }
      else if ((pcVar27[local_70] == '\0') && (pcVar27[uVar8] != '\0')) {
        uVar8 = puVar12[lVar20];
        if (pcVar27[local_70 - lVar25] == '\0') {
          uVar7 = puVar12[local_70];
          goto LAB_002400a8;
        }
        puVar2[local_70] = uVar8;
        goto LAB_00243d1f;
      }
LAB_00240082:
      uVar8 = puVar12[local_70];
    }
    else {
      if (pcVar27[lVar20 + 3] == '\0') {
        if (pcVar27[uVar8] == '\0') {
          if (pcVar27[local_70] == '\0') goto LAB_002400c2;
          goto LAB_002400a1;
        }
        uVar8 = puVar12[lVar20];
      }
      else {
        if ((pcVar27[local_70] == '\0') && (pcVar27[uVar8] != '\0')) {
          uVar8 = puVar12[lVar20];
          if (pcVar27[local_70 - lVar25] == '\0') {
            uVar8 = UF::Merge(uVar8,puVar12[local_70]);
            uVar7 = puVar2[lVar20];
          }
          else {
            uVar7 = puVar2[lVar20];
          }
          uVar8 = UF::Merge(uVar8,uVar7);
          puVar2[local_70] = uVar8;
          goto LAB_00243d1f;
        }
LAB_002400a1:
        uVar8 = puVar12[local_70];
      }
      uVar7 = puVar2[lVar20];
LAB_002400a8:
      uVar8 = UF::Merge(uVar8,uVar7);
    }
LAB_002400c6:
    puVar2[local_70] = uVar8;
    goto LAB_00243d1f;
  }
  if (*(char *)(lVar17 + 2 + lVar15) != '\0') goto LAB_0023f448;
  if (*(char *)(lVar50 + 2 + lVar15) != '\0') {
    if (*(char *)(lVar17 + 3 + lVar15) != '\0') {
      local_70 = (ulong)(iVar30 + 2) + lVar15;
      uVar8 = (uint)local_70;
      lVar50 = lVar25 * local_98 + lVar13 + lVar24;
      cVar16 = *(char *)(lVar15 + 3 + lVar50);
      if (pcVar10[lVar20 + 1] == '\0') {
        if (cVar16 != '\0') {
          *(undefined4 *)(lVar18 + lVar15 * 4) =
               *(undefined4 *)(lVar1 * lVar32 + lVar13 * 4 + lVar39 + 8 + lVar15 * 4);
          goto LAB_0023e1f9;
        }
        lVar14 = lVar19 + 0x400000000 >> 0x20;
        cVar16 = *(char *)(lVar15 + 2 + lVar50);
        if (pcVar27[lVar14] != '\0') {
          if (cVar16 == '\0') {
            *(uint *)(lVar41 + lVar39 + 8 + lVar15 * 4) = puVar12[lVar14];
          }
          else {
            lVar50 = lVar1 * lVar32 + lVar13 * 4;
            cVar16 = *(char *)(lVar15 + 3 + lVar25 * lVar32 + lVar13 + lVar24);
LAB_0023fab2:
            uVar8 = *(uint *)(lVar50 + lVar39 + 8 + lVar15 * 4);
            if (cVar16 == '\0') {
              uVar8 = UF::Merge(uVar8,puVar12[lVar14]);
              goto LAB_0023fd98;
            }
            *(uint *)(lVar41 + lVar39 + 8 + lVar15 * 4) = uVar8;
          }
          goto LAB_0023d927;
        }
        if (cVar16 == '\0') goto LAB_0024032f;
        *(undefined4 *)(lVar18 + lVar15 * 4) =
             *(undefined4 *)(lVar1 * lVar32 + lVar13 * 4 + lVar39 + 8 + lVar15 * 4);
        local_70 = local_70 & 0xffffffff;
        goto LAB_0023dd24;
      }
      if (cVar16 != '\0') {
        uVar8 = UF::Merge(*(uint *)(lVar1 * lVar32 + lVar13 * 4 + lVar39 + 8 + lVar15 * 4),
                          puVar2[lVar20]);
        *(uint *)(lVar18 + lVar15 * 4) = uVar8;
        goto LAB_0023e1f9;
      }
      lVar14 = lVar19 + 0x400000000 >> 0x20;
      if (pcVar27[lVar14] == '\0') {
        if (*(char *)(lVar15 + 2 + lVar50) != '\0') {
          uVar8 = UF::Merge(*(uint *)(lVar1 * lVar32 + lVar13 * 4 + lVar39 + 8 + lVar15 * 4),
                            puVar2[lVar20]);
          *(uint *)(lVar18 + lVar15 * 4) = uVar8;
          goto LAB_0023dd24;
        }
        uVar7 = puVar2[lVar20];
        goto LAB_0024005a;
      }
      if (*(char *)(lVar15 + 3 + lVar25 * lVar32 + lVar13 + lVar24) != '\0') {
        uVar8 = UF::Merge(*(uint *)(lVar1 * lVar32 + lVar13 * 4 + lVar39 + 8 + lVar15 * 4),
                          puVar2[lVar20]);
        *(uint *)(lVar18 + lVar15 * 4) = uVar8;
        goto LAB_0023d927;
      }
      if (*(char *)(lVar15 + 2 + lVar50) != '\0') {
        uVar8 = *(uint *)(lVar1 * lVar32 + lVar13 * 4 + lVar39 + 8 + lVar15 * 4);
        uVar7 = puVar12[lVar14];
        goto LAB_0023fddc;
      }
      uVar8 = puVar12[lVar14];
      goto LAB_00240284;
    }
    if (*(char *)(lVar50 + 1 + lVar15) == '\0') {
      puVar42[UF::length_] = UF::length_;
      uVar8 = UF::length_;
      UF::length_ = UF::length_ + 1;
    }
    else {
      uVar8 = *(uint *)(lVar39 + lVar41 + lVar15 * 4);
    }
    *(uint *)(lVar18 + lVar15 * 4) = uVar8;
    lVar19 = lVar19 + 0x200000000;
    lVar15 = lVar15 + 2;
    lVar14 = lVar14 + 8;
    goto LAB_0023f382;
  }
  local_70 = (ulong)(iVar30 + 2) + lVar15;
  uVar8 = (uint)local_70;
  lVar17 = lVar19 + 0x300000000 >> 0x20;
  if (*(char *)(lVar48 + lVar17) != '\0') {
    if (pcVar27[lVar17] != '\0') {
      *(undefined4 *)(lVar18 + lVar15 * 4) =
           *(undefined4 *)(lVar1 * lVar32 + lVar13 * 4 + lVar39 + 8 + lVar15 * 4);
      goto LAB_0023e1f9;
    }
    lVar14 = lVar19 + 0x400000000 >> 0x20;
    cVar16 = *(char *)(lVar15 + 2 + lVar25 * local_98 + lVar13 + lVar24);
    if (pcVar27[lVar14] == '\0') {
      if (cVar16 == '\0') goto LAB_0024032f;
      goto LAB_0023ff72;
    }
    if (cVar16 != '\0') {
      lVar50 = lVar1 * lVar32 + lVar13 * 4;
      cVar16 = pcVar27[lVar17 - lVar25];
      goto LAB_0023fab2;
    }
    uVar8 = puVar12[lVar14];
LAB_0023fd98:
    *(uint *)(lVar41 + lVar39 + 8 + lVar15 * 4) = uVar8;
    goto LAB_0023d927;
  }
  if (pcVar10[lVar17] != '\0') {
    UF::P_[UF::length_] = UF::length_;
    uVar8 = UF::length_ + 1;
    *(uint *)(lVar41 + lVar39 + 8 + lVar15 * 4) = UF::length_;
    UF::length_ = uVar8;
LAB_0024142a:
    local_70 = local_70 & 0xffffffff;
    goto LAB_0023c718;
  }
  lVar14 = lVar14 + lVar41 + lVar39;
LAB_0023fa50:
  puVar42 = (uint *)(lVar14 + 8);
  goto LAB_0023bedf;
LAB_0023f448:
  local_70 = (ulong)(iVar30 + 2) + lVar15;
  uVar8 = (uint)local_70;
  lVar50 = lVar19 + 0x100000000 >> 0x20;
  lVar14 = lVar19 + 0x300000000 >> 0x20;
  if (pcVar10[lVar50] == '\0') {
    if (pcVar27[lVar14] != '\0') {
      if (*(char *)(lVar15 + 2 + lVar25 * local_98 + lVar13 + lVar24) == '\0') {
        if (pcVar27[lVar50] == '\0') {
          uVar8 = *(uint *)(lVar1 * lVar32 + lVar13 * 4 + lVar39 + 8 + lVar15 * 4);
        }
        else {
          if (*(char *)(lVar15 + 2 + lVar25 * lVar32 + lVar13 + lVar24) != '\0') {
            *(uint *)(lVar41 + lVar39 + 8 + lVar15 * 4) = *(uint *)((long)puVar12 + lVar29);
            goto LAB_0024235e;
          }
          uVar8 = UF::Merge(*(uint *)((long)puVar12 + lVar29),
                            *(uint *)(lVar1 * lVar32 + lVar13 * 4 + lVar39 + 8 + lVar15 * 4));
        }
        *(uint *)(lVar18 + lVar15 * 4) = uVar8;
        goto LAB_0024235e;
      }
      uVar8 = *(uint *)(lVar1 * lVar32 + lVar13 * 4 + lVar39 + 8 + lVar15 * 4);
LAB_0023f6b2:
      *(uint *)(lVar18 + lVar15 * 4) = uVar8;
      goto LAB_0024235e;
    }
    if (*(char *)(lVar48 + lVar14) != '\0') {
      lVar17 = lVar19 + 0x400000000 >> 0x20;
      cVar16 = *(char *)(lVar15 + 2 + lVar25 * local_98 + lVar13 + lVar24);
      if (pcVar27[lVar17] == '\0') {
        if (cVar16 == '\0') {
          if (pcVar27[lVar50] == '\0') {
LAB_0024032f:
            UF::P_[UF::length_] = UF::length_;
            uVar7 = UF::length_ + 1;
            *(uint *)(lVar41 + lVar39 + 8 + lVar15 * 4) = UF::length_;
            UF::length_ = uVar7;
          }
          else {
            uVar7 = *(uint *)((long)puVar12 + lVar29);
LAB_0024005a:
            *(uint *)(lVar41 + lVar39 + 8 + lVar15 * 4) = uVar7;
          }
          goto LAB_0023d2a6;
        }
LAB_0023ff72:
        *(undefined4 *)(lVar18 + lVar15 * 4) =
             *(undefined4 *)(lVar1 * lVar32 + lVar13 * 4 + lVar39 + 8 + lVar15 * 4);
        local_70 = local_70 & 0xffffffff;
        goto LAB_0023dd24;
      }
      if (cVar16 != '\0') {
        uVar8 = *(uint *)(lVar1 * lVar32 + lVar13 * 4 + lVar39 + 8 + lVar15 * 4);
        if (pcVar27[lVar14 - lVar25] == '\0') {
          uVar8 = UF::Merge(uVar8,puVar12[lVar17]);
          *(uint *)(lVar41 + lVar39 + 8 + lVar15 * 4) = uVar8;
        }
        else {
          *(uint *)(lVar41 + lVar39 + 8 + lVar15 * 4) = uVar8;
        }
        goto LAB_0023d927;
      }
      if (pcVar27[lVar50] == '\0') {
        uVar8 = puVar12[lVar17];
LAB_00240411:
        *(uint *)(lVar41 + lVar39 + 8 + lVar15 * 4) = uVar8;
        goto LAB_0023d927;
      }
      if (pcVar27[lVar14 - lVar25] != '\0') {
        if (*(char *)(lVar15 + 2 + lVar25 * lVar32 + lVar13 + lVar24) == '\0') {
          uVar8 = UF::Merge(*(uint *)((long)puVar12 + lVar29),
                            *(uint *)(lVar1 * lVar32 + lVar13 * 4 + lVar39 + 8 + lVar15 * 4));
          *(uint *)(lVar18 + lVar15 * 4) = uVar8;
        }
        else {
          *(uint *)(lVar41 + lVar39 + 8 + lVar15 * 4) = *(uint *)((long)puVar12 + lVar29);
        }
        goto LAB_0023d927;
      }
      uVar8 = *(uint *)((long)puVar12 + lVar29);
      uVar7 = puVar12[lVar17];
LAB_00240104:
      uVar8 = UF::Merge(uVar8,uVar7);
      *(uint *)(lVar41 + lVar39 + 8 + lVar15 * 4) = uVar8;
      goto LAB_0023d927;
    }
    if (*(char *)(lVar15 + 2 + lVar25 * local_98 + lVar13 + lVar24) == '\0') {
      if (pcVar27[lVar50] == '\0') {
        UF::P_[UF::length_] = UF::length_;
        uVar8 = UF::length_ + 1;
        *(uint *)(lVar41 + lVar39 + 8 + lVar15 * 4) = UF::length_;
        UF::length_ = uVar8;
      }
      else {
        *(undefined4 *)(lVar41 + lVar39 + 8 + lVar15 * 4) = *(undefined4 *)((long)puVar12 + lVar29);
      }
      goto LAB_002404c9;
    }
    *(undefined4 *)(lVar18 + lVar15 * 4) =
         *(undefined4 *)(lVar1 * lVar32 + lVar13 * 4 + lVar39 + 8 + lVar15 * 4);
  }
  else {
    if (pcVar27[lVar14] != '\0') {
      if (*(char *)(lVar15 + 2 + lVar25 * local_98 + lVar13 + lVar24) == '\0') {
        if (pcVar27[lVar50] != '\0') {
          if (*(char *)(lVar15 + 2 + lVar25 * lVar32 + lVar13 + lVar24) == '\0') {
            uVar8 = UF::Merge(*(uint *)((long)puVar12 + lVar29),
                              *(uint *)(lVar1 * lVar32 + lVar13 * 4 + lVar39 + 8 + lVar15 * 4));
            uVar8 = UF::Merge(uVar8,puVar2[lVar20]);
            *(uint *)(lVar18 + lVar15 * 4) = uVar8;
          }
          else {
            uVar8 = UF::Merge(*(uint *)((long)puVar12 + lVar29),puVar2[lVar20]);
            *(uint *)(lVar41 + lVar39 + 8 + lVar15 * 4) = uVar8;
          }
          goto LAB_0024235e;
        }
        uVar8 = UF::Merge(*(uint *)(lVar1 * lVar32 + lVar13 * 4 + lVar39 + 8 + lVar15 * 4),
                          *(uint *)((long)puVar2 + lVar29));
      }
      else {
        uVar8 = UF::Merge(*(uint *)(lVar1 * lVar32 + lVar13 * 4 + lVar39 + 8 + lVar15 * 4),
                          *(uint *)((long)puVar2 + lVar29));
      }
      goto LAB_0023f6b2;
    }
    if (*(char *)(lVar48 + lVar14) != '\0') {
      lVar17 = lVar19 + 0x400000000 >> 0x20;
      if (pcVar27[lVar17] == '\0') {
        if (pcVar27[lVar50] != '\0') {
          uVar8 = UF::Merge(*(uint *)((long)puVar12 + lVar29),*(uint *)((long)puVar2 + lVar29));
          goto LAB_0023e707;
        }
        if (*(char *)(lVar15 + 2 + lVar25 * local_98 + lVar13 + lVar24) != '\0') {
          uVar8 = UF::Merge(*(uint *)(lVar1 * lVar32 + lVar13 * 4 + lVar39 + 8 + lVar15 * 4),
                            *(uint *)((long)puVar2 + lVar29));
          *(uint *)(lVar18 + lVar15 * 4) = uVar8;
          local_70 = local_70 & 0xffffffff;
          goto LAB_0023dd24;
        }
        *(undefined4 *)(lVar41 + lVar39 + 8 + lVar15 * 4) = *(undefined4 *)((long)puVar2 + lVar29);
        goto LAB_0023d2a6;
      }
      if (*(char *)(lVar15 + 2 + lVar25 * local_98 + lVar13 + lVar24) == '\0') {
        if (pcVar27[lVar50] == '\0') {
          uVar8 = puVar12[lVar17];
          uVar7 = *(uint *)((long)puVar2 + lVar29);
        }
        else {
          if (pcVar27[lVar14 - lVar25] != '\0') {
            uVar8 = *(uint *)((long)puVar12 + lVar29);
            if (*(char *)(lVar15 + 2 + lVar25 * lVar32 + lVar13 + lVar24) == '\0') {
              uVar7 = *(uint *)(lVar1 * lVar32 + lVar13 * 4 + lVar39 + 8 + lVar15 * 4);
LAB_0023fddc:
              uVar8 = UF::Merge(uVar8,uVar7);
              uVar8 = UF::Merge(uVar8,puVar2[lVar20]);
              *(uint *)(lVar18 + lVar15 * 4) = uVar8;
            }
            else {
LAB_00240284:
              uVar8 = UF::Merge(uVar8,puVar2[lVar20]);
              *(uint *)(lVar41 + lVar39 + 8 + lVar15 * 4) = uVar8;
            }
            goto LAB_0023d927;
          }
          uVar8 = UF::Merge(*(uint *)((long)puVar12 + lVar29),puVar12[lVar17]);
          uVar7 = *(uint *)((long)puVar2 + lVar29);
        }
        uVar8 = UF::Merge(uVar8,uVar7);
        goto LAB_00240411;
      }
      uVar8 = *(uint *)(lVar1 * lVar32 + lVar13 * 4 + lVar39 + 8 + lVar15 * 4);
      if (pcVar27[lVar14 - lVar25] == '\0') {
        uVar8 = UF::Merge(uVar8,puVar12[lVar17]);
        uVar7 = *(uint *)((long)puVar2 + lVar29);
      }
      else {
        uVar7 = *(uint *)((long)puVar2 + lVar29);
      }
      goto LAB_00240104;
    }
    if (pcVar27[lVar50] != '\0') {
      uVar8 = UF::Merge(*(uint *)((long)puVar12 + lVar29),*(uint *)((long)puVar2 + lVar29));
      goto LAB_002428c8;
    }
    if (*(char *)(lVar15 + 2 + lVar25 * local_98 + lVar13 + lVar24) == '\0') {
      *(undefined4 *)(lVar41 + lVar39 + 8 + lVar15 * 4) = *(undefined4 *)((long)puVar2 + lVar29);
      goto LAB_002404c9;
    }
    uVar8 = UF::Merge(*(uint *)(lVar1 * lVar32 + lVar13 * 4 + lVar39 + 8 + lVar15 * 4),
                      *(uint *)((long)puVar2 + lVar29));
    *(uint *)(lVar18 + lVar15 * 4) = uVar8;
  }
LAB_00240a24:
  iVar30 = (int)local_70;
  lVar20 = (long)iVar30;
  lVar34 = lVar20 << 0x20;
  lVar17 = lVar25 * lVar32 + lVar20;
  lVar41 = lVar24 + lVar28 + lVar20;
  lVar35 = lVar41 + 3;
  lVar18 = lVar25 * local_98 + lVar20;
  lVar44 = lVar24 + lVar18 + 2;
  lVar19 = lVar25 * local_90 + lVar20;
  lVar13 = lVar20 * 4;
  lVar50 = lVar1 * lVar32 + lVar20 * 4;
  lVar15 = lVar39 + 8 + lVar50;
  lVar14 = lVar11 + lVar20 * 4;
  puVar43 = (uint *)(lVar39 + lVar14 + 8);
  lVar29 = 0;
  puVar42 = puVar43;
LAB_00240afc:
  lVar49 = lVar34 >> 0x1e;
  lVar46 = lVar34 >> 0x20;
  iVar47 = (int)lVar29;
  if (lVar20 + lVar29 + 2 < lVar33) {
    if (*(char *)(lVar41 + 2 + lVar29) == '\0') goto LAB_00240c66;
    cVar16 = *(char *)(lVar24 + lVar18 + 3 + lVar29);
    if (*(char *)(lVar19 + lVar24 + 1 + lVar29) != '\0') {
      if (cVar16 != '\0') {
        local_70 = (ulong)(iVar30 + 2) + lVar29;
        if (*(char *)(lVar29 + 1 + lVar17 + lVar24) == '\0') {
          uVar8 = UF::Merge(*(uint *)((long)puVar12 + lVar49),*(uint *)(lVar15 + lVar29 * 4));
          *(uint *)(lVar13 + lVar11 + lVar39 + 8 + lVar29 * 4) = uVar8;
        }
        else if (*(char *)(lVar29 + 2 + lVar18 + lVar24) == '\0') {
          if (*(char *)(lVar29 + 2 + lVar17 + lVar24) == '\0') {
            uVar8 = UF::Merge(*(uint *)((long)puVar12 + lVar49),*(uint *)(lVar15 + lVar29 * 4));
            *(uint *)(lVar13 + lVar11 + lVar39 + 8 + lVar29 * 4) = uVar8;
          }
          else {
            *(uint *)(lVar13 + lVar11 + lVar39 + 8 + lVar29 * 4) = *(uint *)((long)puVar12 + lVar49)
            ;
          }
        }
        else {
          *(undefined4 *)(lVar13 + lVar11 + lVar39 + 8 + lVar29 * 4) =
               *(undefined4 *)((long)puVar12 + lVar49);
        }
        goto LAB_0024235e;
      }
      if (*(char *)(lVar35 + lVar29) != '\0') {
        local_70 = (ulong)(iVar30 + 2) + lVar29;
        uVar8 = (uint)local_70;
        lVar41 = lVar34 + 0x400000000 >> 0x20;
        if (pcVar27[lVar41] == '\0') {
          if (*(char *)(lVar29 + 2 + lVar18 + lVar24) == '\0') {
            uVar23 = *(undefined4 *)((long)puVar2 + lVar49);
            goto LAB_0024181c;
          }
          if (*(char *)(lVar29 + 1 + lVar17 + lVar24) == '\0') {
            uVar8 = UF::Merge(*(uint *)((long)puVar12 + lVar49),*(uint *)(lVar15 + lVar29 * 4));
            *(uint *)(lVar13 + lVar11 + lVar39 + 8 + lVar29 * 4) = uVar8;
            goto LAB_0023dd24;
          }
          *(uint *)(lVar13 + lVar11 + lVar39 + 8 + lVar29 * 4) = *(uint *)((long)puVar12 + lVar49);
          goto LAB_00241537;
        }
        lVar17 = lVar17 + lVar24;
        if (*(char *)(lVar29 + 3 + lVar17) == '\0') {
          if (*(char *)(lVar29 + 2 + lVar18 + lVar24) == '\0') {
            uVar8 = puVar12[lVar41];
            uVar7 = *(uint *)((long)puVar2 + lVar49);
            goto LAB_00241f95;
          }
          if (*(char *)(lVar29 + 1 + lVar17) == '\0') {
            uVar8 = UF::Merge(*(uint *)((long)puVar12 + lVar49),*(uint *)(lVar15 + lVar29 * 4));
            uVar8 = UF::Merge(uVar8,puVar12[lVar41]);
            *(uint *)(lVar13 + lVar11 + lVar39 + 8 + lVar29 * 4) = uVar8;
          }
          else {
            uVar8 = UF::Merge(*(uint *)((long)puVar12 + lVar49),puVar12[lVar41]);
            *(uint *)(lVar13 + lVar11 + lVar39 + 8 + lVar29 * 4) = uVar8;
          }
          goto LAB_0023d927;
        }
        if (*(char *)(lVar29 + 1 + lVar17) == '\0') {
          uVar8 = *(uint *)((long)puVar12 + lVar49);
        }
        else {
          if (*(char *)(lVar29 + 2 + lVar18 + lVar24) != '\0') {
            uVar8 = *(uint *)((long)puVar12 + lVar49);
            goto LAB_00241de2;
          }
          uVar8 = *(uint *)((long)puVar12 + lVar49);
          if (*(char *)(lVar29 + 2 + lVar17) != '\0') goto LAB_00241a1d;
        }
        uVar8 = UF::Merge(uVar8,*(uint *)(lVar15 + lVar29 * 4));
        goto LAB_002417b4;
      }
      if (*(char *)(lVar44 + lVar29) == '\0') {
        uVar8 = iVar30 + iVar47 + 2;
        *(undefined4 *)(lVar13 + lVar11 + lVar39 + 8 + lVar29 * 4) =
             *(undefined4 *)((long)puVar2 + lVar49);
        goto LAB_002404ce;
      }
      uVar8 = *(uint *)(lVar15 + -8 + lVar29 * 4);
      if (*(char *)(lVar24 + lVar17 + 1 + lVar29) == '\0') {
        uVar8 = UF::Merge(uVar8,*(uint *)(lVar15 + lVar29 * 4));
      }
LAB_00240bd5:
      puVar43[lVar29] = uVar8;
      lVar34 = lVar34 + 0x200000000;
      lVar29 = lVar29 + 2;
      puVar42 = puVar42 + 2;
      goto LAB_00240afc;
    }
    if (cVar16 != '\0') {
      local_70 = (ulong)(iVar30 + iVar47 + 2);
      *(undefined4 *)(lVar13 + lVar11 + lVar39 + 8 + lVar29 * 4) =
           *(undefined4 *)(lVar15 + lVar29 * 4);
      goto LAB_0024235e;
    }
    if (*(char *)(lVar35 + lVar29) == '\0') {
      if (*(char *)(lVar44 + lVar29) != '\0') {
        uVar8 = *(uint *)(lVar15 + lVar29 * 4);
        goto LAB_00240bd5;
      }
      uVar8 = iVar30 + iVar47 + 2;
      UF::P_[UF::length_] = UF::length_;
      uVar7 = UF::length_ + 1;
      *(uint *)(lVar13 + lVar11 + lVar39 + 8 + lVar29 * 4) = UF::length_;
      UF::length_ = uVar7;
      goto LAB_002404ce;
    }
    local_70 = (ulong)(iVar30 + 2) + lVar29;
    lVar41 = lVar34 + 0x400000000 >> 0x20;
    cVar16 = *(char *)(lVar29 + 2 + lVar18 + lVar24);
    if (pcVar27[lVar41] != '\0') {
      if (cVar16 == '\0') {
        uVar8 = puVar12[lVar41];
        goto LAB_00241de2;
      }
      uVar8 = *(uint *)(lVar50 + lVar39 + 8 + lVar29 * 4);
      if (*(char *)(lVar29 + 3 + lVar17 + lVar24) != '\0') goto LAB_00241a1d;
      uVar8 = UF::Merge(uVar8,puVar12[lVar41]);
      lVar13 = lVar13 + lVar11;
      goto LAB_002437f4;
    }
    if (cVar16 != '\0') {
      *(undefined4 *)(lVar13 + lVar11 + lVar39 + 8 + lVar29 * 4) =
           *(undefined4 *)(lVar15 + lVar29 * 4);
      goto LAB_00241537;
    }
    UF::P_[UF::length_] = UF::length_;
    uVar8 = UF::length_ + 1;
    *(uint *)(lVar13 + lVar11 + lVar39 + 8 + lVar29 * 4) = UF::length_;
    UF::length_ = uVar8;
LAB_00241c44:
    uVar8 = (uint)local_70;
    goto LAB_0023d2a6;
  }
  uVar8 = iVar30 + iVar47 + 2;
  local_70 = (ulong)uVar8;
  if ((int)uVar8 <= iVar38) {
    if (*(char *)(lVar48 + local_70) != '\0') {
      uVar21 = (ulong)(iVar30 + iVar47 + 1);
      cVar16 = pcVar27[lVar46 + 3];
      if (pcVar10[uVar21] == '\0') {
joined_r0x00241e8c:
        if (cVar16 != '\0') {
LAB_002415b5:
          uVar8 = puVar12[local_70];
          goto LAB_0024228a;
        }
        cVar16 = pcVar27[local_70];
        goto joined_r0x00241e9a;
      }
      if (cVar16 == '\0') {
        if (pcVar27[local_70] == '\0') goto LAB_00241c82;
        cVar16 = pcVar27[uVar21 - lVar25];
      }
      else {
        if (pcVar27[uVar21 - lVar25] == '\0') {
          uVar8 = puVar12[lVar46];
          goto LAB_00243cfb;
        }
        if (pcVar27[local_70] != '\0') {
          uVar8 = puVar12[lVar46];
          goto LAB_0024228a;
        }
        cVar16 = pcVar27[local_70 - lVar25];
      }
      uVar8 = puVar12[lVar46];
      if (cVar16 == '\0') goto LAB_00243cfb;
LAB_00241e6c:
      puVar2[local_70] = uVar8;
      goto LAB_00243d1f;
    }
    uVar21 = (ulong)(uint)(iVar30 + 3 + iVar47);
    if (pcVar10[local_70] == '\0') {
      if (*(char *)(lVar48 + uVar21) == '\0') {
        cVar16 = pcVar10[uVar21];
joined_r0x002400e2:
        if (cVar16 == '\0') goto LAB_00242c85;
        goto LAB_0024233a;
      }
      cVar16 = pcVar27[uVar21];
      goto joined_r0x002418b9;
    }
    if (*(char *)(lVar48 + uVar21) == '\0') goto LAB_00241c7a;
    uVar26 = (ulong)(iVar30 + iVar47 + 1);
    cVar16 = pcVar27[uVar21];
    if (pcVar10[uVar26] == '\0') goto joined_r0x00241e8c;
    if (cVar16 != '\0') {
      if (pcVar27[uVar26 - lVar25] != '\0') {
        if (pcVar27[local_70] != '\0') {
          uVar8 = *(uint *)((long)puVar12 + lVar49);
          goto LAB_0024228a;
        }
        bVar52 = pcVar27[local_70 - lVar25] == '\0';
        goto LAB_00240c52;
      }
      uVar8 = *(uint *)((long)puVar12 + lVar49);
      goto LAB_00243cfb;
    }
    if (pcVar27[local_70] == '\0') goto LAB_00242286;
    bVar52 = pcVar27[uVar26 - lVar25] == '\0';
LAB_00240c52:
    uVar8 = *(uint *)((long)puVar12 + lVar49);
    if (!bVar52) goto LAB_00241e6c;
    goto LAB_00243cfb;
  }
  if (*(char *)(lVar48 + local_70) == '\0') {
    if (pcVar10[local_70] == '\0') {
      puVar2[local_70] = 0;
      goto LAB_00243d1f;
    }
LAB_00241c7a:
    if (pcVar10[lVar46 + 1] == '\0') {
LAB_00241c8b:
      UF::P_[UF::length_] = UF::length_;
      uVar8 = UF::length_ + 1;
      puVar2[local_70] = UF::length_;
      UF::length_ = uVar8;
      goto LAB_00243d1f;
    }
LAB_00241c82:
    uVar8 = puVar2[lVar46];
  }
  else {
    uVar21 = (ulong)(iVar30 + iVar47 + 1);
    if (pcVar10[uVar21] == '\0') {
      if (pcVar27[local_70] == '\0') goto LAB_00241c8b;
      goto LAB_002415b5;
    }
    if (pcVar27[local_70] != '\0') {
      bVar52 = pcVar27[uVar21 - lVar25] == '\0';
      goto LAB_00240c52;
    }
LAB_00242286:
    uVar8 = *(uint *)((long)puVar2 + lVar49);
  }
LAB_0024228a:
  puVar2[local_70] = uVar8;
  goto LAB_00243d1f;
LAB_00240c66:
  local_70 = (ulong)(iVar30 + 2) + lVar29;
  uVar8 = (uint)local_70;
  lVar41 = lVar34 + 0x300000000 >> 0x20;
  if (*(char *)(lVar29 + 2 + lVar19 + lVar24) == '\0') {
    if (*(char *)(lVar48 + lVar41) != '\0') {
      if (pcVar27[lVar41] == '\0') goto LAB_00241939;
      *(undefined4 *)(lVar13 + lVar11 + lVar39 + 8 + lVar29 * 4) =
           *(undefined4 *)(lVar15 + lVar29 * 4);
      goto LAB_0023e1f9;
    }
    if (pcVar10[lVar41] == '\0') goto LAB_0023bedf;
    UF::P_[UF::length_] = UF::length_;
    uVar8 = UF::length_ + 1;
    *(uint *)(lVar14 + lVar39 + 8 + lVar29 * 4) = UF::length_;
    UF::length_ = uVar8;
    local_70 = local_70 & 0xffffffff;
    goto LAB_0023c718;
  }
  if (*(char *)(lVar48 + lVar41) == '\0') {
    if (pcVar10[lVar46 + 1] == '\0') {
      UF::P_[UF::length_] = UF::length_;
      uVar8 = UF::length_ + 1;
      *(uint *)(lVar13 + lVar11 + lVar39 + 8 + lVar29 * 4) = UF::length_;
      UF::length_ = uVar8;
    }
    else {
      *(uint *)(lVar13 + lVar11 + lVar39 + 8 + lVar29 * 4) = puVar2[lVar46];
    }
    goto LAB_0023f32b;
  }
  lVar14 = lVar34 + 0x100000000 >> 0x20;
  if (pcVar10[lVar14] == '\0') {
    if (pcVar27[lVar41] != '\0') {
      *(undefined4 *)(lVar13 + lVar11 + lVar39 + 8 + lVar29 * 4) =
           *(undefined4 *)(lVar15 + lVar29 * 4);
      goto LAB_0023e1f9;
    }
LAB_00241939:
    lVar14 = lVar34 + 0x400000000 >> 0x20;
    cVar16 = *(char *)(lVar29 + 2 + lVar18 + lVar24);
    if (pcVar27[lVar14] == '\0') {
      if (cVar16 != '\0') {
        *(undefined4 *)(lVar39 + lVar13 + lVar11 + 8 + lVar29 * 4) =
             *(undefined4 *)(lVar15 + lVar29 * 4);
        goto LAB_002437b2;
      }
      UF::P_[UF::length_] = UF::length_;
      lVar13 = lVar13 + lVar11;
      uVar7 = UF::length_;
LAB_00243709:
      UF::length_ = uVar7 + 1;
      *(uint *)(lVar13 + lVar39 + 8 + lVar29 * 4) = uVar7;
      goto LAB_0023d2a6;
    }
    if (cVar16 != '\0') {
      uVar8 = *(uint *)(lVar50 + lVar39 + 8 + lVar29 * 4);
      if (pcVar27[lVar41 - lVar25] == '\0') {
        uVar7 = puVar12[lVar14];
LAB_00241f95:
        uVar8 = UF::Merge(uVar8,uVar7);
        lVar13 = lVar13 + lVar11;
        goto LAB_002437f4;
      }
LAB_00241a1d:
      *(uint *)(lVar13 + lVar11 + lVar39 + 8 + lVar29 * 4) = uVar8;
      goto LAB_0023d927;
    }
    uVar8 = puVar12[lVar14];
LAB_00241de2:
    *(uint *)(lVar13 + lVar11 + lVar39 + 8 + lVar29 * 4) = uVar8;
    goto LAB_0023d927;
  }
  if (pcVar27[lVar41] != '\0') {
    if (pcVar27[lVar14 - lVar25] == '\0') {
      uVar8 = UF::Merge(*(uint *)((long)puVar12 + lVar49),*(uint *)(lVar15 + lVar29 * 4));
      *(uint *)(lVar13 + lVar11 + lVar39 + 8 + lVar29 * 4) = uVar8;
    }
    else if (*(char *)(lVar29 + 2 + lVar18 + lVar24) == '\0') {
      if (*(char *)(lVar29 + 2 + lVar17 + lVar24) == '\0') {
        uVar8 = UF::Merge(*(uint *)((long)puVar12 + lVar49),*(uint *)(lVar15 + lVar29 * 4));
        *(uint *)(lVar13 + lVar11 + lVar39 + 8 + lVar29 * 4) = uVar8;
      }
      else {
        *(uint *)(lVar13 + lVar11 + lVar39 + 8 + lVar29 * 4) = *(uint *)((long)puVar12 + lVar49);
      }
    }
    else {
      *(undefined4 *)(lVar13 + lVar11 + lVar39 + 8 + lVar29 * 4) =
           *(undefined4 *)((long)puVar12 + lVar49);
    }
    goto LAB_0023e1f9;
  }
  lVar50 = lVar34 + 0x400000000 >> 0x20;
  if (pcVar27[lVar50] == '\0') {
    if (*(char *)(lVar29 + 2 + lVar18 + lVar24) != '\0') {
      if (pcVar27[lVar14 - lVar25] == '\0') {
        uVar8 = UF::Merge(*(uint *)((long)puVar12 + lVar49),*(uint *)(lVar15 + lVar29 * 4));
        *(uint *)(lVar39 + lVar13 + lVar11 + 8 + lVar29 * 4) = uVar8;
      }
      else {
        *(uint *)(lVar13 + lVar11 + lVar39 + 8 + lVar29 * 4) = *(uint *)((long)puVar12 + lVar49);
LAB_00241537:
        local_70 = local_70 & 0xffffffff;
      }
      goto LAB_0023dd24;
    }
    uVar23 = *(undefined4 *)((long)puVar2 + lVar49);
LAB_0024181c:
    *(undefined4 *)(lVar13 + lVar11 + lVar39 + 8 + lVar29 * 4) = uVar23;
    goto LAB_0023d2a6;
  }
  if (pcVar27[lVar41 - lVar25] == '\0') {
    if (*(char *)(lVar29 + 2 + lVar18 + lVar24) == '\0') {
      uVar8 = UF::Merge(puVar12[lVar50],*(uint *)((long)puVar2 + lVar49));
      lVar13 = lVar13 + lVar11;
      goto LAB_002437f4;
    }
    if (pcVar27[lVar14 - lVar25] == '\0') {
      uVar8 = UF::Merge(*(uint *)((long)puVar12 + lVar49),*(uint *)(lVar15 + lVar29 * 4));
      uVar8 = UF::Merge(uVar8,puVar12[lVar50]);
      *(uint *)(lVar13 + lVar11 + lVar39 + 8 + lVar29 * 4) = uVar8;
    }
    else {
      uVar8 = UF::Merge(*(uint *)((long)puVar12 + lVar49),puVar12[lVar50]);
      *(uint *)(lVar13 + lVar11 + lVar39 + 8 + lVar29 * 4) = uVar8;
    }
    goto LAB_0023d927;
  }
  if (pcVar27[lVar14 - lVar25] == '\0') {
    uVar8 = UF::Merge(*(uint *)((long)puVar12 + lVar49),*(uint *)(lVar15 + lVar29 * 4));
  }
  else {
    if (*(char *)(lVar29 + 2 + lVar18 + lVar24) != '\0') {
      uVar8 = *(uint *)((long)puVar12 + lVar49);
      goto LAB_00241de2;
    }
    uVar8 = *(uint *)((long)puVar12 + lVar49);
    if (*(char *)(lVar29 + 2 + lVar17 + lVar24) != '\0') goto LAB_00241a1d;
    uVar8 = UF::Merge(uVar8,*(uint *)(lVar15 + lVar29 * 4));
  }
LAB_002417b4:
  *(uint *)(lVar13 + lVar11 + lVar39 + 8 + lVar29 * 4) = uVar8;
  goto LAB_0023d927;
code_r0x0023e7d5:
  *(undefined4 *)(lVar20 + lVar18 * 4) = *(undefined4 *)(lVar39 + lVar41 + lVar18 * 4);
  lVar15 = lVar15 + 0x200000000;
  lVar18 = lVar18 + 2;
  lVar14 = lVar14 + 8;
  goto LAB_0023e780;
LAB_00244799:
  local_c0 = (ulong)(iVar47 + iVar30 + 2);
  uVar21 = lVar34 + lVar20 + 2;
LAB_002447c4:
  *(undefined4 *)(lVar48 + uVar21 * 4) = *(undefined4 *)(lVar15 + uVar21 * 4);
  lVar41 = (long)(int)local_c0;
  local_c0 = lVar41 + 2;
  iVar30 = (int)local_c0;
  if (iVar38 <= iVar30) {
    if (iVar38 < iVar30) {
LAB_00245429:
      lVar45 = (long)(int)local_c0;
      if (*(char *)(lVar32 + lVar45) != '\0') {
        *(undefined4 *)(lVar48 + lVar45 * 4) = *(undefined4 *)(lVar48 + -8 + lVar45 * 4);
        return;
      }
      *(undefined4 *)(lVar48 + lVar45 * 4) = 0;
      return;
    }
    if (*(char *)(lVar32 + local_c0) != '\0') {
      if (*(char *)(lVar17 + 3 + lVar41) == '\0') {
        uVar9 = *(uint *)(lVar48 + lVar41 * 4);
      }
      else {
        if (*(char *)(lVar13 + local_c0) == '\0') {
          uVar9 = *(uint *)(lVar15 + 8 + lVar41 * 4);
          uVar31 = *(uint *)(lVar48 + lVar41 * 4);
        }
        else {
          uVar9 = *(uint *)(lVar15 + lVar41 * 4);
          if (*(char *)(lVar13 + 1 + lVar41) != '\0') {
            *(uint *)(lVar48 + 8 + lVar41 * 4) = uVar9;
            return;
          }
          uVar31 = *(uint *)(lVar15 + 8 + lVar41 * 4);
        }
        uVar9 = UF::Merge(uVar9,uVar31);
      }
      goto LAB_0024581d;
    }
    if (*(char *)(lVar41 + 3 + lVar32) == '\0') goto LAB_00245a52;
    cVar16 = *(char *)(lVar17 + 3 + lVar41);
    uVar9 = UF::length_;
    goto joined_r0x00245812;
  }
  uVar21 = local_c0;
  if (*(char *)(lVar32 + 2 + lVar41) != '\0') {
    if (*(char *)(lVar17 + 3 + lVar41) != '\0') {
      if (*(char *)(lVar13 + local_c0) != '\0') {
        uVar9 = *(uint *)(lVar15 + lVar41 * 4);
        if (*(char *)(lVar14 + lVar41) == '\0') {
          uVar9 = UF::Merge(uVar9,*(uint *)(lVar15 + 8 + lVar41 * 4));
        }
        local_c0 = local_c0 & 0xffffffff;
        goto LAB_00244e7d;
      }
      uVar9 = UF::Merge(*(uint *)(lVar15 + 8 + lVar41 * 4),*(uint *)(lVar48 + lVar41 * 4));
      local_c0 = local_c0 & 0xffffffff;
      goto LAB_00244e7d;
    }
    if (*(char *)(lVar32 + 3 + lVar41) == '\0') {
      uVar9 = *(uint *)(lVar48 + lVar41 * 4);
      goto LAB_002448cb;
    }
    if (*(char *)(lVar41 + 4 + lVar17) == '\0') {
      puVar37 = (undefined4 *)(lVar48 + lVar41 * 4);
      goto LAB_00244c1e;
    }
    if (*(char *)(lVar13 + 3 + lVar41) == '\0') {
      uVar9 = *(uint *)(lVar15 + 0x10 + lVar41 * 4);
      uVar31 = *(uint *)(lVar48 + lVar41 * 4);
      goto LAB_00244908;
    }
    if (*(char *)(lVar13 + local_c0) == '\0') {
      uVar9 = *(uint *)(lVar15 + 8 + lVar41 * 4);
      uVar31 = *(uint *)(lVar48 + lVar41 * 4);
    }
    else {
      uVar9 = *(uint *)(lVar15 + lVar41 * 4);
      if (*(char *)(lVar14 + lVar41) != '\0') {
        *(uint *)(lVar48 + 8 + lVar41 * 4) = uVar9;
        goto LAB_002445fa;
      }
      uVar31 = *(uint *)(lVar15 + 8 + lVar41 * 4);
    }
    uVar9 = UF::Merge(uVar9,uVar31);
    *(uint *)(lVar48 + 8 + lVar41 * 4) = uVar9;
    goto LAB_002445fa;
  }
  if (*(char *)(lVar32 + 3 + lVar41) == '\0') goto LAB_002440a9;
  if (*(char *)(lVar17 + 3 + lVar41) != '\0') goto LAB_00244846;
  if (*(char *)(lVar41 + 4 + lVar17) == '\0') {
LAB_002448dd:
    uVar26 = (ulong)UF::length_;
    UF::P_[uVar26] = UF::length_;
    UF::length_ = UF::length_ + 1;
    local_c0 = uVar21 & 0xffffffff;
LAB_00244438:
    *(int *)(lVar48 + uVar21 * 4) = (int)uVar26;
    puVar2 = UF::P_;
    iVar30 = (int)local_c0;
    lVar50 = (long)iVar30;
    lVar19 = lVar50 << 0x20;
    lVar41 = lVar25 + lVar50 * 4;
    lVar18 = 0;
    do {
      uVar21 = lVar50 + lVar18 + 2;
      if (lVar33 <= (long)uVar21) {
        local_c0 = (ulong)(iVar30 + 2) + lVar18;
        if ((int)local_c0 <= iVar38) {
          lVar45 = lVar19 + 0x200000000 >> 0x20;
          if (*(char *)(lVar32 + lVar45) == '\0') {
            lVar33 = lVar19 + 0x300000000 >> 0x20;
            if (*(char *)(lVar32 + lVar33) == '\0') {
              *(undefined4 *)(lVar48 + lVar45 * 4) = 0;
              return;
            }
            if (*(char *)(lVar17 + lVar33) != '\0') {
              *(undefined4 *)(lVar48 + lVar45 * 4) = *(undefined4 *)(lVar15 + lVar45 * 4);
              return;
            }
            UF::P_[UF::length_] = UF::length_;
            uVar9 = UF::length_ + 1;
            *(uint *)(lVar48 + lVar45 * 4) = UF::length_;
            UF::length_ = uVar9;
            return;
          }
          lVar19 = lVar19 >> 0x20;
          if (*(char *)(lVar17 + 3 + lVar19) == '\0') {
            uVar23 = *(undefined4 *)(lVar48 + lVar19 * 4);
LAB_002459b2:
            *(undefined4 *)(lVar48 + lVar45 * 4) = uVar23;
            return;
          }
          uVar9 = *(uint *)(lVar15 + lVar45 * 4);
          uVar31 = *(uint *)(lVar48 + lVar19 * 4);
LAB_0024562e:
          uVar9 = UF::Merge(uVar9,uVar31);
          *(uint *)(lVar48 + lVar45 * 4) = uVar9;
          return;
        }
        local_c0 = local_c0 & 0xffffffff;
        goto LAB_00245429;
      }
      if (*(char *)(lVar11 + lVar50 + -1 + lVar18) != '\0') goto LAB_002444c7;
      iVar47 = (int)lVar18;
      if (*(char *)(lVar11 + lVar50 + lVar18) == '\0') {
        iVar30 = iVar30 + iVar47 + 2;
        uVar21 = lVar50 + lVar18 + 2;
        goto LAB_002440ab;
      }
      if (*(char *)(lVar28 + lVar50 + -1 + lVar18) != '\0') {
        local_c0 = (ulong)(iVar30 + iVar47 + 2);
        uVar21 = lVar50 + 2 + lVar18;
        goto LAB_00244944;
      }
      if (*(char *)(lVar28 + lVar50 + lVar18) != '\0') {
        local_c0 = (ulong)(iVar30 + iVar47 + 2);
        *(undefined4 *)(lVar41 + lVar18 * 4) = *(undefined4 *)(lVar39 + lVar50 * 4 + 8 + lVar18 * 4)
        ;
        goto LAB_002445fa;
      }
      puVar2[UF::length_] = UF::length_;
      uVar9 = UF::length_ + 1;
      *(uint *)(lVar41 + lVar18 * 4) = UF::length_;
      UF::length_ = uVar9;
      lVar19 = lVar19 + 0x200000000;
      lVar18 = lVar18 + 2;
    } while( true );
  }
LAB_002448c0:
  uVar9 = *(uint *)(lVar15 + 0x10 + lVar41 * 4);
  goto LAB_0024491b;
LAB_002444c7:
  local_c0 = (ulong)(iVar30 + 2) + lVar18;
  iVar30 = (int)local_c0;
  lVar20 = lVar19 + 0x300000000 >> 0x20;
  lVar29 = lVar19 >> 0x1e;
  if (*(char *)(lVar17 + lVar20) != '\0') {
    uVar9 = UF::Merge(*(uint *)(lVar39 + lVar50 * 4 + lVar18 * 4),*(uint *)(lVar48 + lVar29));
    goto LAB_00244e7d;
  }
  if (*(char *)(lVar32 + lVar20) != '\0') {
    lVar19 = lVar19 + 0x400000000 >> 0x20;
    if (*(char *)(lVar17 + lVar19) == '\0') {
      puVar37 = (undefined4 *)(lVar29 + lVar48);
LAB_00244c1e:
      *(undefined4 *)(lVar48 + uVar21 * 4) = *puVar37;
      lVar19 = (long)iVar30;
      lVar50 = lVar19 << 0x20;
      lVar41 = lVar25 + lVar19 * 4;
      lVar18 = 0;
      do {
        uVar21 = lVar19 + lVar18 + 2;
        lVar20 = lVar50 >> 0x20;
        if (lVar33 <= (long)uVar21) {
          local_c0 = (ulong)(iVar30 + 2) + lVar18;
          if ((int)local_c0 <= iVar38) {
            lVar45 = lVar50 + 0x200000000 >> 0x20;
            if (*(char *)(lVar32 + lVar45) == '\0') {
              lVar33 = lVar50 + 0x300000000 >> 0x20;
              if (*(char *)(lVar32 + lVar33) == '\0') {
LAB_002458f7:
                *(undefined4 *)(lVar48 + lVar45 * 4) = 0;
                return;
              }
              cVar16 = *(char *)(lVar17 + lVar33);
joined_r0x002456f0:
              if (cVar16 == '\0') {
LAB_00245901:
                UF::P_[UF::length_] = UF::length_;
                uVar9 = UF::length_ + 1;
                *(uint *)(lVar48 + lVar45 * 4) = UF::length_;
                UF::length_ = uVar9;
                return;
              }
LAB_002458e9:
              uVar23 = *(undefined4 *)(lVar15 + lVar45 * 4);
            }
            else {
              if (*(char *)(lVar17 + 3 + lVar20) != '\0') {
                if ((*(char *)(lVar13 + lVar45) == '\0') || (*(char *)(lVar17 + lVar20) == '\0')) {
                  uVar9 = *(uint *)(lVar15 + lVar45 * 4);
                  uVar31 = *(uint *)(lVar48 + lVar20 * 4);
                }
                else {
                  cVar16 = *(char *)(lVar13 + 1 + lVar20);
LAB_00245689:
                  uVar9 = *(uint *)(lVar15 + lVar20 * 4);
                  if (cVar16 != '\0') {
                    *(uint *)(lVar48 + lVar45 * 4) = uVar9;
                    return;
                  }
                  uVar31 = *(uint *)(lVar15 + lVar45 * 4);
                }
LAB_00245a1e:
                uVar9 = UF::Merge(uVar9,uVar31);
                *(uint *)(lVar48 + lVar45 * 4) = uVar9;
                return;
              }
              uVar23 = *(undefined4 *)(lVar48 + lVar20 * 4);
            }
LAB_002458ee:
            *(undefined4 *)(lVar48 + lVar45 * 4) = uVar23;
            return;
          }
          local_c0 = local_c0 & 0xffffffff;
          goto LAB_00245429;
        }
        if (*(char *)(lVar11 + lVar19 + -1 + lVar18) == '\0') {
          local_c0 = (ulong)(iVar30 + 2) + lVar18;
          iVar30 = (int)local_c0;
          lVar20 = lVar50 + 0x300000000 >> 0x20;
          uVar21 = lVar19 + 2 + lVar18;
          if (*(char *)(lVar32 + lVar20) == '\0') goto LAB_002440ab;
          if (*(char *)(lVar17 + lVar20) != '\0') goto LAB_00244944;
          lVar50 = lVar50 + 0x400000000 >> 0x20;
          if (*(char *)(lVar17 + lVar50) == '\0') goto LAB_00244426;
          *(undefined4 *)(lVar41 + lVar18 * 4) = *(undefined4 *)(lVar15 + lVar50 * 4);
          local_c0 = local_c0 & 0xffffffff;
          goto LAB_002445fa;
        }
        lVar29 = lVar50 >> 0x1e;
        if (*(char *)(lVar28 + lVar19 + -1 + lVar18) != '\0') {
          local_c0 = (ulong)(iVar30 + 2) + lVar18;
          if (*(char *)(lVar24 + -1 + lVar19 + lVar18) == '\0') {
            uVar9 = UF::Merge(*(uint *)(lVar39 + lVar19 * 4 + lVar18 * 4),*(uint *)(lVar48 + lVar29)
                             );
          }
          else if (*(char *)(lVar17 + lVar20) == '\0') {
            uVar9 = UF::Merge(*(uint *)(lVar39 + lVar19 * 4 + lVar18 * 4),
                              *(uint *)(lVar48 + lVar20 * 4));
          }
          else {
            uVar9 = *(uint *)(lVar15 + lVar20 * 4);
            if (*(char *)(lVar14 + lVar20) == '\0') {
              uVar9 = UF::Merge(uVar9,*(uint *)(lVar39 + lVar19 * 4 + lVar18 * 4));
            }
          }
LAB_00244e7d:
          *(uint *)(lVar48 + uVar21 * 4) = uVar9;
          iVar30 = (int)local_c0;
          lVar34 = (long)iVar30;
          lVar29 = lVar34 << 0x20;
          lVar41 = lVar39 + lVar34 * 4;
          lVar50 = lVar48 + lVar34 * 4;
          lVar18 = lVar24 + lVar34;
          lVar19 = lVar1 + lVar34;
          lVar35 = 0;
          lVar20 = 0;
          do {
            uVar21 = lVar20 + lVar34 + 2;
            if (lVar33 <= (long)uVar21) {
              lVar45 = lVar29 + 0x200000000 >> 0x20;
              lVar33 = lVar29 >> 0x20;
              if (iVar38 < iVar30 + (int)lVar20 + 2) {
                if (*(char *)(lVar32 + lVar45) == '\0') goto LAB_002457e4;
                if (*(char *)(lVar32 + 1 + lVar33) == '\0') {
                  if (*(char *)(lVar17 + lVar45) != '\0') goto LAB_00245850;
                  uVar23 = *(undefined4 *)(lVar15 + lVar33 * 4);
                }
                else {
                  uVar23 = *(undefined4 *)(lVar48 + lVar33 * 4);
                }
                goto LAB_00245854;
              }
              if (*(char *)(lVar32 + lVar45) == '\0') {
                lVar33 = lVar29 + 0x300000000 >> 0x20;
                if (*(char *)(lVar32 + lVar33) == '\0') {
                  *(undefined4 *)(lVar48 + lVar45 * 4) = 0;
                  return;
                }
                if ((*(char *)(lVar17 + lVar33) == '\0') && (*(char *)(lVar17 + lVar45) == '\0')) {
                  UF::P_[UF::length_] = UF::length_;
                  uVar9 = UF::length_ + 1;
                  *(uint *)(lVar48 + lVar45 * 4) = UF::length_;
                  UF::length_ = uVar9;
                  return;
                }
              }
              else {
                cVar16 = *(char *)(lVar17 + 3 + lVar33);
                if (*(char *)(lVar32 + 1 + lVar33) == '\0') {
                  if (cVar16 == '\0') {
                    if (*(char *)(lVar17 + lVar45) == '\0') goto LAB_002459bb;
                  }
                  else if (*(char *)(lVar17 + lVar45) == '\0') {
                    uVar9 = *(uint *)(lVar15 + lVar33 * 4);
                    if (*(char *)(lVar13 + lVar45) != '\0') {
                      *(uint *)(lVar48 + lVar45 * 4) = uVar9;
                      return;
                    }
                    uVar31 = *(uint *)(lVar15 + lVar45 * 4);
                    goto LAB_0024562e;
                  }
                }
                else {
                  if (cVar16 == '\0') {
                    uVar23 = *(undefined4 *)(lVar48 + lVar33 * 4);
                    goto LAB_002459b2;
                  }
                  if (*(char *)(lVar17 + lVar45) == '\0') {
                    if (*(char *)(lVar13 + lVar45) == '\0') {
                      uVar9 = *(uint *)(lVar15 + lVar45 * 4);
                      uVar31 = *(uint *)(lVar48 + lVar33 * 4);
                      goto LAB_0024562e;
                    }
LAB_002459bb:
                    uVar23 = *(undefined4 *)(lVar15 + lVar33 * 4);
                    goto LAB_002459b2;
                  }
                }
              }
              uVar23 = *(undefined4 *)(lVar15 + lVar45 * 4);
              goto LAB_002459b2;
            }
            if (*(char *)(lVar11 + lVar34 + -1 + lVar20) == '\0') goto LAB_00244fb1;
            cVar16 = *(char *)(lVar19 + 1 + lVar20);
            if (*(char *)(lVar11 + lVar34 + -2 + lVar20) == '\0') {
              if (cVar16 == '\0') {
                local_c0 = (ulong)(iVar30 + 2) + lVar20;
                uVar21 = lVar34 + 2 + lVar20;
                if (*(char *)(lVar11 + lVar20 + lVar34) == '\0') {
                  if (*(char *)(lVar20 + lVar19) == '\0') {
                    uVar9 = *(uint *)(lVar41 + -8 + lVar20 * 4);
                  }
                  else {
                    uVar9 = *(uint *)(lVar41 + lVar20 * 4);
                  }
                  goto LAB_00245166;
                }
                lVar29 = lVar29 + 0x400000000 >> 0x20;
                if (*(char *)(lVar17 + lVar29) == '\0') {
                  if (*(char *)(lVar20 + lVar19) != '\0') goto LAB_002447c4;
                  uVar26 = (ulong)*(uint *)(lVar41 + -8 + lVar20 * 4);
                  goto LAB_00244438;
                }
                cVar16 = *(char *)(lVar20 + lVar18);
                if (*(char *)(lVar20 + lVar19) != '\0') {
                  uVar9 = *(uint *)(lVar41 + lVar20 * 4);
                  goto joined_r0x00245139;
                }
                if (cVar16 == '\0') {
                  uVar9 = *(uint *)(lVar41 + -8 + lVar20 * 4);
                  uVar31 = *(uint *)(lVar15 + lVar29 * 4);
                }
                else {
                  uVar9 = *(uint *)(lVar41 + -8 + lVar20 * 4);
                  if (*(char *)(lVar20 + -1 + lVar18) != '\0') {
                    *(uint *)(lVar50 + 8 + lVar20 * 4) = uVar9;
                    local_c0 = local_c0 & 0xffffffff;
                    goto LAB_002445fa;
                  }
                  uVar31 = *(uint *)(lVar41 + lVar20 * 4);
                }
                uVar9 = UF::Merge(uVar9,uVar31);
                *(uint *)(lVar50 + 8 + lVar20 * 4) = uVar9;
                goto LAB_002445fa;
              }
              if (*(char *)(lVar19 + lVar20) != '\0') goto LAB_00244f08;
              uVar9 = *(uint *)(lVar41 + -8 + lVar20 * 4);
              if (*(char *)(lVar18 + -1 + lVar20) == '\0') {
                uVar9 = UF::Merge(uVar9,*(uint *)(lVar41 + lVar20 * 4));
              }
            }
            else {
              if (cVar16 == '\0') {
                local_c0 = (ulong)(iVar30 + 2) + lVar20;
                iVar30 = (int)local_c0;
                if (*(char *)(lVar11 + lVar34 + lVar20) == '\0') {
                  uVar9 = *(uint *)(lVar50 + lVar20 * 4);
                  goto LAB_00245166;
                }
                lVar29 = lVar29 + 0x400000000 >> 0x20;
                if (*(char *)(lVar17 + lVar29) == '\0') {
                  puVar37 = (undefined4 *)(lVar50 + lVar35);
                  goto LAB_00244c1e;
                }
                if (*(char *)(lVar20 + lVar18) == '\0') {
                  uVar9 = *(uint *)(lVar15 + lVar29 * 4);
                }
                else {
                  if (*(char *)(lVar20 + lVar19) != '\0') {
                    uVar23 = *(undefined4 *)(lVar41 + lVar20 * 4);
                    goto LAB_0024526d;
                  }
                  if (*(char *)(lVar20 + -1 + lVar18) != '\0') {
                    uVar23 = *(undefined4 *)(lVar41 + -8 + lVar20 * 4);
                    goto LAB_0024526d;
                  }
                  uVar9 = *(uint *)(lVar41 + lVar20 * 4);
                }
                uVar31 = *(uint *)(lVar50 + lVar20 * 4);
                goto LAB_002451e6;
              }
              if (*(char *)(lVar19 + lVar20) == '\0') {
                if (*(char *)(lVar18 + -1 + lVar20) == '\0') {
                  uVar9 = UF::Merge(*(uint *)(lVar41 + lVar20 * 4),*(uint *)(lVar50 + lVar20 * 4));
                }
                else {
                  uVar9 = *(uint *)(lVar41 + -8 + lVar20 * 4);
                }
              }
              else {
LAB_00244f08:
                uVar9 = *(uint *)(lVar41 + lVar20 * 4);
              }
            }
            *(uint *)(lVar50 + 8 + lVar20 * 4) = uVar9;
            lVar29 = lVar29 + 0x200000000;
            lVar20 = lVar20 + 2;
            lVar35 = lVar35 + 8;
          } while( true );
        }
        if (*(char *)(lVar11 + lVar19 + lVar18) == '\0') {
          local_c0 = (ulong)(iVar30 + (int)lVar18 + 2);
          uVar9 = *(uint *)(lVar48 + lVar29);
          uVar21 = lVar19 + lVar18 + 2;
          goto LAB_00245166;
        }
        if (*(char *)(lVar28 + lVar19 + lVar18) != '\0') {
          local_c0 = (ulong)(iVar30 + 2) + lVar18;
          if (*(char *)(lVar18 + lVar24 + lVar19) == '\0') {
            uVar9 = *(uint *)(lVar39 + lVar19 * 4 + 8 + lVar18 * 4);
            uVar31 = *(uint *)(lVar48 + lVar29);
LAB_00244e08:
            uVar9 = UF::Merge(uVar9,uVar31);
LAB_00244e1b:
            *(uint *)(lVar41 + lVar18 * 4) = uVar9;
          }
          else {
            if (*(char *)(lVar18 + -1 + lVar24 + lVar19) == '\0') {
              uVar9 = UF::Merge(*(uint *)(lVar39 + lVar19 * 4 + lVar18 * 4),
                                *(uint *)(lVar48 + lVar29));
              *(uint *)(lVar41 + lVar18 * 4) = uVar9;
              goto LAB_002445fa;
            }
            if (*(char *)(lVar17 + lVar20) == '\0') {
              uVar9 = *(uint *)(lVar39 + lVar19 * 4 + lVar18 * 4);
              uVar31 = *(uint *)(lVar48 + lVar20 * 4);
              goto LAB_002452b1;
            }
            uVar9 = *(uint *)(lVar15 + lVar20 * 4);
            if (*(char *)(lVar14 + lVar20) == '\0') {
              uVar31 = *(uint *)(lVar39 + lVar19 * 4 + lVar18 * 4);
              goto LAB_002452b1;
            }
            *(uint *)(lVar41 + lVar18 * 4) = uVar9;
            local_c0 = local_c0 & 0xffffffff;
          }
          goto LAB_002445fa;
        }
        *(undefined4 *)(lVar41 + lVar18 * 4) = *(undefined4 *)(lVar41 + -8 + lVar18 * 4);
        lVar50 = lVar50 + 0x200000000;
        lVar18 = lVar18 + 2;
      } while( true );
    }
    uVar31 = *(uint *)(lVar48 + lVar29);
    if (*(char *)(lVar13 + lVar20) == '\0') {
      uVar9 = *(uint *)(lVar15 + lVar19 * 4);
    }
    else {
      uVar9 = *(uint *)(lVar39 + lVar50 * 4 + lVar18 * 4);
    }
LAB_002452b1:
    uVar9 = UF::Merge(uVar9,uVar31);
    *(uint *)(lVar41 + lVar18 * 4) = uVar9;
    goto LAB_002445fa;
  }
  uVar9 = *(uint *)(lVar48 + lVar29);
  goto LAB_00245166;
LAB_00244fb1:
  local_c0 = (ulong)(iVar30 + 2) + lVar20;
  iVar30 = (int)local_c0;
  lVar18 = lVar29 + 0x300000000 >> 0x20;
  uVar21 = lVar34 + 2 + lVar20;
  if (*(char *)(lVar32 + lVar18) == '\0') goto LAB_002440ab;
  if (*(char *)(lVar17 + lVar18) != '\0') {
LAB_00244944:
    *(undefined4 *)(lVar48 + uVar21 * 4) = *(undefined4 *)(lVar15 + uVar21 * 4);
    iVar30 = (int)local_c0;
    lVar19 = (long)iVar30;
    lVar20 = lVar19 << 0x20;
    lVar41 = lVar1 + lVar19;
    lVar50 = lVar25 + lVar19 * 4;
    lVar18 = lVar39 + lVar19 * 4;
    lVar29 = 0;
    while( true ) {
      if (lVar33 <= lVar19 + 2 + lVar29) {
        local_c0 = (ulong)(iVar30 + 2) + lVar29;
        if (iVar38 < (int)local_c0) {
          local_c0 = local_c0 & 0xffffffff;
          goto LAB_00245429;
        }
        lVar45 = lVar20 + 0x200000000 >> 0x20;
        if (*(char *)(lVar32 + lVar45) == '\0') {
          lVar33 = lVar20 + 0x300000000 >> 0x20;
          if (*(char *)(lVar32 + lVar33) == '\0') goto LAB_002458f7;
          if (*(char *)(lVar17 + lVar33) != '\0') goto LAB_002458e9;
          cVar16 = *(char *)(lVar17 + lVar45);
          goto joined_r0x002456f0;
        }
        lVar20 = lVar20 >> 0x20;
        if (*(char *)(lVar17 + 3 + lVar20) == '\0') {
          uVar23 = *(undefined4 *)(lVar48 + lVar20 * 4);
          goto LAB_002458ee;
        }
        if (*(char *)(lVar17 + lVar45) != '\0') goto LAB_002458e9;
        if (*(char *)(lVar13 + lVar45) != '\0') {
          uVar23 = *(undefined4 *)(lVar15 + lVar20 * 4);
          goto LAB_002458ee;
        }
        uVar9 = *(uint *)(lVar15 + lVar45 * 4);
        uVar31 = *(uint *)(lVar48 + lVar20 * 4);
        goto LAB_00245a1e;
      }
      if (*(char *)(lVar11 + lVar19 + -1 + lVar29) != '\0') {
        local_c0 = (ulong)(iVar30 + 2) + lVar29;
        iVar30 = (int)local_c0;
        lVar34 = lVar20 + 0x300000000 >> 0x20;
        uVar21 = lVar19 + 2 + lVar29;
        lVar35 = lVar20 >> 0x1e;
        if (*(char *)(lVar17 + lVar34) != '\0') {
          if (*(char *)(lVar29 + lVar41) != '\0') {
            uVar9 = *(uint *)(lVar18 + lVar29 * 4);
            goto LAB_00244e7d;
          }
          if (*(char *)(lVar29 + -1 + lVar19 + lVar24) == '\0') {
            uVar9 = *(uint *)(lVar18 + lVar29 * 4);
            uVar31 = *(uint *)(lVar48 + lVar35);
            goto LAB_00244ba4;
          }
          uVar9 = *(uint *)(lVar15 + lVar35);
          goto LAB_00244e7d;
        }
        if (*(char *)(lVar32 + lVar34) == '\0') {
          uVar9 = *(uint *)(lVar48 + lVar35);
          goto LAB_00245166;
        }
        lVar20 = lVar20 + 0x400000000 >> 0x20;
        if (*(char *)(lVar17 + lVar20) == '\0') {
          puVar37 = (undefined4 *)(lVar35 + lVar48);
          goto LAB_00244c1e;
        }
        if (*(char *)(lVar13 + lVar34) == '\0') {
          uVar9 = UF::Merge(*(uint *)(lVar15 + lVar20 * 4),*(uint *)(lVar48 + lVar35));
        }
        else {
          if (*(char *)(lVar29 + lVar41) == '\0') {
            if (*(char *)(lVar29 + -1 + lVar19 + lVar24) == '\0') {
              uVar9 = *(uint *)(lVar18 + lVar29 * 4);
              uVar31 = *(uint *)(lVar48 + lVar35);
              goto LAB_00244b39;
            }
            uVar9 = *(uint *)(lVar15 + lVar35);
            goto LAB_00244b4c;
          }
          uVar9 = *(uint *)(lVar18 + lVar29 * 4);
        }
        *(uint *)(lVar50 + lVar29 * 4) = uVar9;
        goto LAB_002445fa;
      }
      if (*(char *)(lVar11 + lVar19 + lVar29) == '\0') break;
      if (*(char *)(lVar41 + 1 + lVar29) == '\0') {
        local_c0 = (ulong)(iVar30 + 2) + lVar29;
        lVar41 = lVar20 + 0x400000000 >> 0x20;
        cVar16 = *(char *)(lVar1 + lVar19 + lVar29);
        if (*(char *)(lVar17 + lVar41) == '\0') {
          uVar21 = lVar19 + lVar29 + 2;
          if (cVar16 != '\0') goto LAB_002447c4;
          uVar26 = (ulong)UF::length_;
          UF::P_[uVar26] = UF::length_;
          UF::length_ = UF::length_ + 1;
          goto LAB_00244438;
        }
        if (cVar16 == '\0') {
          *(undefined4 *)(lVar50 + lVar29 * 4) = *(undefined4 *)(lVar15 + lVar41 * 4);
        }
        else {
          uVar9 = *(uint *)(lVar18 + lVar29 * 4);
          if (*(char *)(lVar29 + lVar19 + lVar24) == '\0') {
            uVar31 = *(uint *)(lVar15 + lVar41 * 4);
LAB_00244b39:
            uVar9 = UF::Merge(uVar9,uVar31);
LAB_00244b4c:
            *(uint *)(lVar50 + lVar29 * 4) = uVar9;
            goto LAB_002445fa;
          }
          *(uint *)(lVar50 + lVar29 * 4) = uVar9;
        }
        local_c0 = local_c0 & 0xffffffff;
        goto LAB_002445fa;
      }
      *(undefined4 *)(lVar50 + lVar29 * 4) = *(undefined4 *)(lVar18 + lVar29 * 4);
      lVar20 = lVar20 + 0x200000000;
      lVar29 = lVar29 + 2;
    }
    iVar30 = iVar30 + (int)lVar29 + 2;
    uVar21 = lVar19 + lVar29 + 2;
LAB_002440ab:
    *(undefined4 *)(lVar48 + uVar21 * 4) = 0;
    lVar19 = (long)iVar30;
    lVar50 = lVar19 << 0x20;
    lVar41 = lVar25 + lVar19 * 4;
    lVar18 = 0;
    do {
      lVar20 = lVar50 >> 0x20;
      if (lVar33 <= lVar19 + 2 + lVar18) {
        lVar45 = lVar50 + 0x200000000 >> 0x20;
        if (iVar38 < iVar30 + (int)lVar18 + 2) {
          if (*(char *)(lVar32 + lVar45) == '\0') goto LAB_002458f7;
          cVar16 = *(char *)(lVar17 + lVar45);
        }
        else {
          if (*(char *)(lVar32 + lVar45) == '\0') {
            lVar33 = lVar50 + 0x300000000 >> 0x20;
            if (*(char *)(lVar32 + lVar33) == '\0') goto LAB_002458f7;
            if (*(char *)(lVar17 + lVar33) != '\0') goto LAB_002458e9;
            cVar16 = *(char *)(lVar17 + lVar45);
            goto joined_r0x002456f0;
          }
          cVar16 = *(char *)(lVar17 + lVar45);
          if (*(char *)(lVar17 + 3 + lVar20) != '\0') {
            if ((cVar16 != '\0') || (*(char *)(lVar17 + 1 + lVar20) == '\0')) goto LAB_002458e9;
            cVar16 = *(char *)(lVar13 + lVar45);
            goto LAB_00245689;
          }
        }
        if (cVar16 != '\0') goto LAB_002458e9;
        if (*(char *)(lVar17 + 1 + lVar20) == '\0') goto LAB_00245901;
        uVar23 = *(undefined4 *)(lVar15 + lVar20 * 4);
        goto LAB_002458ee;
      }
      if (*(char *)(lVar11 + lVar19 + -1 + lVar18) != '\0') {
        local_c0 = (ulong)(iVar30 + 2) + lVar18;
        lVar29 = lVar50 + 0x300000000 >> 0x20;
        uVar21 = lVar19 + 2 + lVar18;
        if (*(char *)(lVar17 + lVar29) != '\0') {
          if (*(char *)(lVar18 + lVar1 + lVar19) == '\0') {
            if (*(char *)(lVar45 + lVar20) == '\0') {
              uVar9 = *(uint *)(lVar39 + lVar19 * 4 + lVar18 * 4);
            }
            else {
              uVar9 = *(uint *)(lVar15 + lVar20 * 4);
              if (*(char *)(lVar18 + -1 + lVar24 + lVar19) == '\0') {
                uVar31 = *(uint *)(lVar39 + lVar19 * 4 + lVar18 * 4);
LAB_00244ba4:
                uVar9 = UF::Merge(uVar9,uVar31);
              }
            }
          }
          else {
            uVar9 = *(uint *)(lVar39 + lVar19 * 4 + lVar18 * 4);
          }
          goto LAB_00244e7d;
        }
        if (*(char *)(lVar32 + lVar29) == '\0') {
          if (*(char *)(lVar18 + lVar1 + lVar19) == '\0') {
            if (*(char *)(lVar45 + lVar20) == '\0') {
              UF::P_[UF::length_] = UF::length_;
              uVar9 = UF::length_;
              UF::length_ = UF::length_ + 1;
            }
            else {
              uVar9 = *(uint *)(lVar15 + lVar20 * 4);
            }
          }
          else {
            uVar9 = *(uint *)(lVar39 + lVar19 * 4 + lVar18 * 4);
          }
          goto LAB_00245166;
        }
        lVar50 = lVar50 + 0x400000000 >> 0x20;
        cVar16 = *(char *)(lVar18 + lVar1 + lVar19);
        if (*(char *)(lVar17 + lVar50) == '\0') {
          if (cVar16 != '\0') goto LAB_002447c4;
          if (*(char *)(lVar45 + lVar20) == '\0') {
            uVar26 = (ulong)UF::length_;
            UF::P_[uVar26] = UF::length_;
            UF::length_ = UF::length_ + 1;
          }
          else {
            uVar26 = (ulong)*(uint *)(lVar15 + lVar20 * 4);
          }
          goto LAB_00244438;
        }
        if (cVar16 == '\0') {
          if (*(char *)(lVar45 + lVar20) != '\0') {
            if (*(char *)(lVar13 + lVar29) == '\0') {
              uVar9 = *(uint *)(lVar15 + lVar20 * 4);
              uVar31 = *(uint *)(lVar15 + lVar50 * 4);
            }
            else {
              uVar9 = *(uint *)(lVar15 + lVar20 * 4);
              if (*(char *)(lVar18 + -1 + lVar24 + lVar19) != '\0') {
                *(uint *)(lVar41 + lVar18 * 4) = uVar9;
                goto LAB_002445fa;
              }
              uVar31 = *(uint *)(lVar39 + lVar19 * 4 + lVar18 * 4);
            }
            uVar9 = UF::Merge(uVar9,uVar31);
            *(uint *)(lVar41 + lVar18 * 4) = uVar9;
            goto LAB_002445fa;
          }
          uVar9 = *(uint *)(lVar15 + lVar50 * 4);
        }
        else {
          uVar9 = *(uint *)(lVar39 + lVar19 * 4 + lVar18 * 4);
          if (*(char *)(lVar13 + lVar29) != '\0') {
            *(uint *)(lVar41 + lVar18 * 4) = uVar9;
            goto LAB_002445fa;
          }
          uVar9 = UF::Merge(uVar9,*(uint *)(lVar15 + lVar50 * 4));
        }
        *(uint *)(lVar41 + lVar18 * 4) = uVar9;
        goto LAB_002445fa;
      }
      if (*(char *)(lVar11 + lVar19 + lVar18) != '\0') goto LAB_0024414a;
      *(undefined4 *)(lVar41 + lVar18 * 4) = 0;
      lVar50 = lVar50 + 0x200000000;
      lVar18 = lVar18 + 2;
    } while( true );
  }
  lVar29 = lVar29 + 0x400000000 >> 0x20;
  if (*(char *)(lVar17 + lVar29) == '\0') {
    if (*(char *)(lVar20 + lVar19) != '\0') goto LAB_002447c4;
    uVar26 = (ulong)UF::length_;
    UF::P_[uVar26] = UF::length_;
    UF::length_ = UF::length_ + 1;
    goto LAB_00244438;
  }
  if (*(char *)(lVar20 + lVar19) == '\0') {
    uVar23 = *(undefined4 *)(lVar15 + lVar29 * 4);
LAB_0024526d:
    *(undefined4 *)(lVar50 + 8 + lVar20 * 4) = uVar23;
  }
  else {
    cVar16 = *(char *)(lVar13 + lVar18);
    uVar9 = *(uint *)(lVar41 + lVar20 * 4);
joined_r0x00245139:
    if (cVar16 == '\0') {
      uVar31 = *(uint *)(lVar15 + lVar29 * 4);
LAB_002451e6:
      uVar9 = UF::Merge(uVar9,uVar31);
      *(uint *)(lVar50 + 8 + lVar20 * 4) = uVar9;
      goto LAB_002445fa;
    }
    *(uint *)(lVar50 + 8 + lVar20 * 4) = uVar9;
  }
  local_c0 = local_c0 & 0xffffffff;
  goto LAB_002445fa;
LAB_0024414a:
  local_c0 = (ulong)(iVar30 + 2) + lVar18;
  uVar21 = lVar19 + 2 + lVar18;
  if (*(char *)(lVar1 + 1 + lVar19 + lVar18) == '\0') {
    lVar50 = lVar50 + 0x400000000 >> 0x20;
    cVar16 = *(char *)(lVar18 + lVar1 + lVar19);
    if (*(char *)(lVar17 + lVar50) == '\0') {
      if (cVar16 == '\0') goto LAB_00244426;
      goto LAB_002447c4;
    }
    if (cVar16 == '\0') {
      uVar9 = *(uint *)(lVar15 + lVar50 * 4);
      goto LAB_00244e1b;
    }
    uVar9 = *(uint *)(lVar39 + lVar19 * 4 + lVar18 * 4);
    if (*(char *)(lVar18 + lVar24 + lVar19) == '\0') {
      uVar31 = *(uint *)(lVar15 + lVar50 * 4);
      goto LAB_00244e08;
    }
    *(uint *)(lVar41 + lVar18 * 4) = uVar9;
    goto LAB_002445fa;
  }
  goto LAB_00244944;
LAB_00244426:
  uVar26 = (ulong)UF::length_;
  UF::P_[uVar26] = UF::length_;
  UF::length_ = UF::length_ + 1;
  goto LAB_00244438;
LAB_0023b8f4:
  uVar8 = *(uint *)(lVar39 + lVar50 * 4);
LAB_0023b996:
  uVar21 = (ulong)(iVar30 + (int)lVar50 + 2);
  uVar26 = lVar41 + lVar50 + 2;
  goto LAB_0023b7a1;
code_r0x0023b619:
  puVar2[UF::length_] = UF::length_;
  uVar9 = UF::length_ + 1;
  *(uint *)(lVar32 + 8 + lVar24 * 4) = UF::length_;
  UF::length_ = uVar9;
  if (cVar16 != '\0') {
LAB_0023b657:
    lVar33 = lVar24 + 4;
    lVar24 = lVar24 << 0x20;
    lVar25 = lVar24 + 0x400000000;
    do {
      lVar24 = lVar24 + 0x200000000;
      if (lVar48 <= lVar33) {
        lVar25 = lVar25 >> 0x20;
        if (iVar38 < (int)lVar33) {
          if (*(char *)(lVar45 + lVar25) == '\0') {
LAB_0023bafc:
            *(undefined4 *)(lVar32 + lVar25 * 4) = 0;
            return;
          }
          uVar23 = *(undefined4 *)(lVar32 + (lVar24 >> 0x1e));
        }
        else {
          if (*(char *)(lVar45 + lVar25) == '\0') {
            if (*(char *)(lVar45 + 3 + (lVar24 >> 0x20)) != '\0') {
              puVar2[UF::length_] = UF::length_;
              uVar9 = UF::length_ + 1;
              *(uint *)(lVar32 + lVar25 * 4) = UF::length_;
              UF::length_ = uVar9;
              return;
            }
            goto LAB_0023bafc;
          }
          uVar23 = *(undefined4 *)(lVar32 + (lVar24 >> 0x20) * 4);
        }
        *(undefined4 *)(lVar32 + lVar25 * 4) = uVar23;
        return;
      }
      cVar16 = *(char *)(lVar45 + 1 + lVar33);
      if (*(char *)(lVar45 + lVar33) == '\0') {
        if (cVar16 == '\0') goto LAB_0023b6ba;
        puVar2[UF::length_] = UF::length_;
        uVar9 = UF::length_;
        UF::length_ = UF::length_ + 1;
      }
      else {
        if (cVar16 == '\0') goto LAB_0023b6be;
        uVar9 = *(uint *)(lVar32 + -8 + lVar33 * 4);
      }
      *(uint *)(lVar32 + lVar33 * 4) = uVar9;
      lVar33 = lVar33 + 2;
      lVar25 = lVar25 + 0x200000000;
    } while( true );
  }
  goto LAB_0023b5fd;
LAB_0023b6be:
  uVar23 = *(undefined4 *)(lVar32 + -8 + lVar33 * 4);
LAB_0023b6c2:
  *(undefined4 *)(lVar32 + lVar33 * 4) = uVar23;
  goto LAB_0023b5fd;
}

Assistant:

void FirstScan()
    {
        const int h = img_.rows;
        const int w = img_.cols;

        e_rows = h & 0xfffffffe;
        o_rows = h % 2 == 1;
        e_cols = w & 0xfffffffe;
        o_cols = w % 2 == 1;

        LabelsSolver::Setup(); // Labels solver initialization

                               // We work with 2x2 blocks
                               // +-+-+-+
                               // |P|Q|R|
                               // +-+-+-+
                               // |S|X|
                               // +-+-+

                               // The pixels are named as follows
                               // +---+---+---+
                               // |a b|c d|e f|
                               // |g h|i j|k l|
                               // +---+---+---+
                               // |m n|o p|
                               // |q r|s t|
                               // +---+---+

                               // Pixels a, f, l, q are not needed, since we need to understand the
                               // the connectivity between these blocks and those pixels only matter
                               // when considering the outer connectivities

                               // A bunch of defines used to check if the pixels are foreground,
                               // without going outside the image limits.

                               // First scan

        // Define Conditions and Actions
        {
#define CONDITION_B img_row_prev_prev[c-1]>0
#define CONDITION_C img_row_prev_prev[c]>0
#define CONDITION_D img_row_prev_prev[c+1]>0
#define CONDITION_E img_row_prev_prev[c+2]>0

#define CONDITION_G img_row_prev[c-2]>0
#define CONDITION_H img_row_prev[c-1]>0
#define CONDITION_I img_row_prev[c]>0
#define CONDITION_J img_row_prev[c+1]>0
#define CONDITION_K img_row_prev[c+2]>0

#define CONDITION_M img_row[c-2]>0
#define CONDITION_N img_row[c-1]>0
#define CONDITION_O img_row[c]>0
#define CONDITION_P img_row[c+1]>0

#define CONDITION_R img_row_fol[c-1]>0
#define CONDITION_S img_row_fol[c]>0
#define CONDITION_T img_row_fol[c+1]>0

            // Action 1: No action
#define ACTION_1 img_labels_row[c] = 0; 
                               // Action 2: New label (the block has foreground pixels and is not connected to anything else)
#define ACTION_2 img_labels_row[c] = LabelsSolver::NewLabel(); 
                               //Action 3: Assign label of block P
#define ACTION_3 img_labels_row[c] = img_labels_row_prev_prev[c - 2];
                               // Action 4: Assign label of block Q 
#define ACTION_4 img_labels_row[c] = img_labels_row_prev_prev[c];
                               // Action 5: Assign label of block R
#define ACTION_5 img_labels_row[c] = img_labels_row_prev_prev[c + 2];
                               // Action 6: Assign label of block S
#define ACTION_6 img_labels_row[c] = img_labels_row[c - 2]; 
                               // Action 7: Merge labels of block P and Q
#define ACTION_7 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]);
                               //Action 8: Merge labels of block P and R
#define ACTION_8 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c + 2]);
                               // Action 9 Merge labels of block P and S
#define ACTION_9 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row[c - 2]);
                               // Action 10 Merge labels of block Q and R
#define ACTION_10 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row_prev_prev[c + 2]);
                               // Action 11: Merge labels of block Q and S
#define ACTION_11 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row[c - 2]);
                               // Action 12: Merge labels of block R and S
#define ACTION_12 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c + 2], img_labels_row[c - 2]);
                               // Action 13: Merge labels of block P, Q and R
#define ACTION_13 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]), img_labels_row_prev_prev[c + 2]);
                               // Action 14: Merge labels of block P, Q and S
#define ACTION_14 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]), img_labels_row[c - 2]);
                               //Action 15: Merge labels of block P, R and S
#define ACTION_15 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c + 2]), img_labels_row[c - 2]);
                               //Action 16: labels of block Q, R and S
#define ACTION_16 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row_prev_prev[c + 2]), img_labels_row[c - 2]);
        }

        if (h == 1) {
            // Single line
            int r = 0;
            const unsigned char* const img_row = img_.ptr<unsigned char>(0);
            unsigned* const img_labels_row = img_labels_.ptr<unsigned>(0);
            int c = -2;
#include "labeling_tagliatelle_2021_sl_forest.inc.h"
        }
        else {
            // More than one line

            // First couple of lines
            {
                int r = 0;
                const unsigned char* const img_row = img_.ptr<unsigned char>(0);
                const unsigned char* const img_row_fol = (unsigned char*)(((char*)img_row) + img_.step.p[0]);
                unsigned* const img_labels_row = img_labels_.ptr<unsigned>(0);
                int c = -2;

#include "labeling_tagliatelle_2021_fl_forest.inc.h"
            }

            // Every other line but the last one if image has an odd number of rows
            for (int r = 2; r < e_rows; r += 2) {
                // Get rows pointer
                const unsigned char* const img_row = img_.ptr<unsigned char>(r);
                const unsigned char* const img_row_prev = (unsigned char*)(((char*)img_row) - img_.step.p[0]);
                const unsigned char* const img_row_prev_prev = (unsigned char*)(((char*)img_row_prev) - img_.step.p[0]);
                const unsigned char* const img_row_fol = (unsigned char*)(((char*)img_row) + img_.step.p[0]);
                unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
                unsigned* const img_labels_row_prev_prev = (unsigned*)(((char*)img_labels_row) - img_labels_.step.p[0] - img_labels_.step.p[0]);

                int c = -2;
                goto cl_tree_0;

#include "labeling_tagliatelle_2021_cl_forest.inc.h"
            }

            // Last line (in case the rows are odd)
            if (o_rows)
            {
                int r = h - 1;
                const unsigned char* const img_row = img_.ptr<unsigned char>(r);
                const unsigned char* const img_row_prev = (unsigned char*)(((char*)img_row) - img_.step.p[0]);
                const unsigned char* const img_row_prev_prev = (unsigned char*)(((char*)img_row_prev) - img_.step.p[0]);
                unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
                unsigned* const img_labels_row_prev_prev = (unsigned*)(((char*)img_labels_row) - img_labels_.step.p[0] - img_labels_.step.p[0]);
                int c = -2;
#include "labeling_tagliatelle_2021_ll_forest.inc.h"
            }
        }


        // Undef Conditions and Actions
        {
#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8
#undef ACTION_9
#undef ACTION_10
#undef ACTION_11
#undef ACTION_12
#undef ACTION_13
#undef ACTION_14
#undef ACTION_15
#undef ACTION_16


#undef CONDITION_B
#undef CONDITION_C
#undef CONDITION_D
#undef CONDITION_E

#undef CONDITION_G
#undef CONDITION_H
#undef CONDITION_I
#undef CONDITION_J
#undef CONDITION_K

#undef CONDITION_M
#undef CONDITION_N
#undef CONDITION_O
#undef CONDITION_P

#undef CONDITION_R
#undef CONDITION_S
#undef CONDITION_T
        }
    }